

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Primitive PVar28;
  Geometry *pGVar29;
  __int_type_conflict _Var30;
  long lVar31;
  long lVar32;
  RTCFilterFunctionN p_Var33;
  uint uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  bool bVar97;
  bool bVar98;
  bool bVar99;
  bool bVar100;
  bool bVar101;
  bool bVar102;
  bool bVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  uint uVar116;
  ulong uVar117;
  uint uVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  ulong uVar122;
  ulong uVar123;
  bool bVar124;
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar155;
  float fVar158;
  __m128 a;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar164;
  float fVar166;
  float fVar168;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar126;
  float fVar127;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar172;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar211;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar173;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar210;
  float fVar213;
  undefined1 auVar194 [32];
  float fVar212;
  float fVar214;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar184 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  float fVar237;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar238;
  float fVar261;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [28];
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar264;
  undefined1 auVar252 [32];
  undefined1 auVar259 [64];
  float fVar265;
  float fVar281;
  float fVar282;
  float fVar284;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar289;
  float fVar291;
  undefined1 auVar276 [28];
  float fVar286;
  float fVar288;
  float fVar290;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar280 [32];
  float fVar292;
  float fVar310;
  float fVar312;
  undefined1 auVar293 [16];
  float fVar314;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar301 [32];
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar302 [32];
  float fVar323;
  undefined1 auVar303 [32];
  float fVar322;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar324;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float fVar337;
  float fVar339;
  float fVar343;
  float fVar345;
  float fVar347;
  undefined1 auVar329 [32];
  float fVar341;
  undefined1 auVar330 [32];
  float fVar325;
  float fVar338;
  float fVar340;
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar348;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  float fVar349;
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar367;
  float fVar369;
  float fVar371;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar364;
  float fVar366;
  float fVar368;
  float fVar370;
  float fVar372;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [64];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [16];
  undefined1 auVar383 [28];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  float fVar391;
  undefined1 auVar389 [32];
  undefined1 auVar390 [64];
  undefined1 auVar393 [16];
  float fVar392;
  float fVar400;
  float fVar401;
  float fVar403;
  float fVar404;
  float fVar405;
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar402;
  float fVar406;
  undefined1 auVar399 [32];
  undefined1 auVar407 [16];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  float fVar416;
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  float fVar417;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float in_register_0000151c;
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  float fVar430;
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  float fVar431;
  float fVar432;
  float fVar439;
  float fVar442;
  float fVar444;
  float fVar446;
  float fVar448;
  float fVar450;
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  float fVar440;
  float fVar443;
  float fVar445;
  float fVar447;
  float fVar449;
  float fVar451;
  float fVar452;
  undefined1 auVar436 [32];
  float fVar433;
  float fVar441;
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  float in_register_0000159c;
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  float fVar457;
  float fVar459;
  float fVar460;
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar464;
  float in_register_000015dc;
  undefined1 auVar458 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_be0;
  undefined8 local_b40;
  undefined8 uStack_b38;
  float local_b28;
  float local_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined8 *local_a10;
  ulong local_a08;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  RTCHitN local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  uint local_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  uint uStack_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar415 [64];
  
  PVar28 = prim[1];
  uVar122 = (ulong)(byte)PVar28;
  lVar121 = uVar122 * 0x25;
  auVar177 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar177 = vinsertps_avx(auVar177,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar245 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar245 = vinsertps_avx(auVar245,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar177 = vsubps_avx(auVar177,*(undefined1 (*) [16])(prim + lVar121 + 6));
  fVar238 = *(float *)(prim + lVar121 + 0x12);
  auVar174._0_4_ = fVar238 * auVar177._0_4_;
  auVar174._4_4_ = fVar238 * auVar177._4_4_;
  auVar174._8_4_ = fVar238 * auVar177._8_4_;
  auVar174._12_4_ = fVar238 * auVar177._12_4_;
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 4 + 6)));
  auVar293._0_4_ = fVar238 * auVar245._0_4_;
  auVar293._4_4_ = fVar238 * auVar245._4_4_;
  auVar293._8_4_ = fVar238 * auVar245._8_4_;
  auVar293._12_4_ = fVar238 * auVar245._12_4_;
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 4 + 10)));
  auVar141._16_16_ = auVar245;
  auVar141._0_16_ = auVar177;
  auVar141 = vcvtdq2ps_avx(auVar141);
  lVar31 = uVar122 * 5;
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar31 + 6)));
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar31 + 10)));
  auVar227._16_16_ = auVar245;
  auVar227._0_16_ = auVar177;
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 6 + 6)));
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 6 + 10)));
  auVar149 = vcvtdq2ps_avx(auVar227);
  auVar250._16_16_ = auVar245;
  auVar250._0_16_ = auVar177;
  auVar36 = vcvtdq2ps_avx(auVar250);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xf + 6)));
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xf + 10)));
  auVar251._16_16_ = auVar245;
  auVar251._0_16_ = auVar177;
  auVar37 = vcvtdq2ps_avx(auVar251);
  lVar119 = (ulong)(byte)PVar28 * 0x10;
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + 6)));
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + 10)));
  auVar329._16_16_ = auVar245;
  auVar329._0_16_ = auVar177;
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + uVar122 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar329);
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + uVar122 + 10)));
  auVar350._16_16_ = auVar245;
  auVar350._0_16_ = auVar177;
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1a + 6)));
  auVar438 = vcvtdq2ps_avx(auVar350);
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1a + 10)));
  auVar351._16_16_ = auVar245;
  auVar351._0_16_ = auVar177;
  auVar39 = vcvtdq2ps_avx(auVar351);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1b + 6)));
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1b + 10)));
  auVar384._16_16_ = auVar245;
  auVar384._0_16_ = auVar177;
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1c + 6)));
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1c + 10)));
  auVar40 = vcvtdq2ps_avx(auVar384);
  auVar394._16_16_ = auVar245;
  auVar394._0_16_ = auVar177;
  auVar333 = vcvtdq2ps_avx(auVar394);
  auVar177 = vshufps_avx(auVar293,auVar293,0);
  auVar245 = vshufps_avx(auVar293,auVar293,0x55);
  auVar133 = vshufps_avx(auVar293,auVar293,0xaa);
  fVar238 = auVar133._0_4_;
  fVar323 = auVar133._4_4_;
  fVar260 = auVar133._8_4_;
  fVar128 = auVar133._12_4_;
  fVar237 = auVar245._0_4_;
  fVar129 = auVar245._4_4_;
  fVar261 = auVar245._8_4_;
  fVar173 = auVar245._12_4_;
  fVar262 = auVar177._0_4_;
  fVar263 = auVar177._4_4_;
  fVar264 = auVar177._8_4_;
  fVar265 = auVar177._12_4_;
  auVar418._0_4_ = fVar262 * auVar141._0_4_ + fVar237 * auVar149._0_4_ + fVar238 * auVar36._0_4_;
  auVar418._4_4_ = fVar263 * auVar141._4_4_ + fVar129 * auVar149._4_4_ + fVar323 * auVar36._4_4_;
  auVar418._8_4_ = fVar264 * auVar141._8_4_ + fVar261 * auVar149._8_4_ + fVar260 * auVar36._8_4_;
  auVar418._12_4_ = fVar265 * auVar141._12_4_ + fVar173 * auVar149._12_4_ + fVar128 * auVar36._12_4_
  ;
  auVar418._16_4_ = fVar262 * auVar141._16_4_ + fVar237 * auVar149._16_4_ + fVar238 * auVar36._16_4_
  ;
  auVar418._20_4_ = fVar263 * auVar141._20_4_ + fVar129 * auVar149._20_4_ + fVar323 * auVar36._20_4_
  ;
  auVar418._24_4_ = fVar264 * auVar141._24_4_ + fVar261 * auVar149._24_4_ + fVar260 * auVar36._24_4_
  ;
  auVar418._28_4_ = fVar173 + in_register_000015dc + in_register_0000151c;
  auVar408._0_4_ = fVar262 * auVar37._0_4_ + fVar237 * auVar38._0_4_ + auVar438._0_4_ * fVar238;
  auVar408._4_4_ = fVar263 * auVar37._4_4_ + fVar129 * auVar38._4_4_ + auVar438._4_4_ * fVar323;
  auVar408._8_4_ = fVar264 * auVar37._8_4_ + fVar261 * auVar38._8_4_ + auVar438._8_4_ * fVar260;
  auVar408._12_4_ = fVar265 * auVar37._12_4_ + fVar173 * auVar38._12_4_ + auVar438._12_4_ * fVar128;
  auVar408._16_4_ = fVar262 * auVar37._16_4_ + fVar237 * auVar38._16_4_ + auVar438._16_4_ * fVar238;
  auVar408._20_4_ = fVar263 * auVar37._20_4_ + fVar129 * auVar38._20_4_ + auVar438._20_4_ * fVar323;
  auVar408._24_4_ = fVar264 * auVar37._24_4_ + fVar261 * auVar38._24_4_ + auVar438._24_4_ * fVar260;
  auVar408._28_4_ = fVar173 + in_register_000015dc + in_register_0000159c;
  auVar301._0_4_ = fVar262 * auVar39._0_4_ + fVar237 * auVar40._0_4_ + auVar333._0_4_ * fVar238;
  auVar301._4_4_ = fVar263 * auVar39._4_4_ + fVar129 * auVar40._4_4_ + auVar333._4_4_ * fVar323;
  auVar301._8_4_ = fVar264 * auVar39._8_4_ + fVar261 * auVar40._8_4_ + auVar333._8_4_ * fVar260;
  auVar301._12_4_ = fVar265 * auVar39._12_4_ + fVar173 * auVar40._12_4_ + auVar333._12_4_ * fVar128;
  auVar301._16_4_ = fVar262 * auVar39._16_4_ + fVar237 * auVar40._16_4_ + auVar333._16_4_ * fVar238;
  auVar301._20_4_ = fVar263 * auVar39._20_4_ + fVar129 * auVar40._20_4_ + auVar333._20_4_ * fVar323;
  auVar301._24_4_ = fVar264 * auVar39._24_4_ + fVar261 * auVar40._24_4_ + auVar333._24_4_ * fVar260;
  auVar301._28_4_ = fVar265 + fVar173 + fVar128;
  auVar177 = vshufps_avx(auVar174,auVar174,0);
  auVar245 = vshufps_avx(auVar174,auVar174,0x55);
  auVar133 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar238 = auVar133._0_4_;
  fVar323 = auVar133._4_4_;
  fVar260 = auVar133._8_4_;
  fVar128 = auVar133._12_4_;
  fVar263 = auVar245._0_4_;
  fVar264 = auVar245._4_4_;
  fVar265 = auVar245._8_4_;
  fVar281 = auVar245._12_4_;
  fVar237 = auVar149._28_4_ + auVar36._28_4_;
  fVar129 = auVar177._0_4_;
  fVar261 = auVar177._4_4_;
  fVar173 = auVar177._8_4_;
  fVar262 = auVar177._12_4_;
  auVar191._0_4_ = fVar129 * auVar141._0_4_ + fVar263 * auVar149._0_4_ + fVar238 * auVar36._0_4_;
  auVar191._4_4_ = fVar261 * auVar141._4_4_ + fVar264 * auVar149._4_4_ + fVar323 * auVar36._4_4_;
  auVar191._8_4_ = fVar173 * auVar141._8_4_ + fVar265 * auVar149._8_4_ + fVar260 * auVar36._8_4_;
  auVar191._12_4_ = fVar262 * auVar141._12_4_ + fVar281 * auVar149._12_4_ + fVar128 * auVar36._12_4_
  ;
  auVar191._16_4_ = fVar129 * auVar141._16_4_ + fVar263 * auVar149._16_4_ + fVar238 * auVar36._16_4_
  ;
  auVar191._20_4_ = fVar261 * auVar141._20_4_ + fVar264 * auVar149._20_4_ + fVar323 * auVar36._20_4_
  ;
  auVar191._24_4_ = fVar173 * auVar141._24_4_ + fVar265 * auVar149._24_4_ + fVar260 * auVar36._24_4_
  ;
  auVar191._28_4_ = auVar141._28_4_ + fVar237;
  auVar142._0_4_ = fVar129 * auVar37._0_4_ + auVar438._0_4_ * fVar238 + fVar263 * auVar38._0_4_;
  auVar142._4_4_ = fVar261 * auVar37._4_4_ + auVar438._4_4_ * fVar323 + fVar264 * auVar38._4_4_;
  auVar142._8_4_ = fVar173 * auVar37._8_4_ + auVar438._8_4_ * fVar260 + fVar265 * auVar38._8_4_;
  auVar142._12_4_ = fVar262 * auVar37._12_4_ + auVar438._12_4_ * fVar128 + fVar281 * auVar38._12_4_;
  auVar142._16_4_ = fVar129 * auVar37._16_4_ + auVar438._16_4_ * fVar238 + fVar263 * auVar38._16_4_;
  auVar142._20_4_ = fVar261 * auVar37._20_4_ + auVar438._20_4_ * fVar323 + fVar264 * auVar38._20_4_;
  auVar142._24_4_ = fVar173 * auVar37._24_4_ + auVar438._24_4_ * fVar260 + fVar265 * auVar38._24_4_;
  auVar142._28_4_ = auVar141._28_4_ + auVar438._28_4_ + auVar36._28_4_;
  auVar352._8_4_ = 0x7fffffff;
  auVar352._0_8_ = 0x7fffffff7fffffff;
  auVar352._12_4_ = 0x7fffffff;
  auVar352._16_4_ = 0x7fffffff;
  auVar352._20_4_ = 0x7fffffff;
  auVar352._24_4_ = 0x7fffffff;
  auVar352._28_4_ = 0x7fffffff;
  auVar375._8_4_ = 0x219392ef;
  auVar375._0_8_ = 0x219392ef219392ef;
  auVar375._12_4_ = 0x219392ef;
  auVar375._16_4_ = 0x219392ef;
  auVar375._20_4_ = 0x219392ef;
  auVar375._24_4_ = 0x219392ef;
  auVar375._28_4_ = 0x219392ef;
  auVar141 = vandps_avx(auVar418,auVar352);
  auVar141 = vcmpps_avx(auVar141,auVar375,1);
  auVar149 = vblendvps_avx(auVar418,auVar375,auVar141);
  auVar141 = vandps_avx(auVar408,auVar352);
  auVar141 = vcmpps_avx(auVar141,auVar375,1);
  auVar36 = vblendvps_avx(auVar408,auVar375,auVar141);
  auVar141 = vandps_avx(auVar301,auVar352);
  auVar141 = vcmpps_avx(auVar141,auVar375,1);
  auVar141 = vblendvps_avx(auVar301,auVar375,auVar141);
  auVar228._0_4_ = fVar129 * auVar39._0_4_ + fVar263 * auVar40._0_4_ + auVar333._0_4_ * fVar238;
  auVar228._4_4_ = fVar261 * auVar39._4_4_ + fVar264 * auVar40._4_4_ + auVar333._4_4_ * fVar323;
  auVar228._8_4_ = fVar173 * auVar39._8_4_ + fVar265 * auVar40._8_4_ + auVar333._8_4_ * fVar260;
  auVar228._12_4_ = fVar262 * auVar39._12_4_ + fVar281 * auVar40._12_4_ + auVar333._12_4_ * fVar128;
  auVar228._16_4_ = fVar129 * auVar39._16_4_ + fVar263 * auVar40._16_4_ + auVar333._16_4_ * fVar238;
  auVar228._20_4_ = fVar261 * auVar39._20_4_ + fVar264 * auVar40._20_4_ + auVar333._20_4_ * fVar323;
  auVar228._24_4_ = fVar173 * auVar39._24_4_ + fVar265 * auVar40._24_4_ + auVar333._24_4_ * fVar260;
  auVar228._28_4_ = fVar237 + auVar38._28_4_ + fVar128;
  auVar37 = vrcpps_avx(auVar149);
  fVar238 = auVar37._0_4_;
  fVar260 = auVar37._4_4_;
  auVar38._4_4_ = auVar149._4_4_ * fVar260;
  auVar38._0_4_ = auVar149._0_4_ * fVar238;
  fVar237 = auVar37._8_4_;
  auVar38._8_4_ = auVar149._8_4_ * fVar237;
  fVar261 = auVar37._12_4_;
  auVar38._12_4_ = auVar149._12_4_ * fVar261;
  fVar262 = auVar37._16_4_;
  auVar38._16_4_ = auVar149._16_4_ * fVar262;
  fVar263 = auVar37._20_4_;
  auVar38._20_4_ = auVar149._20_4_ * fVar263;
  fVar264 = auVar37._24_4_;
  auVar38._24_4_ = auVar149._24_4_ * fVar264;
  auVar38._28_4_ = auVar149._28_4_;
  auVar376._8_4_ = 0x3f800000;
  auVar376._0_8_ = &DAT_3f8000003f800000;
  auVar376._12_4_ = 0x3f800000;
  auVar376._16_4_ = 0x3f800000;
  auVar376._20_4_ = 0x3f800000;
  auVar376._24_4_ = 0x3f800000;
  auVar376._28_4_ = 0x3f800000;
  auVar438 = vsubps_avx(auVar376,auVar38);
  auVar38 = vrcpps_avx(auVar36);
  fVar238 = fVar238 + fVar238 * auVar438._0_4_;
  fVar260 = fVar260 + fVar260 * auVar438._4_4_;
  fVar237 = fVar237 + fVar237 * auVar438._8_4_;
  fVar261 = fVar261 + fVar261 * auVar438._12_4_;
  fVar262 = fVar262 + fVar262 * auVar438._16_4_;
  fVar263 = fVar263 + fVar263 * auVar438._20_4_;
  fVar264 = fVar264 + fVar264 * auVar438._24_4_;
  fVar265 = auVar38._0_4_;
  fVar281 = auVar38._4_4_;
  auVar149._4_4_ = fVar281 * auVar36._4_4_;
  auVar149._0_4_ = fVar265 * auVar36._0_4_;
  fVar282 = auVar38._8_4_;
  auVar149._8_4_ = fVar282 * auVar36._8_4_;
  fVar284 = auVar38._12_4_;
  auVar149._12_4_ = fVar284 * auVar36._12_4_;
  fVar286 = auVar38._16_4_;
  auVar149._16_4_ = fVar286 * auVar36._16_4_;
  fVar288 = auVar38._20_4_;
  auVar149._20_4_ = fVar288 * auVar36._20_4_;
  fVar290 = auVar38._24_4_;
  auVar149._24_4_ = fVar290 * auVar36._24_4_;
  auVar149._28_4_ = auVar36._28_4_;
  auVar36 = vsubps_avx(auVar376,auVar149);
  fVar265 = fVar265 + fVar265 * auVar36._0_4_;
  fVar281 = fVar281 + fVar281 * auVar36._4_4_;
  fVar282 = fVar282 + fVar282 * auVar36._8_4_;
  fVar284 = fVar284 + fVar284 * auVar36._12_4_;
  fVar286 = fVar286 + fVar286 * auVar36._16_4_;
  fVar288 = fVar288 + fVar288 * auVar36._20_4_;
  fVar290 = fVar290 + fVar290 * auVar36._24_4_;
  auVar149 = vrcpps_avx(auVar141);
  fVar292 = auVar149._0_4_;
  fVar310 = auVar149._4_4_;
  auVar39._4_4_ = fVar310 * auVar141._4_4_;
  auVar39._0_4_ = fVar292 * auVar141._0_4_;
  fVar312 = auVar149._8_4_;
  auVar39._8_4_ = fVar312 * auVar141._8_4_;
  fVar314 = auVar149._12_4_;
  auVar39._12_4_ = fVar314 * auVar141._12_4_;
  fVar316 = auVar149._16_4_;
  auVar39._16_4_ = fVar316 * auVar141._16_4_;
  fVar318 = auVar149._20_4_;
  auVar39._20_4_ = fVar318 * auVar141._20_4_;
  fVar320 = auVar149._24_4_;
  auVar39._24_4_ = fVar320 * auVar141._24_4_;
  auVar39._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar376,auVar39);
  fVar292 = fVar292 + fVar292 * auVar141._0_4_;
  fVar310 = fVar310 + fVar310 * auVar141._4_4_;
  fVar312 = fVar312 + fVar312 * auVar141._8_4_;
  fVar314 = fVar314 + fVar314 * auVar141._12_4_;
  fVar316 = fVar316 + fVar316 * auVar141._16_4_;
  fVar318 = fVar318 + fVar318 * auVar141._20_4_;
  fVar320 = fVar320 + fVar320 * auVar141._24_4_;
  auVar177 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar121 + 0x16)) *
                           *(float *)(prim + lVar121 + 0x1a)));
  auVar242 = vshufps_avx(auVar177,auVar177,0);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar122 * 7 + 6);
  auVar177 = vpmovsxwd_avx(auVar177);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *(ulong *)(prim + uVar122 * 7 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar245);
  auVar353._16_16_ = auVar245;
  auVar353._0_16_ = auVar177;
  auVar141 = vcvtdq2ps_avx(auVar353);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar122 * 0xb + 6);
  auVar177 = vpmovsxwd_avx(auVar133);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar122 * 0xb + 0xe);
  auVar245 = vpmovsxwd_avx(auVar220);
  auVar377._16_16_ = auVar245;
  auVar377._0_16_ = auVar177;
  auVar149 = vcvtdq2ps_avx(auVar377);
  auVar149 = vsubps_avx(auVar149,auVar141);
  fVar323 = auVar242._0_4_;
  fVar128 = auVar242._4_4_;
  fVar129 = auVar242._8_4_;
  fVar173 = auVar242._12_4_;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = *(ulong *)(prim + uVar122 * 9 + 6);
  auVar177 = vpmovsxwd_avx(auVar242);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar122 * 9 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar10);
  auVar354._0_4_ = auVar149._0_4_ * fVar323 + auVar141._0_4_;
  auVar354._4_4_ = auVar149._4_4_ * fVar128 + auVar141._4_4_;
  auVar354._8_4_ = auVar149._8_4_ * fVar129 + auVar141._8_4_;
  auVar354._12_4_ = auVar149._12_4_ * fVar173 + auVar141._12_4_;
  auVar354._16_4_ = auVar149._16_4_ * fVar323 + auVar141._16_4_;
  auVar354._20_4_ = auVar149._20_4_ * fVar128 + auVar141._20_4_;
  auVar354._24_4_ = auVar149._24_4_ * fVar129 + auVar141._24_4_;
  auVar354._28_4_ = auVar149._28_4_ + auVar141._28_4_;
  auVar378._16_16_ = auVar245;
  auVar378._0_16_ = auVar177;
  auVar141 = vcvtdq2ps_avx(auVar378);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar122 * 0xd + 6);
  auVar177 = vpmovsxwd_avx(auVar11);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar122 * 0xd + 0xe);
  auVar245 = vpmovsxwd_avx(auVar181);
  auVar385._16_16_ = auVar245;
  auVar385._0_16_ = auVar177;
  auVar149 = vcvtdq2ps_avx(auVar385);
  auVar149 = vsubps_avx(auVar149,auVar141);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar122 * 0x12 + 6);
  auVar177 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar122 * 0x12 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar13);
  auVar379._0_4_ = auVar141._0_4_ + auVar149._0_4_ * fVar323;
  auVar379._4_4_ = auVar141._4_4_ + auVar149._4_4_ * fVar128;
  auVar379._8_4_ = auVar141._8_4_ + auVar149._8_4_ * fVar129;
  auVar379._12_4_ = auVar141._12_4_ + auVar149._12_4_ * fVar173;
  auVar379._16_4_ = auVar141._16_4_ + auVar149._16_4_ * fVar323;
  auVar379._20_4_ = auVar141._20_4_ + auVar149._20_4_ * fVar128;
  auVar379._24_4_ = auVar141._24_4_ + auVar149._24_4_ * fVar129;
  auVar379._28_4_ = auVar141._28_4_ + auVar149._28_4_;
  auVar386._16_16_ = auVar245;
  auVar386._0_16_ = auVar177;
  auVar141 = vcvtdq2ps_avx(auVar386);
  uVar117 = (ulong)(uint)((int)lVar31 << 2);
  lVar121 = uVar122 * 2 + uVar117;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar177 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar15);
  auVar395._16_16_ = auVar245;
  auVar395._0_16_ = auVar177;
  auVar149 = vcvtdq2ps_avx(auVar395);
  auVar149 = vsubps_avx(auVar149,auVar141);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar117 + 6);
  auVar177 = vpmovsxwd_avx(auVar16);
  auVar387._0_4_ = auVar141._0_4_ + auVar149._0_4_ * fVar323;
  auVar387._4_4_ = auVar141._4_4_ + auVar149._4_4_ * fVar128;
  auVar387._8_4_ = auVar141._8_4_ + auVar149._8_4_ * fVar129;
  auVar387._12_4_ = auVar141._12_4_ + auVar149._12_4_ * fVar173;
  auVar387._16_4_ = auVar141._16_4_ + auVar149._16_4_ * fVar323;
  auVar387._20_4_ = auVar141._20_4_ + auVar149._20_4_ * fVar128;
  auVar387._24_4_ = auVar141._24_4_ + auVar149._24_4_ * fVar129;
  auVar387._28_4_ = auVar141._28_4_ + auVar149._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar117 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar17);
  auVar396._16_16_ = auVar245;
  auVar396._0_16_ = auVar177;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar122 * 0x18 + 6);
  auVar177 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar122 * 0x18 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar19);
  auVar141 = vcvtdq2ps_avx(auVar396);
  auVar409._16_16_ = auVar245;
  auVar409._0_16_ = auVar177;
  auVar149 = vcvtdq2ps_avx(auVar409);
  auVar149 = vsubps_avx(auVar149,auVar141);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar122 * 0x1d + 6);
  auVar177 = vpmovsxwd_avx(auVar20);
  auVar397._0_4_ = auVar141._0_4_ + auVar149._0_4_ * fVar323;
  auVar397._4_4_ = auVar141._4_4_ + auVar149._4_4_ * fVar128;
  auVar397._8_4_ = auVar141._8_4_ + auVar149._8_4_ * fVar129;
  auVar397._12_4_ = auVar141._12_4_ + auVar149._12_4_ * fVar173;
  auVar397._16_4_ = auVar141._16_4_ + auVar149._16_4_ * fVar323;
  auVar397._20_4_ = auVar141._20_4_ + auVar149._20_4_ * fVar128;
  auVar397._24_4_ = auVar141._24_4_ + auVar149._24_4_ * fVar129;
  auVar397._28_4_ = auVar141._28_4_ + auVar149._28_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar122 * 0x1d + 0xe);
  auVar245 = vpmovsxwd_avx(auVar21);
  lVar121 = uVar122 + (ulong)(byte)PVar28 * 0x20;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar133 = vpmovsxwd_avx(auVar22);
  auVar410._16_16_ = auVar245;
  auVar410._0_16_ = auVar177;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar177 = vpmovsxwd_avx(auVar23);
  auVar419._16_16_ = auVar177;
  auVar419._0_16_ = auVar133;
  auVar141 = vcvtdq2ps_avx(auVar410);
  auVar149 = vcvtdq2ps_avx(auVar419);
  auVar149 = vsubps_avx(auVar149,auVar141);
  auVar411._0_4_ = auVar141._0_4_ + auVar149._0_4_ * fVar323;
  auVar411._4_4_ = auVar141._4_4_ + auVar149._4_4_ * fVar128;
  auVar411._8_4_ = auVar141._8_4_ + auVar149._8_4_ * fVar129;
  auVar411._12_4_ = auVar141._12_4_ + auVar149._12_4_ * fVar173;
  auVar411._16_4_ = auVar141._16_4_ + auVar149._16_4_ * fVar323;
  auVar411._20_4_ = auVar141._20_4_ + auVar149._20_4_ * fVar128;
  auVar411._24_4_ = auVar141._24_4_ + auVar149._24_4_ * fVar129;
  auVar411._28_4_ = auVar141._28_4_ + auVar149._28_4_;
  lVar121 = (ulong)(byte)PVar28 * 0x20 - uVar122;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar177 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar25);
  auVar420._16_16_ = auVar245;
  auVar420._0_16_ = auVar177;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar122 * 0x23 + 6);
  auVar177 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar122 * 0x23 + 0xe);
  auVar245 = vpmovsxwd_avx(auVar27);
  auVar434._16_16_ = auVar245;
  auVar434._0_16_ = auVar177;
  auVar141 = vcvtdq2ps_avx(auVar420);
  auVar149 = vcvtdq2ps_avx(auVar434);
  auVar149 = vsubps_avx(auVar149,auVar141);
  auVar421._0_4_ = auVar141._0_4_ + auVar149._0_4_ * fVar323;
  auVar421._4_4_ = auVar141._4_4_ + auVar149._4_4_ * fVar128;
  auVar421._8_4_ = auVar141._8_4_ + auVar149._8_4_ * fVar129;
  auVar421._12_4_ = auVar141._12_4_ + auVar149._12_4_ * fVar173;
  auVar421._16_4_ = auVar141._16_4_ + auVar149._16_4_ * fVar323;
  auVar421._20_4_ = auVar141._20_4_ + auVar149._20_4_ * fVar128;
  auVar421._24_4_ = auVar141._24_4_ + auVar149._24_4_ * fVar129;
  auVar421._28_4_ = auVar141._28_4_ + fVar173;
  auVar141 = vsubps_avx(auVar354,auVar191);
  auVar326._0_4_ = fVar238 * auVar141._0_4_;
  auVar326._4_4_ = fVar260 * auVar141._4_4_;
  auVar326._8_4_ = fVar237 * auVar141._8_4_;
  auVar326._12_4_ = fVar261 * auVar141._12_4_;
  auVar40._16_4_ = fVar262 * auVar141._16_4_;
  auVar40._0_16_ = auVar326;
  auVar40._20_4_ = fVar263 * auVar141._20_4_;
  auVar40._24_4_ = fVar264 * auVar141._24_4_;
  auVar40._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar379,auVar191);
  auVar239._0_4_ = fVar238 * auVar141._0_4_;
  auVar239._4_4_ = fVar260 * auVar141._4_4_;
  auVar239._8_4_ = fVar237 * auVar141._8_4_;
  auVar239._12_4_ = fVar261 * auVar141._12_4_;
  auVar333._16_4_ = fVar262 * auVar141._16_4_;
  auVar333._0_16_ = auVar239;
  auVar333._20_4_ = fVar263 * auVar141._20_4_;
  auVar333._24_4_ = fVar264 * auVar141._24_4_;
  auVar333._28_4_ = auVar37._28_4_ + auVar438._28_4_;
  auVar141 = vsubps_avx(auVar387,auVar142);
  auVar175._0_4_ = fVar265 * auVar141._0_4_;
  auVar175._4_4_ = fVar281 * auVar141._4_4_;
  auVar175._8_4_ = fVar282 * auVar141._8_4_;
  auVar175._12_4_ = fVar284 * auVar141._12_4_;
  auVar37._16_4_ = fVar286 * auVar141._16_4_;
  auVar37._0_16_ = auVar175;
  auVar37._20_4_ = fVar288 * auVar141._20_4_;
  auVar37._24_4_ = fVar290 * auVar141._24_4_;
  auVar37._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar397,auVar142);
  auVar266._0_4_ = fVar265 * auVar141._0_4_;
  auVar266._4_4_ = fVar281 * auVar141._4_4_;
  auVar266._8_4_ = fVar282 * auVar141._8_4_;
  auVar266._12_4_ = fVar284 * auVar141._12_4_;
  auVar438._16_4_ = fVar286 * auVar141._16_4_;
  auVar438._0_16_ = auVar266;
  auVar438._20_4_ = fVar288 * auVar141._20_4_;
  auVar438._24_4_ = fVar290 * auVar141._24_4_;
  auVar438._28_4_ = auVar38._28_4_ + auVar36._28_4_;
  auVar141 = vsubps_avx(auVar411,auVar228);
  auVar130._0_4_ = fVar292 * auVar141._0_4_;
  auVar130._4_4_ = fVar310 * auVar141._4_4_;
  auVar130._8_4_ = fVar312 * auVar141._8_4_;
  auVar130._12_4_ = fVar314 * auVar141._12_4_;
  auVar36._16_4_ = fVar316 * auVar141._16_4_;
  auVar36._0_16_ = auVar130;
  auVar36._20_4_ = fVar318 * auVar141._20_4_;
  auVar36._24_4_ = fVar320 * auVar141._24_4_;
  auVar36._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar421,auVar228);
  auVar218._0_4_ = fVar292 * auVar141._0_4_;
  auVar218._4_4_ = fVar310 * auVar141._4_4_;
  auVar218._8_4_ = fVar312 * auVar141._8_4_;
  auVar218._12_4_ = fVar314 * auVar141._12_4_;
  auVar46._16_4_ = fVar316 * auVar141._16_4_;
  auVar46._0_16_ = auVar218;
  auVar46._20_4_ = fVar318 * auVar141._20_4_;
  auVar46._24_4_ = fVar320 * auVar141._24_4_;
  auVar46._28_4_ = auVar141._28_4_;
  auVar177 = vpminsd_avx(auVar40._16_16_,auVar333._16_16_);
  auVar245 = vpminsd_avx(auVar326,auVar239);
  auVar380._16_16_ = auVar177;
  auVar380._0_16_ = auVar245;
  auVar177 = vpminsd_avx(auVar37._16_16_,auVar438._16_16_);
  auVar245 = vpminsd_avx(auVar175,auVar266);
  auVar412._16_16_ = auVar177;
  auVar412._0_16_ = auVar245;
  auVar141 = vmaxps_avx(auVar380,auVar412);
  auVar177 = vpminsd_avx(auVar36._16_16_,auVar46._16_16_);
  auVar245 = vpminsd_avx(auVar130,auVar218);
  auVar435._16_16_ = auVar177;
  auVar435._0_16_ = auVar245;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar453._4_4_ = uVar8;
  auVar453._0_4_ = uVar8;
  auVar453._8_4_ = uVar8;
  auVar453._12_4_ = uVar8;
  auVar453._16_4_ = uVar8;
  auVar453._20_4_ = uVar8;
  auVar453._24_4_ = uVar8;
  auVar453._28_4_ = uVar8;
  auVar149 = vmaxps_avx(auVar435,auVar453);
  auVar141 = vmaxps_avx(auVar141,auVar149);
  local_400._4_4_ = auVar141._4_4_ * 0.99999964;
  local_400._0_4_ = auVar141._0_4_ * 0.99999964;
  local_400._8_4_ = auVar141._8_4_ * 0.99999964;
  local_400._12_4_ = auVar141._12_4_ * 0.99999964;
  local_400._16_4_ = auVar141._16_4_ * 0.99999964;
  local_400._20_4_ = auVar141._20_4_ * 0.99999964;
  local_400._24_4_ = auVar141._24_4_ * 0.99999964;
  local_400._28_4_ = auVar141._28_4_;
  auVar177 = vpmaxsd_avx(auVar40._16_16_,auVar333._16_16_);
  auVar245 = vpmaxsd_avx(auVar326,auVar239);
  auVar252._16_16_ = auVar177;
  auVar252._0_16_ = auVar245;
  auVar177 = vpmaxsd_avx(auVar37._16_16_,auVar438._16_16_);
  auVar245 = vpmaxsd_avx(auVar175,auVar266);
  auVar192._16_16_ = auVar177;
  auVar192._0_16_ = auVar245;
  auVar141 = vminps_avx(auVar252,auVar192);
  auVar177 = vpmaxsd_avx(auVar36._16_16_,auVar46._16_16_);
  auVar245 = vpmaxsd_avx(auVar130,auVar218);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar229._4_4_ = uVar8;
  auVar229._0_4_ = uVar8;
  auVar229._8_4_ = uVar8;
  auVar229._12_4_ = uVar8;
  auVar229._16_4_ = uVar8;
  auVar229._20_4_ = uVar8;
  auVar229._24_4_ = uVar8;
  auVar229._28_4_ = uVar8;
  auVar143._16_16_ = auVar177;
  auVar143._0_16_ = auVar245;
  auVar149 = vminps_avx(auVar143,auVar229);
  auVar141 = vminps_avx(auVar141,auVar149);
  auVar47._4_4_ = auVar141._4_4_ * 1.0000004;
  auVar47._0_4_ = auVar141._0_4_ * 1.0000004;
  auVar47._8_4_ = auVar141._8_4_ * 1.0000004;
  auVar47._12_4_ = auVar141._12_4_ * 1.0000004;
  auVar47._16_4_ = auVar141._16_4_ * 1.0000004;
  auVar47._20_4_ = auVar141._20_4_ * 1.0000004;
  auVar47._24_4_ = auVar141._24_4_ * 1.0000004;
  auVar47._28_4_ = auVar141._28_4_;
  auVar141 = vcmpps_avx(local_400,auVar47,2);
  auVar177 = vpshufd_avx(ZEXT116((byte)PVar28),0);
  auVar193._16_16_ = auVar177;
  auVar193._0_16_ = auVar177;
  auVar149 = vcvtdq2ps_avx(auVar193);
  auVar149 = vcmpps_avx(_DAT_02020f40,auVar149,1);
  auVar141 = vandps_avx(auVar141,auVar149);
  uVar116 = vmovmskps_avx(auVar141);
  if (uVar116 == 0) {
    return;
  }
  auVar144._16_16_ = mm_lookupmask_ps._240_16_;
  auVar144._0_16_ = mm_lookupmask_ps._240_16_;
  uVar116 = uVar116 & 0xff;
  local_3c0 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,0x80);
  local_a10 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar361 = ZEXT1664((undefined1  [16])0x0);
  local_910 = prim;
LAB_011e69c5:
  local_908 = (ulong)uVar116;
  lVar121 = 0;
  if (local_908 != 0) {
    for (; (uVar116 >> lVar121 & 1) == 0; lVar121 = lVar121 + 1) {
    }
  }
  uVar116 = *(uint *)(local_910 + 2);
  local_a08 = (ulong)*(uint *)(local_910 + lVar121 * 4 + 6);
  pGVar29 = (context->scene->geometries).items[uVar116].ptr;
  uVar122 = (ulong)*(uint *)(*(long *)&pGVar29->field_0x58 +
                            local_a08 *
                            pGVar29[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar238 = (pGVar29->time_range).lower;
  fVar238 = pGVar29->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar238) / ((pGVar29->time_range).upper - fVar238));
  auVar177 = vroundss_avx(ZEXT416((uint)fVar238),ZEXT416((uint)fVar238),9);
  auVar177 = vminss_avx(auVar177,ZEXT416((uint)(pGVar29->fnumTimeSegments + -1.0)));
  auVar177 = vmaxss_avx(auVar361._0_16_,auVar177);
  fVar238 = fVar238 - auVar177._0_4_;
  _Var30 = pGVar29[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar120 = (long)(int)auVar177._0_4_ * 0x38;
  lVar31 = *(long *)(_Var30 + 0x10 + lVar120);
  lVar119 = *(long *)(_Var30 + 0x38 + lVar120);
  lVar32 = *(long *)(_Var30 + 0x48 + lVar120);
  auVar177 = vshufps_avx(ZEXT416((uint)fVar238),ZEXT416((uint)fVar238),0);
  pfVar1 = (float *)(lVar119 + uVar122 * lVar32);
  fVar129 = auVar177._0_4_;
  fVar261 = auVar177._4_4_;
  fVar173 = auVar177._8_4_;
  fVar262 = auVar177._12_4_;
  pfVar2 = (float *)(lVar119 + (uVar122 + 1) * lVar32);
  pfVar3 = (float *)(lVar119 + (uVar122 + 2) * lVar32);
  pfVar4 = (float *)(lVar119 + lVar32 * (uVar122 + 3));
  lVar119 = *(long *)(_Var30 + lVar120);
  auVar177 = vshufps_avx(ZEXT416((uint)(1.0 - fVar238)),ZEXT416((uint)(1.0 - fVar238)),0);
  pfVar5 = (float *)(lVar119 + lVar31 * uVar122);
  fVar323 = auVar177._0_4_;
  fVar260 = auVar177._4_4_;
  fVar128 = auVar177._8_4_;
  fVar237 = auVar177._12_4_;
  pfVar6 = (float *)(lVar119 + lVar31 * (uVar122 + 1));
  pfVar7 = (float *)(lVar119 + lVar31 * (uVar122 + 2));
  auVar219._0_4_ = fVar129 * *pfVar1 + fVar323 * *pfVar5;
  auVar219._4_4_ = fVar261 * pfVar1[1] + fVar260 * pfVar5[1];
  auVar219._8_4_ = fVar173 * pfVar1[2] + fVar128 * pfVar5[2];
  auVar219._12_4_ = fVar262 * pfVar1[3] + fVar237 * pfVar5[3];
  auVar176._0_4_ = fVar323 * *pfVar6 + fVar129 * *pfVar2;
  auVar176._4_4_ = fVar260 * pfVar6[1] + fVar261 * pfVar2[1];
  auVar176._8_4_ = fVar128 * pfVar6[2] + fVar173 * pfVar2[2];
  auVar176._12_4_ = fVar237 * pfVar6[3] + fVar262 * pfVar2[3];
  pfVar1 = (float *)(lVar119 + lVar31 * (uVar122 + 3));
  auVar240._0_4_ = fVar323 * *pfVar7 + fVar129 * *pfVar3;
  auVar240._4_4_ = fVar260 * pfVar7[1] + fVar261 * pfVar3[1];
  auVar240._8_4_ = fVar128 * pfVar7[2] + fVar173 * pfVar3[2];
  auVar240._12_4_ = fVar237 * pfVar7[3] + fVar262 * pfVar3[3];
  auVar177 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar245 = vinsertps_avx(auVar177,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar238 = *(float *)(ray + k * 4 + 0x40);
  auVar382._4_4_ = fVar238;
  auVar382._0_4_ = fVar238;
  auVar382._8_4_ = fVar238;
  auVar382._12_4_ = fVar238;
  fStack_810 = fVar238;
  _local_820 = auVar382;
  fStack_80c = fVar238;
  fStack_808 = fVar238;
  fStack_804 = fVar238;
  auVar294._0_4_ = fVar323 * *pfVar1 + fVar129 * *pfVar4;
  auVar294._4_4_ = fVar260 * pfVar1[1] + fVar261 * pfVar4[1];
  auVar294._8_4_ = fVar128 * pfVar1[2] + fVar173 * pfVar4[2];
  auVar294._12_4_ = fVar237 * pfVar1[3] + fVar262 * pfVar4[3];
  fVar323 = *(float *)(ray + k * 4 + 0x50);
  auVar393._4_4_ = fVar323;
  auVar393._0_4_ = fVar323;
  auVar393._8_4_ = fVar323;
  auVar393._12_4_ = fVar323;
  fStack_830 = fVar323;
  _local_840 = auVar393;
  fStack_82c = fVar323;
  fStack_828 = fVar323;
  fStack_824 = fVar323;
  auVar177 = vunpcklps_avx(auVar382,auVar393);
  fVar260 = *(float *)(ray + k * 4 + 0x60);
  auVar407._4_4_ = fVar260;
  auVar407._0_4_ = fVar260;
  auVar407._8_4_ = fVar260;
  auVar407._12_4_ = fVar260;
  fStack_890 = fVar260;
  _local_8a0 = auVar407;
  fStack_88c = fVar260;
  fStack_888 = fVar260;
  fStack_884 = fVar260;
  auVar415 = ZEXT3264(_local_8a0);
  _local_970 = vinsertps_avx(auVar177,auVar407,0x28);
  auVar131._0_4_ = (auVar219._0_4_ + auVar176._0_4_ + auVar240._0_4_ + auVar294._0_4_) * 0.25;
  auVar131._4_4_ = (auVar219._4_4_ + auVar176._4_4_ + auVar240._4_4_ + auVar294._4_4_) * 0.25;
  auVar131._8_4_ = (auVar219._8_4_ + auVar176._8_4_ + auVar240._8_4_ + auVar294._8_4_) * 0.25;
  auVar131._12_4_ = (auVar219._12_4_ + auVar176._12_4_ + auVar240._12_4_ + auVar294._12_4_) * 0.25;
  auVar177 = vsubps_avx(auVar131,auVar245);
  auVar177 = vdpps_avx(auVar177,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar133 = vrcpss_avx(local_980,local_980);
  fVar128 = auVar177._0_4_ * auVar133._0_4_ * (2.0 - local_980._0_4_ * auVar133._0_4_);
  auVar361 = ZEXT464((uint)fVar128);
  auVar133 = vshufps_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),0);
  auVar267._0_4_ = auVar245._0_4_ + local_970._0_4_ * auVar133._0_4_;
  auVar267._4_4_ = auVar245._4_4_ + local_970._4_4_ * auVar133._4_4_;
  auVar267._8_4_ = auVar245._8_4_ + local_970._8_4_ * auVar133._8_4_;
  auVar267._12_4_ = auVar245._12_4_ + local_970._12_4_ * auVar133._12_4_;
  auVar177 = vblendps_avx(auVar267,_DAT_01feba10,8);
  _local_a80 = vsubps_avx(auVar219,auVar177);
  auVar336 = ZEXT1664(_local_a80);
  _local_a90 = vsubps_avx(auVar240,auVar177);
  auVar259 = ZEXT1664(_local_a90);
  _local_aa0 = vsubps_avx(auVar176,auVar177);
  _local_ab0 = vsubps_avx(auVar294,auVar177);
  auVar177 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001250 = auVar177;
  _local_1a0 = auVar177;
  auVar177 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001250 = auVar177;
  _local_1c0 = auVar177;
  auVar177 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001250 = auVar177;
  _local_1e0 = auVar177;
  auVar177 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar177;
  _local_200 = auVar177;
  auVar177 = vshufps_avx(_local_aa0,_local_aa0,0);
  register0x00001290 = auVar177;
  _local_220 = auVar177;
  auVar177 = vshufps_avx(_local_aa0,_local_aa0,0x55);
  register0x00001290 = auVar177;
  _local_240 = auVar177;
  auVar177 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  register0x00001290 = auVar177;
  _local_260 = auVar177;
  auVar177 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  register0x00001290 = auVar177;
  _local_280 = auVar177;
  auVar177 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar177;
  _local_2a0 = auVar177;
  auVar177 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar177;
  _local_2c0 = auVar177;
  auVar177 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar177;
  _local_2e0 = auVar177;
  auVar177 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar177;
  _local_300 = auVar177;
  auVar177 = vshufps_avx(_local_ab0,_local_ab0,0);
  register0x00001290 = auVar177;
  _local_320 = auVar177;
  auVar177 = vshufps_avx(_local_ab0,_local_ab0,0x55);
  register0x00001290 = auVar177;
  _local_340 = auVar177;
  auVar177 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  register0x00001290 = auVar177;
  _local_360 = auVar177;
  auVar177 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  register0x00001290 = auVar177;
  _local_380 = auVar177;
  auVar177 = ZEXT416((uint)(fVar238 * fVar238 + fVar323 * fVar323 + fVar260 * fVar260));
  auVar177 = vshufps_avx(auVar177,auVar177,0);
  local_3a0._16_16_ = auVar177;
  local_3a0._0_16_ = auVar177;
  fVar238 = *(float *)(ray + k * 4 + 0x30);
  local_920 = ZEXT416((uint)fVar128);
  auVar177 = vshufps_avx(ZEXT416((uint)(fVar238 - fVar128)),ZEXT416((uint)(fVar238 - fVar128)),0);
  local_3e0._16_16_ = auVar177;
  local_3e0._0_16_ = auVar177;
  local_730 = vpshufd_avx(ZEXT416(uVar116),0);
  local_740 = vpshufd_avx(ZEXT416(*(uint *)(local_910 + lVar121 * 4 + 6)),0);
  register0x00001210 = auVar133;
  _local_7e0 = auVar133;
  uVar117 = 0;
  uVar122 = 1;
  auVar145._8_4_ = 0x7fffffff;
  auVar145._0_8_ = 0x7fffffff7fffffff;
  auVar145._12_4_ = 0x7fffffff;
  auVar145._16_4_ = 0x7fffffff;
  auVar145._20_4_ = 0x7fffffff;
  auVar145._24_4_ = 0x7fffffff;
  auVar145._28_4_ = 0x7fffffff;
  local_4e0 = vandps_avx(local_3a0,auVar145);
  auVar177 = vsqrtss_avx(local_980,local_980);
  local_b24 = auVar177._0_4_;
  auVar177 = vsqrtss_avx(local_980,local_980);
  local_b28 = auVar177._0_4_;
  local_930 = 0x3f80000000000000;
  uStack_928 = 0;
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = &DAT_3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar277._16_4_ = 0x3f800000;
  auVar277._20_4_ = 0x3f800000;
  auVar277._24_4_ = 0x3f800000;
  auVar277._28_4_ = 0x3f800000;
  do {
    auVar112._8_8_ = uStack_928;
    auVar112._0_8_ = local_930;
    auVar177 = vmovshdup_avx(auVar112);
    fVar323 = auVar177._0_4_ - (float)local_930;
    auVar177 = vshufps_avx(auVar112,auVar112,0);
    local_9e0._16_16_ = auVar177;
    local_9e0._0_16_ = auVar177;
    auVar245 = vshufps_avx(ZEXT416((uint)fVar323),ZEXT416((uint)fVar323),0);
    local_780._16_16_ = auVar245;
    local_780._0_16_ = auVar245;
    fVar172 = auVar245._0_4_;
    fVar210 = auVar245._4_4_;
    fVar211 = auVar245._8_4_;
    fVar213 = auVar245._12_4_;
    fVar125 = auVar177._0_4_;
    auVar194._0_4_ = fVar125 + fVar172 * 0.0;
    fVar155 = auVar177._4_4_;
    auVar194._4_4_ = fVar155 + fVar210 * 0.14285715;
    fVar158 = auVar177._8_4_;
    auVar194._8_4_ = fVar158 + fVar211 * 0.2857143;
    fVar161 = auVar177._12_4_;
    auVar194._12_4_ = fVar161 + fVar213 * 0.42857146;
    auVar194._16_4_ = fVar125 + fVar172 * 0.5714286;
    auVar194._20_4_ = fVar155 + fVar210 * 0.71428573;
    auVar194._24_4_ = fVar158 + fVar211 * 0.8571429;
    auVar194._28_4_ = fVar161 + fVar213;
    auVar141 = vsubps_avx(auVar277,auVar194);
    fVar260 = auVar141._0_4_;
    fVar128 = auVar141._4_4_;
    fVar237 = auVar141._8_4_;
    fVar129 = auVar141._12_4_;
    fVar261 = auVar141._16_4_;
    fVar173 = auVar141._20_4_;
    fVar262 = auVar141._24_4_;
    fVar288 = auVar259._28_4_;
    fVar324 = (float)local_2a0._0_4_ * auVar194._0_4_ + (float)local_220._0_4_ * fVar260;
    fVar337 = (float)local_2a0._4_4_ * auVar194._4_4_ + (float)local_220._4_4_ * fVar128;
    fVar339 = fStack_298 * auVar194._8_4_ + fStack_218 * fVar237;
    fVar341 = fStack_294 * auVar194._12_4_ + fStack_214 * fVar129;
    fVar343 = fStack_290 * auVar194._16_4_ + fStack_210 * fVar261;
    fVar345 = fStack_28c * auVar194._20_4_ + fStack_20c * fVar173;
    fVar347 = fStack_288 * auVar194._24_4_ + fStack_208 * fVar262;
    fVar263 = (float)local_2c0._0_4_ * auVar194._0_4_ + (float)local_240._0_4_ * fVar260;
    fVar264 = (float)local_2c0._4_4_ * auVar194._4_4_ + (float)local_240._4_4_ * fVar128;
    fVar265 = fStack_2b8 * auVar194._8_4_ + fStack_238 * fVar237;
    fVar281 = fStack_2b4 * auVar194._12_4_ + fStack_234 * fVar129;
    fVar282 = fStack_2b0 * auVar194._16_4_ + fStack_230 * fVar261;
    fVar284 = fStack_2ac * auVar194._20_4_ + fStack_22c * fVar173;
    fVar286 = fStack_2a8 * auVar194._24_4_ + fStack_228 * fVar262;
    fVar290 = (float)local_2e0._0_4_ * auVar194._0_4_ + (float)local_260._0_4_ * fVar260;
    fVar292 = (float)local_2e0._4_4_ * auVar194._4_4_ + (float)local_260._4_4_ * fVar128;
    fVar310 = fStack_2d8 * auVar194._8_4_ + fStack_258 * fVar237;
    fVar312 = fStack_2d4 * auVar194._12_4_ + fStack_254 * fVar129;
    fVar314 = fStack_2d0 * auVar194._16_4_ + fStack_250 * fVar261;
    fVar316 = fStack_2cc * auVar194._20_4_ + fStack_24c * fVar173;
    fVar318 = fStack_2c8 * auVar194._24_4_ + fStack_248 * fVar262;
    fVar320 = (float)local_300._0_4_ * auVar194._0_4_ + (float)local_280._0_4_ * fVar260;
    fVar311 = (float)local_300._4_4_ * auVar194._4_4_ + (float)local_280._4_4_ * fVar128;
    fVar313 = fStack_2f8 * auVar194._8_4_ + fStack_278 * fVar237;
    fVar315 = fStack_2f4 * auVar194._12_4_ + fStack_274 * fVar129;
    fVar317 = fStack_2f0 * auVar194._16_4_ + fStack_270 * fVar261;
    fVar319 = fStack_2ec * auVar194._20_4_ + fStack_26c * fVar173;
    fVar321 = fStack_2e8 * auVar194._24_4_ + fStack_268 * fVar262;
    fVar416 = auVar415._28_4_;
    fVar452 = fVar416 + fStack_224;
    fVar430 = fStack_204 + fVar416;
    auVar388._0_4_ =
         ((float)local_220._0_4_ * auVar194._0_4_ + fVar260 * (float)local_1a0._0_4_) * fVar260 +
         auVar194._0_4_ * fVar324;
    auVar388._4_4_ =
         ((float)local_220._4_4_ * auVar194._4_4_ + fVar128 * (float)local_1a0._4_4_) * fVar128 +
         auVar194._4_4_ * fVar337;
    auVar388._8_4_ =
         (fStack_218 * auVar194._8_4_ + fVar237 * fStack_198) * fVar237 + auVar194._8_4_ * fVar339;
    auVar388._12_4_ =
         (fStack_214 * auVar194._12_4_ + fVar129 * fStack_194) * fVar129 + auVar194._12_4_ * fVar341
    ;
    auVar388._16_4_ =
         (fStack_210 * auVar194._16_4_ + fVar261 * fStack_190) * fVar261 + auVar194._16_4_ * fVar343
    ;
    auVar388._20_4_ =
         (fStack_20c * auVar194._20_4_ + fVar173 * fStack_18c) * fVar173 + auVar194._20_4_ * fVar345
    ;
    auVar388._24_4_ =
         (fStack_208 * auVar194._24_4_ + fVar262 * fStack_188) * fVar262 + auVar194._24_4_ * fVar347
    ;
    auVar388._28_4_ = fStack_2e4 + fVar416;
    auVar398._0_4_ =
         fVar260 * ((float)local_240._0_4_ * auVar194._0_4_ + fVar260 * (float)local_1c0._0_4_) +
         auVar194._0_4_ * fVar263;
    auVar398._4_4_ =
         fVar128 * ((float)local_240._4_4_ * auVar194._4_4_ + fVar128 * (float)local_1c0._4_4_) +
         auVar194._4_4_ * fVar264;
    auVar398._8_4_ =
         fVar237 * (fStack_238 * auVar194._8_4_ + fVar237 * fStack_1b8) + auVar194._8_4_ * fVar265;
    auVar398._12_4_ =
         fVar129 * (fStack_234 * auVar194._12_4_ + fVar129 * fStack_1b4) + auVar194._12_4_ * fVar281
    ;
    auVar398._16_4_ =
         fVar261 * (fStack_230 * auVar194._16_4_ + fVar261 * fStack_1b0) + auVar194._16_4_ * fVar282
    ;
    auVar398._20_4_ =
         fVar173 * (fStack_22c * auVar194._20_4_ + fVar173 * fStack_1ac) + auVar194._20_4_ * fVar284
    ;
    auVar398._24_4_ =
         fVar262 * (fStack_228 * auVar194._24_4_ + fVar262 * fStack_1a8) + auVar194._24_4_ * fVar286
    ;
    auVar398._28_4_ = fVar288 + auVar361._28_4_ + fVar416;
    auVar413._0_4_ =
         fVar260 * ((float)local_260._0_4_ * auVar194._0_4_ + fVar260 * (float)local_1e0._0_4_) +
         auVar194._0_4_ * fVar290;
    auVar413._4_4_ =
         fVar128 * ((float)local_260._4_4_ * auVar194._4_4_ + fVar128 * (float)local_1e0._4_4_) +
         auVar194._4_4_ * fVar292;
    auVar413._8_4_ =
         fVar237 * (fStack_258 * auVar194._8_4_ + fVar237 * fStack_1d8) + auVar194._8_4_ * fVar310;
    auVar413._12_4_ =
         fVar129 * (fStack_254 * auVar194._12_4_ + fVar129 * fStack_1d4) + auVar194._12_4_ * fVar312
    ;
    auVar413._16_4_ =
         fVar261 * (fStack_250 * auVar194._16_4_ + fVar261 * fStack_1d0) + auVar194._16_4_ * fVar314
    ;
    auVar413._20_4_ =
         fVar173 * (fStack_24c * auVar194._20_4_ + fVar173 * fStack_1cc) + auVar194._20_4_ * fVar316
    ;
    auVar413._24_4_ =
         fVar262 * (fStack_248 * auVar194._24_4_ + fVar262 * fStack_1c8) + auVar194._24_4_ * fVar318
    ;
    auVar413._28_4_ = fStack_2c4 + fVar416;
    auVar355._0_4_ =
         auVar194._0_4_ * fVar320 +
         fVar260 * ((float)local_280._0_4_ * auVar194._0_4_ + fVar260 * (float)local_200._0_4_);
    auVar355._4_4_ =
         auVar194._4_4_ * fVar311 +
         fVar128 * ((float)local_280._4_4_ * auVar194._4_4_ + fVar128 * (float)local_200._4_4_);
    auVar355._8_4_ =
         auVar194._8_4_ * fVar313 + fVar237 * (fStack_278 * auVar194._8_4_ + fVar237 * fStack_1f8);
    auVar355._12_4_ =
         auVar194._12_4_ * fVar315 + fVar129 * (fStack_274 * auVar194._12_4_ + fVar129 * fStack_1f4)
    ;
    auVar355._16_4_ =
         auVar194._16_4_ * fVar317 + fVar261 * (fStack_270 * auVar194._16_4_ + fVar261 * fStack_1f0)
    ;
    auVar355._20_4_ =
         auVar194._20_4_ * fVar319 + fVar173 * (fStack_26c * auVar194._20_4_ + fVar173 * fStack_1ec)
    ;
    auVar355._24_4_ =
         auVar194._24_4_ * fVar321 + fVar262 * (fStack_268 * auVar194._24_4_ + fVar262 * fStack_1e8)
    ;
    auVar355._28_4_ = fStack_2c4 + fStack_2a4;
    auVar454._0_4_ =
         (auVar194._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar260) *
         auVar194._0_4_ + fVar260 * fVar324;
    auVar454._4_4_ =
         (auVar194._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar128) *
         auVar194._4_4_ + fVar128 * fVar337;
    auVar454._8_4_ =
         (auVar194._8_4_ * fStack_318 + fStack_298 * fVar237) * auVar194._8_4_ + fVar237 * fVar339;
    auVar454._12_4_ =
         (auVar194._12_4_ * fStack_314 + fStack_294 * fVar129) * auVar194._12_4_ + fVar129 * fVar341
    ;
    auVar454._16_4_ =
         (auVar194._16_4_ * fStack_310 + fStack_290 * fVar261) * auVar194._16_4_ + fVar261 * fVar343
    ;
    auVar454._20_4_ =
         (auVar194._20_4_ * fStack_30c + fStack_28c * fVar173) * auVar194._20_4_ + fVar173 * fVar345
    ;
    auVar454._24_4_ =
         (auVar194._24_4_ * fStack_308 + fStack_288 * fVar262) * auVar194._24_4_ + fVar262 * fVar347
    ;
    auVar454._28_4_ = fStack_2c4 + fVar288 + auVar336._28_4_;
    auVar253._0_4_ =
         (auVar194._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar260) *
         auVar194._0_4_ + fVar260 * fVar263;
    auVar253._4_4_ =
         (auVar194._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar128) *
         auVar194._4_4_ + fVar128 * fVar264;
    auVar253._8_4_ =
         (auVar194._8_4_ * fStack_338 + fStack_2b8 * fVar237) * auVar194._8_4_ + fVar237 * fVar265;
    auVar253._12_4_ =
         (auVar194._12_4_ * fStack_334 + fStack_2b4 * fVar129) * auVar194._12_4_ + fVar129 * fVar281
    ;
    auVar253._16_4_ =
         (auVar194._16_4_ * fStack_330 + fStack_2b0 * fVar261) * auVar194._16_4_ + fVar261 * fVar282
    ;
    auVar253._20_4_ =
         (auVar194._20_4_ * fStack_32c + fStack_2ac * fVar173) * auVar194._20_4_ + fVar173 * fVar284
    ;
    auVar253._24_4_ =
         (auVar194._24_4_ * fStack_328 + fStack_2a8 * fVar262) * auVar194._24_4_ + fVar262 * fVar286
    ;
    auVar253._28_4_ = fStack_2c4 + auVar277._28_4_ + fVar288;
    auVar278._0_4_ =
         auVar194._0_4_ *
         (auVar194._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar260) +
         fVar260 * fVar290;
    auVar278._4_4_ =
         auVar194._4_4_ *
         (auVar194._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar128) +
         fVar128 * fVar292;
    auVar278._8_4_ =
         auVar194._8_4_ * (auVar194._8_4_ * fStack_358 + fStack_2d8 * fVar237) + fVar237 * fVar310;
    auVar278._12_4_ =
         auVar194._12_4_ * (auVar194._12_4_ * fStack_354 + fStack_2d4 * fVar129) + fVar129 * fVar312
    ;
    auVar278._16_4_ =
         auVar194._16_4_ * (auVar194._16_4_ * fStack_350 + fStack_2d0 * fVar261) + fVar261 * fVar314
    ;
    auVar278._20_4_ =
         auVar194._20_4_ * (auVar194._20_4_ * fStack_34c + fStack_2cc * fVar173) + fVar173 * fVar316
    ;
    auVar278._24_4_ =
         auVar194._24_4_ * (auVar194._24_4_ * fStack_348 + fStack_2c8 * fVar262) + fVar262 * fVar318
    ;
    auVar278._28_4_ = fVar430 + auVar277._28_4_ + 1.0;
    auVar302._0_4_ =
         (auVar194._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar260) *
         auVar194._0_4_ + fVar260 * fVar320;
    auVar302._4_4_ =
         (auVar194._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar128) *
         auVar194._4_4_ + fVar128 * fVar311;
    auVar302._8_4_ =
         (auVar194._8_4_ * fStack_378 + fStack_2f8 * fVar237) * auVar194._8_4_ + fVar237 * fVar313;
    auVar302._12_4_ =
         (auVar194._12_4_ * fStack_374 + fStack_2f4 * fVar129) * auVar194._12_4_ + fVar129 * fVar315
    ;
    auVar302._16_4_ =
         (auVar194._16_4_ * fStack_370 + fStack_2f0 * fVar261) * auVar194._16_4_ + fVar261 * fVar317
    ;
    auVar302._20_4_ =
         (auVar194._20_4_ * fStack_36c + fStack_2ec * fVar173) * auVar194._20_4_ + fVar173 * fVar319
    ;
    auVar302._24_4_ =
         (auVar194._24_4_ * fStack_368 + fStack_2e8 * fVar262) * auVar194._24_4_ + fVar262 * fVar321
    ;
    auVar302._28_4_ = fVar452 + fVar416 + 1.0;
    fVar126 = auVar388._0_4_ * fVar260 + auVar454._0_4_ * auVar194._0_4_;
    fVar156 = auVar388._4_4_ * fVar128 + auVar454._4_4_ * auVar194._4_4_;
    fVar159 = auVar388._8_4_ * fVar237 + auVar454._8_4_ * auVar194._8_4_;
    fVar162 = auVar388._12_4_ * fVar129 + auVar454._12_4_ * auVar194._12_4_;
    fVar164 = auVar388._16_4_ * fVar261 + auVar454._16_4_ * auVar194._16_4_;
    fVar166 = auVar388._20_4_ * fVar173 + auVar454._20_4_ * auVar194._20_4_;
    fVar168 = auVar388._24_4_ * fVar262 + auVar454._24_4_ * auVar194._24_4_;
    fVar170 = fVar452 + fStack_2c4;
    fVar127 = auVar398._0_4_ * fVar260 + auVar194._0_4_ * auVar253._0_4_;
    fVar157 = auVar398._4_4_ * fVar128 + auVar194._4_4_ * auVar253._4_4_;
    fVar160 = auVar398._8_4_ * fVar237 + auVar194._8_4_ * auVar253._8_4_;
    fVar163 = auVar398._12_4_ * fVar129 + auVar194._12_4_ * auVar253._12_4_;
    fVar165 = auVar398._16_4_ * fVar261 + auVar194._16_4_ * auVar253._16_4_;
    fVar167 = auVar398._20_4_ * fVar173 + auVar194._20_4_ * auVar253._20_4_;
    fVar169 = auVar398._24_4_ * fVar262 + auVar194._24_4_ * auVar253._24_4_;
    fVar171 = fStack_2c4 + fVar430;
    local_540._0_4_ = auVar413._0_4_ * fVar260 + auVar194._0_4_ * auVar278._0_4_;
    local_540._4_4_ = auVar413._4_4_ * fVar128 + auVar194._4_4_ * auVar278._4_4_;
    local_540._8_4_ = auVar413._8_4_ * fVar237 + auVar194._8_4_ * auVar278._8_4_;
    local_540._12_4_ = auVar413._12_4_ * fVar129 + auVar194._12_4_ * auVar278._12_4_;
    local_540._16_4_ = auVar413._16_4_ * fVar261 + auVar194._16_4_ * auVar278._16_4_;
    local_540._20_4_ = auVar413._20_4_ * fVar173 + auVar194._20_4_ * auVar278._20_4_;
    local_540._24_4_ = auVar413._24_4_ * fVar262 + auVar194._24_4_ * auVar278._24_4_;
    local_540._28_4_ = fVar430 + fStack_2c4;
    local_7a0._0_4_ = fVar260 * auVar355._0_4_ + auVar194._0_4_ * auVar302._0_4_;
    local_7a0._4_4_ = fVar128 * auVar355._4_4_ + auVar194._4_4_ * auVar302._4_4_;
    local_7a0._8_4_ = fVar237 * auVar355._8_4_ + auVar194._8_4_ * auVar302._8_4_;
    local_7a0._12_4_ = fVar129 * auVar355._12_4_ + auVar194._12_4_ * auVar302._12_4_;
    local_7a0._16_4_ = fVar261 * auVar355._16_4_ + auVar194._16_4_ * auVar302._16_4_;
    local_7a0._20_4_ = fVar173 * auVar355._20_4_ + auVar194._20_4_ * auVar302._20_4_;
    local_7a0._24_4_ = fVar262 * auVar355._24_4_ + auVar194._24_4_ * auVar302._24_4_;
    local_7a0._28_4_ = auVar141._28_4_ + auVar194._28_4_;
    auVar36 = vsubps_avx(auVar454,auVar388);
    auVar141 = vsubps_avx(auVar253,auVar398);
    auVar149 = vsubps_avx(auVar278,auVar413);
    auVar37 = vsubps_avx(auVar302,auVar355);
    auVar177 = vshufps_avx(ZEXT416((uint)(fVar323 * 0.04761905)),
                           ZEXT416((uint)(fVar323 * 0.04761905)),0);
    fVar314 = auVar177._0_4_;
    fVar349 = fVar314 * auVar36._0_4_ * 3.0;
    fVar316 = auVar177._4_4_;
    fVar362 = fVar316 * auVar36._4_4_ * 3.0;
    local_a00._4_4_ = fVar362;
    local_a00._0_4_ = fVar349;
    fVar317 = auVar177._8_4_;
    fVar363 = fVar317 * auVar36._8_4_ * 3.0;
    fStack_9f8 = fVar363;
    fVar286 = auVar177._12_4_;
    fVar365 = fVar286 * auVar36._12_4_ * 3.0;
    fStack_9f4 = fVar365;
    fVar367 = fVar314 * auVar36._16_4_ * 3.0;
    unique0x1000b95c = fVar367;
    fVar369 = fVar316 * auVar36._20_4_ * 3.0;
    unique0x1000b960 = fVar369;
    fVar371 = fVar317 * auVar36._24_4_ * 3.0;
    unique0x1000b964 = fVar371;
    unique0x1000b968 = auVar355._28_4_;
    fVar417 = fVar314 * auVar141._0_4_ * 3.0;
    fVar424 = fVar316 * auVar141._4_4_ * 3.0;
    local_b20._4_4_ = fVar424;
    local_b20._0_4_ = fVar417;
    fVar425 = fVar317 * auVar141._8_4_ * 3.0;
    local_b20._8_4_ = fVar425;
    fVar426 = fVar286 * auVar141._12_4_ * 3.0;
    local_b20._12_4_ = fVar426;
    fVar427 = fVar314 * auVar141._16_4_ * 3.0;
    local_b20._16_4_ = fVar427;
    fVar428 = fVar316 * auVar141._20_4_ * 3.0;
    local_b20._20_4_ = fVar428;
    fVar429 = fVar317 * auVar141._24_4_ * 3.0;
    local_b20._24_4_ = fVar429;
    local_b20._28_4_ = fVar430;
    fVar431 = fVar314 * auVar149._0_4_ * 3.0;
    fVar439 = fVar316 * auVar149._4_4_ * 3.0;
    auVar48._4_4_ = fVar439;
    auVar48._0_4_ = fVar431;
    fVar442 = fVar317 * auVar149._8_4_ * 3.0;
    auVar48._8_4_ = fVar442;
    fVar444 = fVar286 * auVar149._12_4_ * 3.0;
    auVar48._12_4_ = fVar444;
    fVar446 = fVar314 * auVar149._16_4_ * 3.0;
    auVar48._16_4_ = fVar446;
    fVar448 = fVar316 * auVar149._20_4_ * 3.0;
    auVar48._20_4_ = fVar448;
    fVar450 = fVar317 * auVar149._24_4_ * 3.0;
    auVar48._24_4_ = fVar450;
    auVar48._28_4_ = fVar452;
    fVar173 = fVar314 * auVar37._0_4_ * 3.0;
    fVar262 = fVar316 * auVar37._4_4_ * 3.0;
    auVar49._4_4_ = fVar262;
    auVar49._0_4_ = fVar173;
    fVar284 = fVar317 * auVar37._8_4_ * 3.0;
    auVar49._8_4_ = fVar284;
    fVar286 = fVar286 * auVar37._12_4_ * 3.0;
    auVar49._12_4_ = fVar286;
    fVar314 = fVar314 * auVar37._16_4_ * 3.0;
    auVar49._16_4_ = fVar314;
    fVar316 = fVar316 * auVar37._20_4_ * 3.0;
    auVar49._20_4_ = fVar316;
    fVar317 = fVar317 * auVar37._24_4_ * 3.0;
    auVar49._24_4_ = fVar317;
    auVar49._28_4_ = auVar36._28_4_;
    auVar106._4_4_ = fVar157;
    auVar106._0_4_ = fVar127;
    auVar106._8_4_ = fVar160;
    auVar106._12_4_ = fVar163;
    auVar106._16_4_ = fVar165;
    auVar106._20_4_ = fVar167;
    auVar106._24_4_ = fVar169;
    auVar106._28_4_ = fVar171;
    auVar141 = vperm2f128_avx(auVar106,auVar106,1);
    auVar141 = vshufps_avx(auVar141,auVar106,0x30);
    auVar37 = vshufps_avx(auVar106,auVar141,0x29);
    auVar141 = vperm2f128_avx(local_540,local_540,1);
    auVar141 = vshufps_avx(auVar141,local_540,0x30);
    local_a40 = vshufps_avx(local_540,auVar141,0x29);
    auVar149 = vsubps_avx(local_7a0,auVar49);
    auVar141 = vperm2f128_avx(auVar149,auVar149,1);
    auVar141 = vshufps_avx(auVar141,auVar149,0x30);
    local_7c0 = vshufps_avx(auVar149,auVar141,0x29);
    local_580 = vsubps_avx(auVar37,auVar106);
    _local_560 = vsubps_avx(local_a40,local_540);
    fVar260 = local_580._0_4_;
    fVar263 = local_580._4_4_;
    auVar50._4_4_ = fVar439 * fVar263;
    auVar50._0_4_ = fVar431 * fVar260;
    fVar288 = local_580._8_4_;
    auVar50._8_4_ = fVar442 * fVar288;
    fVar318 = local_580._12_4_;
    auVar50._12_4_ = fVar444 * fVar318;
    fVar321 = local_580._16_4_;
    auVar50._16_4_ = fVar446 * fVar321;
    fVar347 = local_580._20_4_;
    auVar50._20_4_ = fVar448 * fVar347;
    fVar41 = local_580._24_4_;
    auVar50._24_4_ = fVar450 * fVar41;
    auVar50._28_4_ = auVar149._28_4_;
    fVar128 = local_560._0_4_;
    fVar264 = local_560._4_4_;
    auVar51._4_4_ = fVar424 * fVar264;
    auVar51._0_4_ = fVar417 * fVar128;
    fVar290 = local_560._8_4_;
    auVar51._8_4_ = fVar425 * fVar290;
    fVar320 = local_560._12_4_;
    auVar51._12_4_ = fVar426 * fVar320;
    fVar324 = local_560._16_4_;
    auVar51._16_4_ = fVar427 * fVar324;
    fVar416 = local_560._20_4_;
    auVar51._20_4_ = fVar428 * fVar416;
    fVar42 = local_560._24_4_;
    auVar51._24_4_ = fVar429 * fVar42;
    auVar51._28_4_ = auVar141._28_4_;
    auVar438 = vsubps_avx(auVar51,auVar50);
    auVar104._4_4_ = fVar156;
    auVar104._0_4_ = fVar126;
    auVar104._8_4_ = fVar159;
    auVar104._12_4_ = fVar162;
    auVar104._16_4_ = fVar164;
    auVar104._20_4_ = fVar166;
    auVar104._24_4_ = fVar168;
    auVar104._28_4_ = fVar170;
    auVar141 = vperm2f128_avx(auVar104,auVar104,1);
    auVar141 = vshufps_avx(auVar141,auVar104,0x30);
    auVar38 = vshufps_avx(auVar104,auVar141,0x29);
    local_5a0 = vsubps_avx(auVar38,auVar104);
    auVar52._4_4_ = fVar264 * fVar362;
    auVar52._0_4_ = fVar128 * fVar349;
    auVar52._8_4_ = fVar290 * fVar363;
    auVar52._12_4_ = fVar320 * fVar365;
    auVar52._16_4_ = fVar324 * fVar367;
    auVar52._20_4_ = fVar416 * fVar369;
    auVar52._24_4_ = fVar42 * fVar371;
    auVar52._28_4_ = auVar141._28_4_;
    fVar237 = local_5a0._0_4_;
    fVar265 = local_5a0._4_4_;
    auVar53._4_4_ = fVar439 * fVar265;
    auVar53._0_4_ = fVar431 * fVar237;
    fVar292 = local_5a0._8_4_;
    auVar53._8_4_ = fVar442 * fVar292;
    fVar311 = local_5a0._12_4_;
    auVar53._12_4_ = fVar444 * fVar311;
    fVar337 = local_5a0._16_4_;
    auVar53._16_4_ = fVar446 * fVar337;
    fVar452 = local_5a0._20_4_;
    auVar53._20_4_ = fVar448 * fVar452;
    fVar43 = local_5a0._24_4_;
    auVar53._24_4_ = fVar450 * fVar43;
    auVar53._28_4_ = fVar170;
    auVar39 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar424 * fVar265;
    auVar54._0_4_ = fVar417 * fVar237;
    auVar54._8_4_ = fVar425 * fVar292;
    auVar54._12_4_ = fVar426 * fVar311;
    auVar54._16_4_ = fVar427 * fVar337;
    auVar54._20_4_ = fVar428 * fVar452;
    auVar54._24_4_ = fVar429 * fVar43;
    auVar54._28_4_ = fVar170;
    auVar55._4_4_ = fVar263 * fVar362;
    auVar55._0_4_ = fVar260 * fVar349;
    auVar55._8_4_ = fVar288 * fVar363;
    auVar55._12_4_ = fVar318 * fVar365;
    auVar55._16_4_ = fVar321 * fVar367;
    auVar55._20_4_ = fVar347 * fVar369;
    auVar55._24_4_ = fVar41 * fVar371;
    auVar55._28_4_ = auVar398._28_4_;
    auVar40 = vsubps_avx(auVar55,auVar54);
    fVar323 = auVar40._28_4_;
    fVar319 = auVar39._28_4_ + fVar323;
    auVar254._0_4_ = fVar237 * fVar237 + fVar260 * fVar260 + fVar128 * fVar128;
    auVar254._4_4_ = fVar265 * fVar265 + fVar263 * fVar263 + fVar264 * fVar264;
    auVar254._8_4_ = fVar292 * fVar292 + fVar288 * fVar288 + fVar290 * fVar290;
    auVar254._12_4_ = fVar311 * fVar311 + fVar318 * fVar318 + fVar320 * fVar320;
    auVar254._16_4_ = fVar337 * fVar337 + fVar321 * fVar321 + fVar324 * fVar324;
    auVar254._20_4_ = fVar452 * fVar452 + fVar347 * fVar347 + fVar416 * fVar416;
    auVar254._24_4_ = fVar43 * fVar43 + fVar41 * fVar41 + fVar42 * fVar42;
    auVar254._28_4_ = fVar323 + fVar323 + fVar319;
    auVar141 = vrcpps_avx(auVar254);
    fVar343 = auVar141._0_4_;
    fVar345 = auVar141._4_4_;
    auVar56._4_4_ = fVar345 * auVar254._4_4_;
    auVar56._0_4_ = fVar343 * auVar254._0_4_;
    fVar283 = auVar141._8_4_;
    auVar56._8_4_ = fVar283 * auVar254._8_4_;
    fVar285 = auVar141._12_4_;
    auVar56._12_4_ = fVar285 * auVar254._12_4_;
    fVar287 = auVar141._16_4_;
    auVar56._16_4_ = fVar287 * auVar254._16_4_;
    fVar289 = auVar141._20_4_;
    auVar56._20_4_ = fVar289 * auVar254._20_4_;
    fVar291 = auVar141._24_4_;
    auVar56._24_4_ = fVar291 * auVar254._24_4_;
    auVar56._28_4_ = auVar398._28_4_;
    auVar146._8_4_ = 0x3f800000;
    auVar146._0_8_ = &DAT_3f8000003f800000;
    auVar146._12_4_ = 0x3f800000;
    auVar146._16_4_ = 0x3f800000;
    auVar146._20_4_ = 0x3f800000;
    auVar146._24_4_ = 0x3f800000;
    auVar146._28_4_ = 0x3f800000;
    auVar333 = vsubps_avx(auVar146,auVar56);
    fVar343 = auVar333._0_4_ * fVar343 + fVar343;
    fVar345 = auVar333._4_4_ * fVar345 + fVar345;
    fVar283 = auVar333._8_4_ * fVar283 + fVar283;
    fVar285 = auVar333._12_4_ * fVar285 + fVar285;
    fVar287 = auVar333._16_4_ * fVar287 + fVar287;
    fVar289 = auVar333._20_4_ * fVar289 + fVar289;
    fVar291 = auVar333._24_4_ * fVar291 + fVar291;
    auVar149 = vperm2f128_avx(local_b20,local_b20,1);
    auVar149 = vshufps_avx(auVar149,local_b20,0x30);
    local_760 = vshufps_avx(local_b20,auVar149,0x29);
    auVar149 = vperm2f128_avx(auVar48,auVar48,1);
    auVar149 = vshufps_avx(auVar149,auVar48,0x30);
    local_9a0 = vshufps_avx(auVar48,auVar149,0x29);
    fVar432 = local_9a0._0_4_;
    fVar440 = local_9a0._4_4_;
    auVar57._4_4_ = fVar440 * fVar263;
    auVar57._0_4_ = fVar432 * fVar260;
    fVar443 = local_9a0._8_4_;
    auVar57._8_4_ = fVar443 * fVar288;
    fVar445 = local_9a0._12_4_;
    auVar57._12_4_ = fVar445 * fVar318;
    fVar447 = local_9a0._16_4_;
    auVar57._16_4_ = fVar447 * fVar321;
    fVar449 = local_9a0._20_4_;
    auVar57._20_4_ = fVar449 * fVar347;
    fVar451 = local_9a0._24_4_;
    auVar57._24_4_ = fVar451 * fVar41;
    auVar57._28_4_ = auVar149._28_4_;
    fVar129 = local_760._0_4_;
    fVar281 = local_760._4_4_;
    auVar58._4_4_ = fVar264 * fVar281;
    auVar58._0_4_ = fVar128 * fVar129;
    fVar310 = local_760._8_4_;
    auVar58._8_4_ = fVar290 * fVar310;
    fVar313 = local_760._12_4_;
    auVar58._12_4_ = fVar320 * fVar313;
    fVar339 = local_760._16_4_;
    auVar58._16_4_ = fVar324 * fVar339;
    fVar322 = local_760._20_4_;
    auVar58._20_4_ = fVar416 * fVar322;
    fVar44 = local_760._24_4_;
    auVar58._24_4_ = fVar42 * fVar44;
    auVar58._28_4_ = fVar430;
    auVar46 = vsubps_avx(auVar58,auVar57);
    auVar149 = vperm2f128_avx(_local_a00,_local_a00,1);
    auVar149 = vshufps_avx(auVar149,_local_a00,0x30);
    local_b00 = vshufps_avx(_local_a00,auVar149,0x29);
    fVar261 = local_b00._0_4_;
    fVar282 = local_b00._4_4_;
    auVar59._4_4_ = fVar264 * fVar282;
    auVar59._0_4_ = fVar128 * fVar261;
    fVar312 = local_b00._8_4_;
    auVar59._8_4_ = fVar290 * fVar312;
    fVar315 = local_b00._12_4_;
    auVar59._12_4_ = fVar320 * fVar315;
    fVar341 = local_b00._16_4_;
    auVar59._16_4_ = fVar324 * fVar341;
    fVar430 = local_b00._20_4_;
    auVar59._20_4_ = fVar416 * fVar430;
    fVar45 = local_b00._24_4_;
    auVar59._24_4_ = fVar42 * fVar45;
    auVar59._28_4_ = auVar149._28_4_;
    auVar60._4_4_ = fVar440 * fVar265;
    auVar60._0_4_ = fVar432 * fVar237;
    auVar60._8_4_ = fVar443 * fVar292;
    auVar60._12_4_ = fVar445 * fVar311;
    auVar60._16_4_ = fVar447 * fVar337;
    auVar60._20_4_ = fVar449 * fVar452;
    uVar34 = local_9a0._28_4_;
    auVar60._24_4_ = fVar451 * fVar43;
    auVar60._28_4_ = uVar34;
    auVar47 = vsubps_avx(auVar60,auVar59);
    auVar61._4_4_ = fVar265 * fVar281;
    auVar61._0_4_ = fVar237 * fVar129;
    auVar61._8_4_ = fVar292 * fVar310;
    auVar61._12_4_ = fVar311 * fVar313;
    auVar61._16_4_ = fVar337 * fVar339;
    auVar61._20_4_ = fVar452 * fVar322;
    auVar61._24_4_ = fVar43 * fVar44;
    auVar61._28_4_ = uVar34;
    auVar62._4_4_ = fVar263 * fVar282;
    auVar62._0_4_ = fVar260 * fVar261;
    auVar62._8_4_ = fVar288 * fVar312;
    auVar62._12_4_ = fVar318 * fVar315;
    auVar62._16_4_ = fVar321 * fVar341;
    auVar62._20_4_ = fVar347 * fVar430;
    auVar62._24_4_ = fVar41 * fVar45;
    auVar62._28_4_ = auVar454._28_4_;
    auVar149 = vsubps_avx(auVar62,auVar61);
    fVar323 = auVar149._28_4_;
    auVar63._4_4_ =
         (auVar438._4_4_ * auVar438._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar40._4_4_ * auVar40._4_4_) * fVar345;
    auVar63._0_4_ =
         (auVar438._0_4_ * auVar438._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar40._0_4_ * auVar40._0_4_) * fVar343;
    auVar63._8_4_ =
         (auVar438._8_4_ * auVar438._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar40._8_4_ * auVar40._8_4_) * fVar283;
    auVar63._12_4_ =
         (auVar438._12_4_ * auVar438._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar40._12_4_ * auVar40._12_4_) * fVar285;
    auVar63._16_4_ =
         (auVar438._16_4_ * auVar438._16_4_ +
         auVar39._16_4_ * auVar39._16_4_ + auVar40._16_4_ * auVar40._16_4_) * fVar287;
    auVar63._20_4_ =
         (auVar438._20_4_ * auVar438._20_4_ +
         auVar39._20_4_ * auVar39._20_4_ + auVar40._20_4_ * auVar40._20_4_) * fVar289;
    auVar63._24_4_ =
         (auVar438._24_4_ * auVar438._24_4_ +
         auVar39._24_4_ * auVar39._24_4_ + auVar40._24_4_ * auVar40._24_4_) * fVar291;
    auVar63._28_4_ = auVar438._28_4_ + fVar319;
    auVar64._4_4_ =
         (auVar46._4_4_ * auVar46._4_4_ +
         auVar47._4_4_ * auVar47._4_4_ + auVar149._4_4_ * auVar149._4_4_) * fVar345;
    auVar64._0_4_ =
         (auVar46._0_4_ * auVar46._0_4_ +
         auVar47._0_4_ * auVar47._0_4_ + auVar149._0_4_ * auVar149._0_4_) * fVar343;
    auVar64._8_4_ =
         (auVar46._8_4_ * auVar46._8_4_ +
         auVar47._8_4_ * auVar47._8_4_ + auVar149._8_4_ * auVar149._8_4_) * fVar283;
    auVar64._12_4_ =
         (auVar46._12_4_ * auVar46._12_4_ +
         auVar47._12_4_ * auVar47._12_4_ + auVar149._12_4_ * auVar149._12_4_) * fVar285;
    auVar64._16_4_ =
         (auVar46._16_4_ * auVar46._16_4_ +
         auVar47._16_4_ * auVar47._16_4_ + auVar149._16_4_ * auVar149._16_4_) * fVar287;
    auVar64._20_4_ =
         (auVar46._20_4_ * auVar46._20_4_ +
         auVar47._20_4_ * auVar47._20_4_ + auVar149._20_4_ * auVar149._20_4_) * fVar289;
    auVar64._24_4_ =
         (auVar46._24_4_ * auVar46._24_4_ +
         auVar47._24_4_ * auVar47._24_4_ + auVar149._24_4_ * auVar149._24_4_) * fVar291;
    auVar64._28_4_ = auVar333._28_4_ + auVar141._28_4_;
    auVar141 = vmaxps_avx(auVar63,auVar64);
    auVar149 = vperm2f128_avx(local_7a0,local_7a0,1);
    auVar149 = vshufps_avx(auVar149,local_7a0,0x30);
    local_800 = vshufps_avx(local_7a0,auVar149,0x29);
    local_620._0_4_ = (float)local_7a0._0_4_ + fVar173;
    local_620._4_4_ = local_7a0._4_4_ + fVar262;
    local_620._8_4_ = local_7a0._8_4_ + fVar284;
    local_620._12_4_ = local_7a0._12_4_ + fVar286;
    local_620._16_4_ = local_7a0._16_4_ + fVar314;
    local_620._20_4_ = local_7a0._20_4_ + fVar316;
    local_620._24_4_ = local_7a0._24_4_ + fVar317;
    local_620._28_4_ = local_7a0._28_4_ + auVar36._28_4_;
    auVar149 = vmaxps_avx(local_7a0,local_620);
    auVar36 = vmaxps_avx(local_7c0,local_800);
    auVar149 = vmaxps_avx(auVar149,auVar36);
    auVar36 = vrsqrtps_avx(auVar254);
    fVar173 = auVar36._0_4_;
    fVar262 = auVar36._4_4_;
    fVar284 = auVar36._8_4_;
    fVar286 = auVar36._12_4_;
    fVar314 = auVar36._16_4_;
    fVar316 = auVar36._20_4_;
    fVar317 = auVar36._24_4_;
    local_420 = fVar173 * 1.5 + fVar173 * fVar173 * fVar173 * auVar254._0_4_ * -0.5;
    fStack_41c = fVar262 * 1.5 + fVar262 * fVar262 * fVar262 * auVar254._4_4_ * -0.5;
    fStack_418 = fVar284 * 1.5 + fVar284 * fVar284 * fVar284 * auVar254._8_4_ * -0.5;
    fStack_414 = fVar286 * 1.5 + fVar286 * fVar286 * fVar286 * auVar254._12_4_ * -0.5;
    fStack_410 = fVar314 * 1.5 + fVar314 * fVar314 * fVar314 * auVar254._16_4_ * -0.5;
    fStack_40c = fVar316 * 1.5 + fVar316 * fVar316 * fVar316 * auVar254._20_4_ * -0.5;
    fStack_408 = fVar317 * 1.5 + fVar317 * fVar317 * fVar317 * auVar254._24_4_ * -0.5;
    fStack_404 = auVar36._28_4_ + auVar254._28_4_;
    auVar107._4_4_ = fVar157;
    auVar107._0_4_ = fVar127;
    auVar107._8_4_ = fVar160;
    auVar107._12_4_ = fVar163;
    auVar107._16_4_ = fVar165;
    auVar107._20_4_ = fVar167;
    auVar107._24_4_ = fVar169;
    auVar107._28_4_ = fVar171;
    local_9c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar107);
    auVar438 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    fVar457 = auVar438._0_4_;
    fVar459 = auVar438._4_4_;
    fVar460 = auVar438._8_4_;
    fVar461 = auVar438._12_4_;
    fVar462 = auVar438._16_4_;
    fVar463 = auVar438._20_4_;
    fVar464 = auVar438._24_4_;
    fVar173 = local_9c0._0_4_;
    fVar284 = local_9c0._4_4_;
    fVar314 = local_9c0._8_4_;
    fVar317 = local_9c0._12_4_;
    fVar343 = local_9c0._16_4_;
    fVar283 = local_9c0._20_4_;
    fVar287 = local_9c0._24_4_;
    auVar105._4_4_ = fVar156;
    auVar105._0_4_ = fVar126;
    auVar105._8_4_ = fVar159;
    auVar105._12_4_ = fVar162;
    auVar105._16_4_ = fVar164;
    auVar105._20_4_ = fVar166;
    auVar105._24_4_ = fVar168;
    auVar105._28_4_ = fVar170;
    auVar438 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
    fVar262 = auVar438._0_4_;
    fVar286 = auVar438._4_4_;
    fVar316 = auVar438._8_4_;
    fVar319 = auVar438._12_4_;
    fVar345 = auVar438._16_4_;
    fVar285 = auVar438._20_4_;
    fVar289 = auVar438._24_4_;
    auVar422._0_4_ =
         (float)local_820._0_4_ * fVar262 +
         (float)local_840._0_4_ * fVar173 + fVar457 * (float)local_8a0._0_4_;
    auVar422._4_4_ =
         (float)local_820._4_4_ * fVar286 +
         (float)local_840._4_4_ * fVar284 + fVar459 * (float)local_8a0._4_4_;
    auVar422._8_4_ = fStack_818 * fVar316 + fStack_838 * fVar314 + fVar460 * fStack_898;
    auVar422._12_4_ = fStack_814 * fVar319 + fStack_834 * fVar317 + fVar461 * fStack_894;
    auVar422._16_4_ = fStack_810 * fVar345 + fStack_830 * fVar343 + fVar462 * fStack_890;
    auVar422._20_4_ = fStack_80c * fVar285 + fStack_82c * fVar283 + fVar463 * fStack_88c;
    auVar422._24_4_ = fStack_808 * fVar289 + fStack_828 * fVar287 + fVar464 * fStack_888;
    auVar422._28_4_ = fVar323 + auVar47._28_4_ + fVar323 + auVar36._28_4_;
    auVar436._0_4_ = fVar262 * fVar262 + fVar173 * fVar173 + fVar457 * fVar457;
    auVar436._4_4_ = fVar286 * fVar286 + fVar284 * fVar284 + fVar459 * fVar459;
    auVar436._8_4_ = fVar316 * fVar316 + fVar314 * fVar314 + fVar460 * fVar460;
    auVar436._12_4_ = fVar319 * fVar319 + fVar317 * fVar317 + fVar461 * fVar461;
    auVar436._16_4_ = fVar345 * fVar345 + fVar343 * fVar343 + fVar462 * fVar462;
    auVar436._20_4_ = fVar285 * fVar285 + fVar283 * fVar283 + fVar463 * fVar463;
    auVar436._24_4_ = fVar289 * fVar289 + fVar287 * fVar287 + fVar464 * fVar464;
    auVar436._28_4_ = auVar454._28_4_ + auVar454._28_4_ + fVar323;
    local_640._0_4_ =
         (float)local_820._0_4_ * fVar237 * local_420 +
         fVar260 * local_420 * (float)local_840._0_4_ + fVar128 * local_420 * (float)local_8a0._0_4_
    ;
    local_640._4_4_ =
         (float)local_820._4_4_ * fVar265 * fStack_41c +
         fVar263 * fStack_41c * (float)local_840._4_4_ +
         fVar264 * fStack_41c * (float)local_8a0._4_4_;
    fStack_638 = fStack_818 * fVar292 * fStack_418 +
                 fVar288 * fStack_418 * fStack_838 + fVar290 * fStack_418 * fStack_898;
    fStack_634 = fStack_814 * fVar311 * fStack_414 +
                 fVar318 * fStack_414 * fStack_834 + fVar320 * fStack_414 * fStack_894;
    fStack_630 = fStack_810 * fVar337 * fStack_410 +
                 fVar321 * fStack_410 * fStack_830 + fVar324 * fStack_410 * fStack_890;
    fStack_62c = fStack_80c * fVar452 * fStack_40c +
                 fVar347 * fStack_40c * fStack_82c + fVar416 * fStack_40c * fStack_88c;
    fStack_628 = fStack_808 * fVar43 * fStack_408 +
                 fVar41 * fStack_408 * fStack_828 + fVar42 * fStack_408 * fStack_888;
    fVar323 = fStack_804 + fStack_824 + fStack_884;
    fVar392 = fVar262 * fVar237 * local_420 +
              fVar260 * local_420 * fVar173 + fVar457 * fVar128 * local_420;
    fVar400 = fVar286 * fVar265 * fStack_41c +
              fVar263 * fStack_41c * fVar284 + fVar459 * fVar264 * fStack_41c;
    fVar401 = fVar316 * fVar292 * fStack_418 +
              fVar288 * fStack_418 * fVar314 + fVar460 * fVar290 * fStack_418;
    fVar402 = fVar319 * fVar311 * fStack_414 +
              fVar318 * fStack_414 * fVar317 + fVar461 * fVar320 * fStack_414;
    fVar403 = fVar345 * fVar337 * fStack_410 +
              fVar321 * fStack_410 * fVar343 + fVar462 * fVar324 * fStack_410;
    fVar404 = fVar285 * fVar452 * fStack_40c +
              fVar347 * fStack_40c * fVar283 + fVar463 * fVar416 * fStack_40c;
    fVar405 = fVar289 * fVar43 * fStack_408 +
              fVar41 * fStack_408 * fVar287 + fVar464 * fVar42 * fStack_408;
    fVar406 = fStack_824 + fVar323;
    auVar65._4_4_ = (float)local_640._4_4_ * fVar400;
    auVar65._0_4_ = (float)local_640._0_4_ * fVar392;
    auVar65._8_4_ = fStack_638 * fVar401;
    auVar65._12_4_ = fStack_634 * fVar402;
    auVar65._16_4_ = fStack_630 * fVar403;
    auVar65._20_4_ = fStack_62c * fVar404;
    auVar65._24_4_ = fStack_628 * fVar405;
    auVar65._28_4_ = fVar323;
    auVar39 = vsubps_avx(auVar422,auVar65);
    auVar66._4_4_ = fVar400 * fVar400;
    auVar66._0_4_ = fVar392 * fVar392;
    auVar66._8_4_ = fVar401 * fVar401;
    auVar66._12_4_ = fVar402 * fVar402;
    auVar66._16_4_ = fVar403 * fVar403;
    auVar66._20_4_ = fVar404 * fVar404;
    auVar66._24_4_ = fVar405 * fVar405;
    auVar66._28_4_ = fStack_824;
    auVar40 = vsubps_avx(auVar436,auVar66);
    auVar336 = ZEXT3264(auVar40);
    auVar36 = vsqrtps_avx(auVar141);
    fVar323 = (auVar36._0_4_ + auVar149._0_4_) * 1.0000002;
    fVar291 = (auVar36._4_4_ + auVar149._4_4_) * 1.0000002;
    fVar212 = (auVar36._8_4_ + auVar149._8_4_) * 1.0000002;
    fVar214 = (auVar36._12_4_ + auVar149._12_4_) * 1.0000002;
    fVar215 = (auVar36._16_4_ + auVar149._16_4_) * 1.0000002;
    fVar216 = (auVar36._20_4_ + auVar149._20_4_) * 1.0000002;
    fVar217 = (auVar36._24_4_ + auVar149._24_4_) * 1.0000002;
    auVar67._4_4_ = fVar291 * fVar291;
    auVar67._0_4_ = fVar323 * fVar323;
    auVar67._8_4_ = fVar212 * fVar212;
    auVar67._12_4_ = fVar214 * fVar214;
    auVar67._16_4_ = fVar215 * fVar215;
    auVar67._20_4_ = fVar216 * fVar216;
    auVar67._24_4_ = fVar217 * fVar217;
    auVar67._28_4_ = auVar36._28_4_ + auVar149._28_4_;
    fVar433 = auVar39._0_4_ + auVar39._0_4_;
    fVar441 = auVar39._4_4_ + auVar39._4_4_;
    local_5c0._0_8_ = CONCAT44(fVar441,fVar433);
    local_5c0._8_4_ = auVar39._8_4_ + auVar39._8_4_;
    local_5c0._12_4_ = auVar39._12_4_ + auVar39._12_4_;
    local_5c0._16_4_ = auVar39._16_4_ + auVar39._16_4_;
    local_5c0._20_4_ = auVar39._20_4_ + auVar39._20_4_;
    local_5c0._24_4_ = auVar39._24_4_ + auVar39._24_4_;
    fVar323 = auVar39._28_4_;
    local_5c0._28_4_ = fVar323 + fVar323;
    auVar149 = vsubps_avx(auVar40,auVar67);
    local_440._4_4_ = (float)local_640._4_4_ * (float)local_640._4_4_;
    local_440._0_4_ = (float)local_640._0_4_ * (float)local_640._0_4_;
    local_440._8_4_ = fStack_638 * fStack_638;
    local_440._12_4_ = fStack_634 * fStack_634;
    local_440._16_4_ = fStack_630 * fStack_630;
    local_440._20_4_ = fStack_62c * fStack_62c;
    local_440._24_4_ = fStack_628 * fStack_628;
    local_440._28_4_ = local_5a0._28_4_;
    auVar415 = ZEXT3264(local_440);
    local_680 = vsubps_avx(local_3a0,local_440);
    auVar68._4_4_ = fVar441 * fVar441;
    auVar68._0_4_ = fVar433 * fVar433;
    auVar68._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
    auVar68._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
    auVar68._16_4_ = local_5c0._16_4_ * local_5c0._16_4_;
    auVar68._20_4_ = local_5c0._20_4_ * local_5c0._20_4_;
    auVar68._24_4_ = local_5c0._24_4_ * local_5c0._24_4_;
    auVar68._28_4_ = fVar323;
    fVar291 = local_680._0_4_;
    fVar212 = local_680._4_4_;
    fVar214 = local_680._8_4_;
    fVar215 = local_680._12_4_;
    fVar216 = local_680._16_4_;
    fVar217 = local_680._20_4_;
    fVar391 = local_680._24_4_;
    auVar69._4_4_ = fVar212 * 4.0 * auVar149._4_4_;
    auVar69._0_4_ = fVar291 * 4.0 * auVar149._0_4_;
    auVar69._8_4_ = fVar214 * 4.0 * auVar149._8_4_;
    auVar69._12_4_ = fVar215 * 4.0 * auVar149._12_4_;
    auVar69._16_4_ = fVar216 * 4.0 * auVar149._16_4_;
    auVar69._20_4_ = fVar217 * 4.0 * auVar149._20_4_;
    auVar69._24_4_ = fVar391 * 4.0 * auVar149._24_4_;
    auVar69._28_4_ = 0x40800000;
    auVar39 = vsubps_avx(auVar68,auVar69);
    auVar141 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,5);
    fStack_624 = fStack_804 + fStack_824 + fStack_884;
    fVar323 = local_680._28_4_;
    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar141 >> 0x7f,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar141 >> 0xbf,0) == '\0') &&
        (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar141[0x1f])
    {
      auVar255._8_4_ = 0x7f800000;
      auVar255._0_8_ = 0x7f8000007f800000;
      auVar255._12_4_ = 0x7f800000;
      auVar255._16_4_ = 0x7f800000;
      auVar255._20_4_ = 0x7f800000;
      auVar255._24_4_ = 0x7f800000;
      auVar255._28_4_ = 0x7f800000;
      auVar455._8_4_ = 0xff800000;
      auVar455._0_8_ = 0xff800000ff800000;
      auVar455._12_4_ = 0xff800000;
      auVar455._16_4_ = 0xff800000;
      auVar455._20_4_ = 0xff800000;
      auVar455._24_4_ = 0xff800000;
      auVar455._28_4_ = 0xff800000;
    }
    else {
      auVar47 = vsqrtps_avx(auVar39);
      auVar330._0_4_ = fVar291 + fVar291;
      auVar330._4_4_ = fVar212 + fVar212;
      auVar330._8_4_ = fVar214 + fVar214;
      auVar330._12_4_ = fVar215 + fVar215;
      auVar330._16_4_ = fVar216 + fVar216;
      auVar330._20_4_ = fVar217 + fVar217;
      auVar330._24_4_ = fVar391 + fVar391;
      auVar330._28_4_ = fVar323 + fVar323;
      auVar46 = vrcpps_avx(auVar330);
      auVar333 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,5);
      fVar325 = auVar46._0_4_;
      fVar338 = auVar46._4_4_;
      auVar70._4_4_ = auVar330._4_4_ * fVar338;
      auVar70._0_4_ = auVar330._0_4_ * fVar325;
      fVar340 = auVar46._8_4_;
      auVar70._8_4_ = auVar330._8_4_ * fVar340;
      fVar342 = auVar46._12_4_;
      auVar70._12_4_ = auVar330._12_4_ * fVar342;
      fVar344 = auVar46._16_4_;
      auVar70._16_4_ = auVar330._16_4_ * fVar344;
      fVar346 = auVar46._20_4_;
      auVar70._20_4_ = auVar330._20_4_ * fVar346;
      fVar348 = auVar46._24_4_;
      auVar70._24_4_ = auVar330._24_4_ * fVar348;
      auVar70._28_4_ = auVar330._28_4_;
      auVar256._8_4_ = 0x3f800000;
      auVar256._0_8_ = &DAT_3f8000003f800000;
      auVar256._12_4_ = 0x3f800000;
      auVar256._16_4_ = 0x3f800000;
      auVar256._20_4_ = 0x3f800000;
      auVar256._24_4_ = 0x3f800000;
      auVar256._28_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar256,auVar70);
      fVar325 = fVar325 + fVar325 * auVar39._0_4_;
      fVar338 = fVar338 + fVar338 * auVar39._4_4_;
      fVar340 = fVar340 + fVar340 * auVar39._8_4_;
      fVar342 = fVar342 + fVar342 * auVar39._12_4_;
      fVar344 = fVar344 + fVar344 * auVar39._16_4_;
      fVar346 = fVar346 + fVar346 * auVar39._20_4_;
      fVar348 = fVar348 + fVar348 * auVar39._24_4_;
      auVar356._0_8_ = CONCAT44(fVar441,fVar433) ^ 0x8000000080000000;
      auVar356._8_4_ = -local_5c0._8_4_;
      auVar356._12_4_ = -local_5c0._12_4_;
      auVar356._16_4_ = -local_5c0._16_4_;
      auVar356._20_4_ = -local_5c0._20_4_;
      auVar356._24_4_ = -local_5c0._24_4_;
      auVar356._28_4_ = -local_5c0._28_4_;
      auVar142 = vsubps_avx(auVar356,auVar47);
      fVar433 = auVar142._0_4_ * fVar325;
      fVar441 = auVar142._4_4_ * fVar338;
      auVar71._4_4_ = fVar441;
      auVar71._0_4_ = fVar433;
      fVar364 = auVar142._8_4_ * fVar340;
      auVar71._8_4_ = fVar364;
      fVar366 = auVar142._12_4_ * fVar342;
      auVar71._12_4_ = fVar366;
      fVar368 = auVar142._16_4_ * fVar344;
      auVar71._16_4_ = fVar368;
      fVar370 = auVar142._20_4_ * fVar346;
      auVar71._20_4_ = fVar370;
      fVar372 = auVar142._24_4_ * fVar348;
      auVar71._24_4_ = fVar372;
      auVar71._28_4_ = auVar142._28_4_;
      auVar47 = vsubps_avx(auVar47,local_5c0);
      fVar325 = auVar47._0_4_ * fVar325;
      fVar338 = auVar47._4_4_ * fVar338;
      auVar72._4_4_ = fVar338;
      auVar72._0_4_ = fVar325;
      fVar340 = auVar47._8_4_ * fVar340;
      auVar72._8_4_ = fVar340;
      fVar342 = auVar47._12_4_ * fVar342;
      auVar72._12_4_ = fVar342;
      fVar344 = auVar47._16_4_ * fVar344;
      auVar72._16_4_ = fVar344;
      fVar346 = auVar47._20_4_ * fVar346;
      auVar72._20_4_ = fVar346;
      fVar348 = auVar47._24_4_ * fVar348;
      auVar72._24_4_ = fVar348;
      auVar72._28_4_ = auVar47._28_4_;
      fStack_4e4 = fVar406 + auVar46._28_4_ + auVar39._28_4_;
      local_500[0] = local_420 * (fVar392 + (float)local_640._0_4_ * fVar433);
      local_500[1] = fStack_41c * (fVar400 + (float)local_640._4_4_ * fVar441);
      local_500[2] = fStack_418 * (fVar401 + fStack_638 * fVar364);
      local_500[3] = fStack_414 * (fVar402 + fStack_634 * fVar366);
      fStack_4f0 = fStack_410 * (fVar403 + fStack_630 * fVar368);
      fStack_4ec = fStack_40c * (fVar404 + fStack_62c * fVar370);
      fStack_4e8 = fStack_408 * (fVar405 + fStack_628 * fVar372);
      local_520[0] = local_420 * (fVar392 + (float)local_640._0_4_ * fVar325);
      local_520[1] = fStack_41c * (fVar400 + (float)local_640._4_4_ * fVar338);
      local_520[2] = fStack_418 * (fVar401 + fStack_638 * fVar340);
      local_520[3] = fStack_414 * (fVar402 + fStack_634 * fVar342);
      fStack_510 = fStack_410 * (fVar403 + fStack_630 * fVar344);
      fStack_50c = fStack_40c * (fVar404 + fStack_62c * fVar346);
      fStack_508 = fStack_408 * (fVar405 + fStack_628 * fVar348);
      fStack_504 = fVar406 + fStack_4e4;
      auVar331._8_4_ = 0x7f800000;
      auVar331._0_8_ = 0x7f8000007f800000;
      auVar331._12_4_ = 0x7f800000;
      auVar331._16_4_ = 0x7f800000;
      auVar331._20_4_ = 0x7f800000;
      auVar331._24_4_ = 0x7f800000;
      auVar331._28_4_ = 0x7f800000;
      auVar255 = vblendvps_avx(auVar331,auVar71,auVar333);
      auVar357._8_4_ = 0x7fffffff;
      auVar357._0_8_ = 0x7fffffff7fffffff;
      auVar357._12_4_ = 0x7fffffff;
      auVar357._16_4_ = 0x7fffffff;
      auVar357._20_4_ = 0x7fffffff;
      auVar357._24_4_ = 0x7fffffff;
      auVar357._28_4_ = 0x7fffffff;
      auVar39 = vandps_avx(local_440,auVar357);
      auVar39 = vmaxps_avx(local_4e0,auVar39);
      auVar73._4_4_ = auVar39._4_4_ * 1.9073486e-06;
      auVar73._0_4_ = auVar39._0_4_ * 1.9073486e-06;
      auVar73._8_4_ = auVar39._8_4_ * 1.9073486e-06;
      auVar73._12_4_ = auVar39._12_4_ * 1.9073486e-06;
      auVar73._16_4_ = auVar39._16_4_ * 1.9073486e-06;
      auVar73._20_4_ = auVar39._20_4_ * 1.9073486e-06;
      auVar73._24_4_ = auVar39._24_4_ * 1.9073486e-06;
      auVar73._28_4_ = auVar39._28_4_;
      auVar39 = vandps_avx(local_680,auVar357);
      auVar39 = vcmpps_avx(auVar39,auVar73,1);
      auVar332._8_4_ = 0xff800000;
      auVar332._0_8_ = 0xff800000ff800000;
      auVar332._12_4_ = 0xff800000;
      auVar332._16_4_ = 0xff800000;
      auVar332._20_4_ = 0xff800000;
      auVar332._24_4_ = 0xff800000;
      auVar332._28_4_ = 0xff800000;
      auVar336 = ZEXT3264(auVar332);
      auVar455 = vblendvps_avx(auVar332,auVar72,auVar333);
      auVar46 = auVar333 & auVar39;
      if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar46 >> 0x7f,0) != '\0') ||
            (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar46 >> 0xbf,0) != '\0') ||
          (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar46[0x1f] < '\0') {
        auVar141 = vandps_avx(auVar39,auVar333);
        auVar177 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
        auVar39 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,2);
        auVar381._8_4_ = 0xff800000;
        auVar381._0_8_ = 0xff800000ff800000;
        auVar381._12_4_ = 0xff800000;
        auVar381._16_4_ = 0xff800000;
        auVar381._20_4_ = 0xff800000;
        auVar381._24_4_ = 0xff800000;
        auVar381._28_4_ = 0xff800000;
        auVar437._8_4_ = 0x7f800000;
        auVar437._0_8_ = 0x7f8000007f800000;
        auVar437._12_4_ = 0x7f800000;
        auVar437._16_4_ = 0x7f800000;
        auVar437._20_4_ = 0x7f800000;
        auVar437._24_4_ = 0x7f800000;
        auVar437._28_4_ = 0x7f800000;
        auVar149 = vblendvps_avx(auVar437,auVar381,auVar39);
        auVar245 = vpmovsxwd_avx(auVar177);
        auVar177 = vpunpckhwd_avx(auVar177,auVar177);
        auVar309._16_16_ = auVar177;
        auVar309._0_16_ = auVar245;
        auVar255 = vblendvps_avx(auVar255,auVar149,auVar309);
        auVar149 = vblendvps_avx(auVar381,auVar437,auVar39);
        auVar336 = ZEXT3264(auVar149);
        auVar455 = vblendvps_avx(auVar455,auVar149,auVar309);
        auVar149 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar235._0_4_ = auVar141._0_4_ ^ auVar149._0_4_;
        auVar235._4_4_ = auVar141._4_4_ ^ auVar149._4_4_;
        auVar235._8_4_ = auVar141._8_4_ ^ auVar149._8_4_;
        auVar235._12_4_ = auVar141._12_4_ ^ auVar149._12_4_;
        auVar235._16_4_ = auVar141._16_4_ ^ auVar149._16_4_;
        auVar235._20_4_ = auVar141._20_4_ ^ auVar149._20_4_;
        auVar235._24_4_ = auVar141._24_4_ ^ auVar149._24_4_;
        auVar235._28_4_ = auVar141._28_4_ ^ auVar149._28_4_;
        auVar141 = vorps_avx(auVar39,auVar235);
        auVar141 = vandps_avx(auVar333,auVar141);
      }
    }
    auVar149 = local_3c0 & auVar141;
    if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar149 >> 0x7f,0) == '\0') &&
          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar149 >> 0xbf,0) == '\0') &&
        (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar149[0x1f])
    {
      auVar277._8_4_ = 0x3f800000;
      auVar277._0_8_ = &DAT_3f8000003f800000;
      auVar277._12_4_ = 0x3f800000;
      auVar277._16_4_ = 0x3f800000;
      auVar277._20_4_ = 0x3f800000;
      auVar277._24_4_ = 0x3f800000;
      auVar277._28_4_ = 0x3f800000;
      auVar361 = ZEXT1664((undefined1  [16])0x0);
    }
    else {
      auVar177 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_920._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_920._0_4_)),0);
      auVar195._16_16_ = auVar177;
      auVar195._0_16_ = auVar177;
      local_660 = vminps_avx(auVar195,auVar455);
      auVar147._0_4_ =
           (float)local_820._0_4_ * fVar349 +
           (float)local_840._0_4_ * fVar417 + fVar431 * (float)local_8a0._0_4_;
      auVar147._4_4_ =
           (float)local_820._4_4_ * fVar362 +
           (float)local_840._4_4_ * fVar424 + fVar439 * (float)local_8a0._4_4_;
      auVar147._8_4_ = fStack_818 * fVar363 + fStack_838 * fVar425 + fVar442 * fStack_898;
      auVar147._12_4_ = fStack_814 * fVar365 + fStack_834 * fVar426 + fVar444 * fStack_894;
      auVar147._16_4_ = fStack_810 * fVar367 + fStack_830 * fVar427 + fVar446 * fStack_890;
      auVar147._20_4_ = fStack_80c * fVar369 + fStack_82c * fVar428 + fVar448 * fStack_88c;
      auVar147._24_4_ = fStack_808 * fVar371 + fStack_828 * fVar429 + fVar450 * fStack_888;
      auVar147._28_4_ = auVar355._28_4_ + auVar438._28_4_ + 1.0;
      auVar149 = vrcpps_avx(auVar147);
      fVar433 = auVar149._0_4_;
      fVar441 = auVar149._4_4_;
      auVar74._4_4_ = auVar147._4_4_ * fVar441;
      auVar74._0_4_ = auVar147._0_4_ * fVar433;
      fVar325 = auVar149._8_4_;
      auVar74._8_4_ = auVar147._8_4_ * fVar325;
      fVar338 = auVar149._12_4_;
      auVar74._12_4_ = auVar147._12_4_ * fVar338;
      fVar340 = auVar149._16_4_;
      auVar74._16_4_ = auVar147._16_4_ * fVar340;
      fVar342 = auVar149._20_4_;
      auVar74._20_4_ = auVar147._20_4_ * fVar342;
      fVar344 = auVar149._24_4_;
      auVar74._24_4_ = auVar147._24_4_ * fVar344;
      auVar74._28_4_ = 0x3f800000;
      auVar399._8_4_ = 0x3f800000;
      auVar399._0_8_ = &DAT_3f8000003f800000;
      auVar399._12_4_ = 0x3f800000;
      auVar399._16_4_ = 0x3f800000;
      auVar399._20_4_ = 0x3f800000;
      auVar399._24_4_ = 0x3f800000;
      auVar399._28_4_ = 0x3f800000;
      auVar333 = vsubps_avx(auVar399,auVar74);
      auVar358._8_4_ = 0x7fffffff;
      auVar358._0_8_ = 0x7fffffff7fffffff;
      auVar358._12_4_ = 0x7fffffff;
      auVar358._16_4_ = 0x7fffffff;
      auVar358._20_4_ = 0x7fffffff;
      auVar358._24_4_ = 0x7fffffff;
      auVar358._28_4_ = 0x7fffffff;
      auVar149 = vandps_avx(auVar147,auVar358);
      auVar389._8_4_ = 0x219392ef;
      auVar389._0_8_ = 0x219392ef219392ef;
      auVar389._12_4_ = 0x219392ef;
      auVar389._16_4_ = 0x219392ef;
      auVar389._20_4_ = 0x219392ef;
      auVar389._24_4_ = 0x219392ef;
      auVar389._28_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar149,auVar389,1);
      auVar75._4_4_ =
           (fVar441 + fVar441 * auVar333._4_4_) *
           -(fVar286 * fVar362 + fVar424 * fVar284 + fVar459 * fVar439);
      auVar75._0_4_ =
           (fVar433 + fVar433 * auVar333._0_4_) *
           -(fVar262 * fVar349 + fVar417 * fVar173 + fVar457 * fVar431);
      auVar75._8_4_ =
           (fVar325 + fVar325 * auVar333._8_4_) *
           -(fVar316 * fVar363 + fVar425 * fVar314 + fVar460 * fVar442);
      auVar75._12_4_ =
           (fVar338 + fVar338 * auVar333._12_4_) *
           -(fVar319 * fVar365 + fVar426 * fVar317 + fVar461 * fVar444);
      auVar75._16_4_ =
           (fVar340 + fVar340 * auVar333._16_4_) *
           -(fVar345 * fVar367 + fVar427 * fVar343 + fVar462 * fVar446);
      auVar75._20_4_ =
           (fVar342 + fVar342 * auVar333._20_4_) *
           -(fVar285 * fVar369 + fVar428 * fVar283 + fVar463 * fVar448);
      auVar75._24_4_ =
           (fVar344 + fVar344 * auVar333._24_4_) *
           -(fVar289 * fVar371 + fVar429 * fVar287 + fVar464 * fVar450);
      auVar75._28_4_ = -(auVar438._28_4_ + auVar255._28_4_ + 1.0);
      auVar149 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,1);
      auVar149 = vorps_avx(auVar39,auVar149);
      auVar414._8_4_ = 0xff800000;
      auVar414._0_8_ = 0xff800000ff800000;
      auVar414._12_4_ = 0xff800000;
      auVar414._16_4_ = 0xff800000;
      auVar414._20_4_ = 0xff800000;
      auVar414._24_4_ = 0xff800000;
      auVar414._28_4_ = 0xff800000;
      auVar415 = ZEXT3264(auVar414);
      auVar149 = vblendvps_avx(auVar75,auVar414,auVar149);
      auVar438 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,6);
      auVar438 = vorps_avx(auVar39,auVar438);
      auVar423._8_4_ = 0x7f800000;
      auVar423._0_8_ = 0x7f8000007f800000;
      auVar423._12_4_ = 0x7f800000;
      auVar423._16_4_ = 0x7f800000;
      auVar423._20_4_ = 0x7f800000;
      auVar423._24_4_ = 0x7f800000;
      auVar423._28_4_ = 0x7f800000;
      auVar438 = vblendvps_avx(auVar75,auVar423,auVar438);
      auVar39 = vmaxps_avx(local_3e0,auVar255);
      auVar39 = vmaxps_avx(auVar39,auVar149);
      auVar438 = vminps_avx(local_660,auVar438);
      auVar333 = ZEXT832(0) << 0x20;
      auVar149 = vsubps_avx(auVar333,auVar37);
      auVar37 = vsubps_avx(auVar333,local_a40);
      auVar76._4_4_ = auVar37._4_4_ * -fVar440;
      auVar76._0_4_ = auVar37._0_4_ * -fVar432;
      auVar76._8_4_ = auVar37._8_4_ * -fVar443;
      auVar76._12_4_ = auVar37._12_4_ * -fVar445;
      auVar76._16_4_ = auVar37._16_4_ * -fVar447;
      auVar76._20_4_ = auVar37._20_4_ * -fVar449;
      auVar76._24_4_ = auVar37._24_4_ * -fVar451;
      auVar76._28_4_ = auVar37._28_4_;
      auVar77._4_4_ = fVar281 * auVar149._4_4_;
      auVar77._0_4_ = fVar129 * auVar149._0_4_;
      auVar77._8_4_ = fVar310 * auVar149._8_4_;
      auVar77._12_4_ = fVar313 * auVar149._12_4_;
      auVar77._16_4_ = fVar339 * auVar149._16_4_;
      auVar77._20_4_ = fVar322 * auVar149._20_4_;
      auVar77._24_4_ = fVar44 * auVar149._24_4_;
      auVar77._28_4_ = auVar149._28_4_;
      auVar149 = vsubps_avx(auVar76,auVar77);
      auVar37 = vsubps_avx(auVar333,auVar38);
      auVar78._4_4_ = fVar282 * auVar37._4_4_;
      auVar78._0_4_ = fVar261 * auVar37._0_4_;
      auVar78._8_4_ = fVar312 * auVar37._8_4_;
      auVar78._12_4_ = fVar315 * auVar37._12_4_;
      auVar78._16_4_ = fVar341 * auVar37._16_4_;
      auVar78._20_4_ = fVar430 * auVar37._20_4_;
      uVar8 = auVar37._28_4_;
      auVar78._24_4_ = fVar45 * auVar37._24_4_;
      auVar78._28_4_ = uVar8;
      auVar333 = vsubps_avx(auVar149,auVar78);
      auVar79._4_4_ = -fVar440 * (float)local_8a0._4_4_;
      auVar79._0_4_ = -fVar432 * (float)local_8a0._0_4_;
      auVar79._8_4_ = -fVar443 * fStack_898;
      auVar79._12_4_ = -fVar445 * fStack_894;
      auVar79._16_4_ = -fVar447 * fStack_890;
      auVar79._20_4_ = -fVar449 * fStack_88c;
      auVar79._24_4_ = -fVar451 * fStack_888;
      auVar79._28_4_ = uVar34 ^ 0x80000000;
      auVar80._4_4_ = (float)local_840._4_4_ * fVar281;
      auVar80._0_4_ = (float)local_840._0_4_ * fVar129;
      auVar80._8_4_ = fStack_838 * fVar310;
      auVar80._12_4_ = fStack_834 * fVar313;
      auVar80._16_4_ = fStack_830 * fVar339;
      auVar80._20_4_ = fStack_82c * fVar322;
      auVar80._24_4_ = fStack_828 * fVar44;
      auVar80._28_4_ = uVar8;
      auVar277._8_4_ = 0x3f800000;
      auVar277._0_8_ = &DAT_3f8000003f800000;
      auVar277._12_4_ = 0x3f800000;
      auVar277._16_4_ = 0x3f800000;
      auVar277._20_4_ = 0x3f800000;
      auVar277._24_4_ = 0x3f800000;
      auVar277._28_4_ = 0x3f800000;
      auVar149 = vsubps_avx(auVar79,auVar80);
      auVar81._4_4_ = (float)local_820._4_4_ * fVar282;
      auVar81._0_4_ = (float)local_820._0_4_ * fVar261;
      auVar81._8_4_ = fStack_818 * fVar312;
      auVar81._12_4_ = fStack_814 * fVar315;
      auVar81._16_4_ = fStack_810 * fVar341;
      auVar81._20_4_ = fStack_80c * fVar430;
      auVar81._24_4_ = fStack_808 * fVar45;
      auVar81._28_4_ = uVar8;
      auVar46 = vsubps_avx(auVar149,auVar81);
      auVar149 = vrcpps_avx(auVar46);
      fVar129 = auVar149._0_4_;
      fVar261 = auVar149._4_4_;
      auVar82._4_4_ = auVar46._4_4_ * fVar261;
      auVar82._0_4_ = auVar46._0_4_ * fVar129;
      fVar173 = auVar149._8_4_;
      auVar82._8_4_ = auVar46._8_4_ * fVar173;
      fVar262 = auVar149._12_4_;
      auVar82._12_4_ = auVar46._12_4_ * fVar262;
      fVar281 = auVar149._16_4_;
      auVar82._16_4_ = auVar46._16_4_ * fVar281;
      fVar282 = auVar149._20_4_;
      auVar82._20_4_ = auVar46._20_4_ * fVar282;
      fVar284 = auVar149._24_4_;
      auVar82._24_4_ = auVar46._24_4_ * fVar284;
      auVar82._28_4_ = local_b00._28_4_;
      auVar47 = vsubps_avx(auVar277,auVar82);
      auVar149 = vandps_avx(auVar46,auVar358);
      auVar37 = vcmpps_avx(auVar149,auVar389,1);
      auVar336 = ZEXT3264(auVar37);
      auVar83._4_4_ = (fVar261 + fVar261 * auVar47._4_4_) * -auVar333._4_4_;
      auVar83._0_4_ = (fVar129 + fVar129 * auVar47._0_4_) * -auVar333._0_4_;
      auVar83._8_4_ = (fVar173 + fVar173 * auVar47._8_4_) * -auVar333._8_4_;
      auVar83._12_4_ = (fVar262 + fVar262 * auVar47._12_4_) * -auVar333._12_4_;
      auVar83._16_4_ = (fVar281 + fVar281 * auVar47._16_4_) * -auVar333._16_4_;
      auVar83._20_4_ = (fVar282 + fVar282 * auVar47._20_4_) * -auVar333._20_4_;
      auVar83._24_4_ = (fVar284 + fVar284 * auVar47._24_4_) * -auVar333._24_4_;
      auVar83._28_4_ = auVar333._28_4_ ^ 0x80000000;
      auVar333 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar149 = vcmpps_avx(auVar46,auVar333,1);
      auVar149 = vorps_avx(auVar37,auVar149);
      auVar149 = vblendvps_avx(auVar83,auVar414,auVar149);
      local_660 = vmaxps_avx(auVar39,auVar149);
      auVar149 = vcmpps_avx(auVar46,auVar333,6);
      auVar149 = vorps_avx(auVar37,auVar149);
      auVar149 = vblendvps_avx(auVar83,auVar423,auVar149);
      auVar141 = vandps_avx(local_3c0,auVar141);
      local_460 = vminps_avx(auVar438,auVar149);
      auVar149 = vcmpps_avx(local_660,local_460,2);
      auVar37 = auVar141 & auVar149;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0x7f,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0xbf,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar37[0x1f] < '\0') {
        auVar37 = vminps_avx(local_7a0,local_620);
        auVar438 = vminps_avx(local_7c0,local_800);
        auVar37 = vminps_avx(auVar37,auVar438);
        auVar36 = vsubps_avx(auVar37,auVar36);
        auVar141 = vandps_avx(auVar149,auVar141);
        auVar115._4_4_ = local_500[1];
        auVar115._0_4_ = local_500[0];
        auVar115._8_4_ = local_500[2];
        auVar115._12_4_ = local_500[3];
        auVar115._16_4_ = fStack_4f0;
        auVar115._20_4_ = fStack_4ec;
        auVar115._24_4_ = fStack_4e8;
        auVar115._28_4_ = fStack_4e4;
        auVar149 = vminps_avx(auVar115,auVar277);
        auVar149 = vmaxps_avx(auVar149,ZEXT832(0) << 0x20);
        local_500[0] = fVar125 + fVar172 * (auVar149._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar155 + fVar210 * (auVar149._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar158 + fVar211 * (auVar149._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar161 + fVar213 * (auVar149._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar125 + fVar172 * (auVar149._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar155 + fVar210 * (auVar149._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar158 + fVar211 * (auVar149._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar161 + auVar149._28_4_ + 7.0;
        auVar114._4_4_ = local_520[1];
        auVar114._0_4_ = local_520[0];
        auVar114._8_4_ = local_520[2];
        auVar114._12_4_ = local_520[3];
        auVar114._16_4_ = fStack_510;
        auVar114._20_4_ = fStack_50c;
        auVar114._24_4_ = fStack_508;
        auVar114._28_4_ = fStack_504;
        auVar149 = vminps_avx(auVar114,auVar277);
        auVar149 = vmaxps_avx(auVar149,ZEXT832(0) << 0x20);
        local_520[0] = fVar125 + fVar172 * (auVar149._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar155 + fVar210 * (auVar149._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar158 + fVar211 * (auVar149._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar161 + fVar213 * (auVar149._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar125 + fVar172 * (auVar149._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar155 + fVar210 * (auVar149._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar158 + fVar211 * (auVar149._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar161 + auVar149._28_4_ + 7.0;
        auVar84._4_4_ = auVar36._4_4_ * 0.99999976;
        auVar84._0_4_ = auVar36._0_4_ * 0.99999976;
        auVar84._8_4_ = auVar36._8_4_ * 0.99999976;
        auVar84._12_4_ = auVar36._12_4_ * 0.99999976;
        auVar84._16_4_ = auVar36._16_4_ * 0.99999976;
        auVar84._20_4_ = auVar36._20_4_ * 0.99999976;
        auVar84._24_4_ = auVar36._24_4_ * 0.99999976;
        auVar84._28_4_ = 0x3f7ffffc;
        auVar149 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar84);
        auVar85._4_4_ = auVar149._4_4_ * auVar149._4_4_;
        auVar85._0_4_ = auVar149._0_4_ * auVar149._0_4_;
        auVar85._8_4_ = auVar149._8_4_ * auVar149._8_4_;
        auVar85._12_4_ = auVar149._12_4_ * auVar149._12_4_;
        auVar85._16_4_ = auVar149._16_4_ * auVar149._16_4_;
        auVar85._20_4_ = auVar149._20_4_ * auVar149._20_4_;
        auVar85._24_4_ = auVar149._24_4_ * auVar149._24_4_;
        auVar85._28_4_ = auVar149._28_4_;
        local_ae0 = vsubps_avx(auVar40,auVar85);
        auVar86._4_4_ = local_ae0._4_4_ * fVar212 * 4.0;
        auVar86._0_4_ = local_ae0._0_4_ * fVar291 * 4.0;
        auVar86._8_4_ = local_ae0._8_4_ * fVar214 * 4.0;
        auVar86._12_4_ = local_ae0._12_4_ * fVar215 * 4.0;
        auVar86._16_4_ = local_ae0._16_4_ * fVar216 * 4.0;
        auVar86._20_4_ = local_ae0._20_4_ * fVar217 * 4.0;
        auVar86._24_4_ = local_ae0._24_4_ * fVar391 * 4.0;
        auVar86._28_4_ = auVar149._28_4_;
        auVar36 = vsubps_avx(auVar68,auVar86);
        local_960 = vcmpps_avx(auVar36,ZEXT832(0) << 0x20,5);
        auVar149 = local_960;
        if ((((((((local_960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_960 >> 0x7f,0) == '\0') &&
              (local_960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_960 >> 0xbf,0) == '\0') &&
            (local_960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_960[0x1f]) {
          _local_8e0 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_900 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar249 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar276 = ZEXT828(0) << 0x20;
          auVar383 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar196._8_4_ = 0x7f800000;
          auVar196._0_8_ = 0x7f8000007f800000;
          auVar196._12_4_ = 0x7f800000;
          auVar196._16_4_ = 0x7f800000;
          auVar196._20_4_ = 0x7f800000;
          auVar196._24_4_ = 0x7f800000;
          auVar196._28_4_ = 0x7f800000;
          auVar303._8_4_ = 0xff800000;
          auVar303._0_8_ = 0xff800000ff800000;
          auVar303._12_4_ = 0xff800000;
          auVar303._16_4_ = 0xff800000;
          auVar303._20_4_ = 0xff800000;
          auVar303._24_4_ = 0xff800000;
          auVar303._28_4_ = 0xff800000;
          local_ae0 = auVar38;
          local_960 = auVar48;
          _local_8c0 = _local_8e0;
        }
        else {
          auVar38 = vsqrtps_avx(auVar36);
          auVar197._0_4_ = fVar291 + fVar291;
          auVar197._4_4_ = fVar212 + fVar212;
          auVar197._8_4_ = fVar214 + fVar214;
          auVar197._12_4_ = fVar215 + fVar215;
          auVar197._16_4_ = fVar216 + fVar216;
          auVar197._20_4_ = fVar217 + fVar217;
          auVar197._24_4_ = fVar391 + fVar391;
          auVar197._28_4_ = fVar323 + fVar323;
          auVar37 = vrcpps_avx(auVar197);
          fVar323 = auVar37._0_4_;
          fVar129 = auVar37._4_4_;
          auVar87._4_4_ = auVar197._4_4_ * fVar129;
          auVar87._0_4_ = auVar197._0_4_ * fVar323;
          fVar261 = auVar37._8_4_;
          auVar87._8_4_ = auVar197._8_4_ * fVar261;
          fVar173 = auVar37._12_4_;
          auVar87._12_4_ = auVar197._12_4_ * fVar173;
          fVar262 = auVar37._16_4_;
          auVar87._16_4_ = auVar197._16_4_ * fVar262;
          fVar281 = auVar37._20_4_;
          auVar87._20_4_ = auVar197._20_4_ * fVar281;
          fVar282 = auVar37._24_4_;
          auVar87._24_4_ = auVar197._24_4_ * fVar282;
          auVar87._28_4_ = auVar197._28_4_;
          auVar438 = vsubps_avx(auVar277,auVar87);
          fVar323 = fVar323 + fVar323 * auVar438._0_4_;
          fVar129 = fVar129 + fVar129 * auVar438._4_4_;
          fVar261 = fVar261 + fVar261 * auVar438._8_4_;
          fVar173 = fVar173 + fVar173 * auVar438._12_4_;
          fVar262 = fVar262 + fVar262 * auVar438._16_4_;
          fVar281 = fVar281 + fVar281 * auVar438._20_4_;
          fVar282 = fVar282 + fVar282 * auVar438._24_4_;
          fVar315 = auVar37._28_4_ + auVar438._28_4_;
          auVar198._0_8_ = local_5c0._0_8_ ^ 0x8000000080000000;
          auVar198._8_4_ = -local_5c0._8_4_;
          auVar198._12_4_ = -local_5c0._12_4_;
          auVar198._16_4_ = -local_5c0._16_4_;
          auVar198._20_4_ = -local_5c0._20_4_;
          auVar198._24_4_ = -local_5c0._24_4_;
          auVar198._28_4_ = -local_5c0._28_4_;
          auVar37 = vsubps_avx(auVar198,auVar38);
          fVar284 = auVar37._0_4_ * fVar323;
          fVar286 = auVar37._4_4_ * fVar129;
          auVar88._4_4_ = fVar286;
          auVar88._0_4_ = fVar284;
          fVar310 = auVar37._8_4_ * fVar261;
          auVar88._8_4_ = fVar310;
          fVar312 = auVar37._12_4_ * fVar173;
          auVar88._12_4_ = fVar312;
          fVar314 = auVar37._16_4_ * fVar262;
          auVar88._16_4_ = fVar314;
          fVar316 = auVar37._20_4_ * fVar281;
          auVar88._20_4_ = fVar316;
          fVar313 = auVar37._24_4_ * fVar282;
          auVar88._24_4_ = fVar313;
          auVar88._28_4_ = auVar37._28_4_;
          auVar37 = vsubps_avx(auVar38,local_5c0);
          fVar323 = auVar37._0_4_ * fVar323;
          fVar129 = auVar37._4_4_ * fVar129;
          auVar89._4_4_ = fVar129;
          auVar89._0_4_ = fVar323;
          fVar261 = auVar37._8_4_ * fVar261;
          auVar89._8_4_ = fVar261;
          fVar173 = auVar37._12_4_ * fVar173;
          auVar89._12_4_ = fVar173;
          fVar262 = auVar37._16_4_ * fVar262;
          auVar89._16_4_ = fVar262;
          fVar281 = auVar37._20_4_ * fVar281;
          auVar89._20_4_ = fVar281;
          fVar282 = auVar37._24_4_ * fVar282;
          auVar89._24_4_ = fVar282;
          auVar89._28_4_ = 0x80000000;
          auVar35._4_4_ = fStack_41c;
          auVar35._0_4_ = local_420;
          auVar35._8_4_ = fStack_418;
          auVar35._12_4_ = fStack_414;
          auVar35._16_4_ = fStack_410;
          auVar35._20_4_ = fStack_40c;
          auVar35._24_4_ = fStack_408;
          auVar35._28_4_ = fStack_404;
          fVar317 = local_420 * (fVar284 * (float)local_640._0_4_ + fVar392);
          fVar319 = fStack_41c * (fVar286 * (float)local_640._4_4_ + fVar400);
          fVar339 = fStack_418 * (fVar310 * fStack_638 + fVar401);
          fVar341 = fStack_414 * (fVar312 * fStack_634 + fVar402);
          fVar343 = fStack_410 * (fVar314 * fStack_630 + fVar403);
          fVar345 = fStack_40c * (fVar316 * fStack_62c + fVar404);
          fVar322 = fStack_408 * (fVar313 * fStack_628 + fVar405);
          auVar257._0_4_ = fVar126 + fVar237 * fVar317;
          auVar257._4_4_ = fVar156 + fVar265 * fVar319;
          auVar257._8_4_ = fVar159 + fVar292 * fVar339;
          auVar257._12_4_ = fVar162 + fVar311 * fVar341;
          auVar257._16_4_ = fVar164 + fVar337 * fVar343;
          auVar257._20_4_ = fVar166 + fVar452 * fVar345;
          auVar257._24_4_ = fVar168 + fVar43 * fVar322;
          auVar257._28_4_ = fVar170 + auVar37._28_4_ + fVar406;
          auVar90._4_4_ = (float)local_820._4_4_ * fVar286;
          auVar90._0_4_ = (float)local_820._0_4_ * fVar284;
          auVar90._8_4_ = fStack_818 * fVar310;
          auVar90._12_4_ = fStack_814 * fVar312;
          auVar90._16_4_ = fStack_810 * fVar314;
          auVar90._20_4_ = fStack_80c * fVar316;
          auVar90._24_4_ = fStack_808 * fVar313;
          auVar90._28_4_ = fVar315;
          local_a40 = vsubps_avx(auVar90,auVar257);
          auVar279._0_4_ = fVar127 + fVar260 * fVar317;
          auVar279._4_4_ = fVar157 + fVar263 * fVar319;
          auVar279._8_4_ = fVar160 + fVar288 * fVar339;
          auVar279._12_4_ = fVar163 + fVar318 * fVar341;
          auVar279._16_4_ = fVar165 + fVar321 * fVar343;
          auVar279._20_4_ = fVar167 + fVar347 * fVar345;
          auVar279._24_4_ = fVar169 + fVar41 * fVar322;
          auVar279._28_4_ = fVar171 + fVar315;
          auVar91._4_4_ = (float)local_840._4_4_ * fVar286;
          auVar91._0_4_ = (float)local_840._0_4_ * fVar284;
          auVar91._8_4_ = fStack_838 * fVar310;
          auVar91._12_4_ = fStack_834 * fVar312;
          auVar91._16_4_ = fStack_830 * fVar314;
          auVar91._20_4_ = fStack_82c * fVar316;
          auVar91._24_4_ = fStack_828 * fVar313;
          auVar91._28_4_ = fVar161;
          _local_a00 = vsubps_avx(auVar91,auVar279);
          auVar304._0_4_ = local_540._0_4_ + fVar128 * fVar317;
          auVar304._4_4_ = local_540._4_4_ + fVar264 * fVar319;
          auVar304._8_4_ = local_540._8_4_ + fVar290 * fVar339;
          auVar304._12_4_ = local_540._12_4_ + fVar320 * fVar341;
          auVar304._16_4_ = local_540._16_4_ + fVar324 * fVar343;
          auVar304._20_4_ = local_540._20_4_ + fVar416 * fVar345;
          auVar304._24_4_ = local_540._24_4_ + fVar42 * fVar322;
          auVar304._28_4_ = local_540._28_4_ + 0.0;
          auVar92._4_4_ = (float)local_8a0._4_4_ * fVar286;
          auVar92._0_4_ = (float)local_8a0._0_4_ * fVar284;
          auVar92._8_4_ = fStack_898 * fVar310;
          auVar92._12_4_ = fStack_894 * fVar312;
          auVar92._16_4_ = fStack_890 * fVar314;
          auVar92._20_4_ = fStack_88c * fVar316;
          auVar92._24_4_ = fStack_888 * fVar313;
          auVar92._28_4_ = fVar161;
          local_b20 = vsubps_avx(auVar92,auVar304);
          fVar284 = local_420 * (fVar323 * (float)local_640._0_4_ + fVar392);
          fVar286 = fStack_41c * (fVar129 * (float)local_640._4_4_ + fVar400);
          fVar310 = fStack_418 * (fVar261 * fStack_638 + fVar401);
          fVar312 = fStack_414 * (fVar173 * fStack_634 + fVar402);
          fVar314 = fStack_410 * (fVar262 * fStack_630 + fVar403);
          fVar316 = fStack_40c * (fVar281 * fStack_62c + fVar404);
          fVar313 = fStack_408 * (fVar282 * fStack_628 + fVar405);
          auVar334._0_4_ = fVar126 + fVar237 * fVar284;
          auVar334._4_4_ = fVar156 + fVar265 * fVar286;
          auVar334._8_4_ = fVar159 + fVar292 * fVar310;
          auVar334._12_4_ = fVar162 + fVar311 * fVar312;
          auVar334._16_4_ = fVar164 + fVar337 * fVar314;
          auVar334._20_4_ = fVar166 + fVar452 * fVar316;
          auVar334._24_4_ = fVar168 + fVar43 * fVar313;
          auVar334._28_4_ = fVar170 + fVar161;
          auVar93._4_4_ = fVar129 * (float)local_820._4_4_;
          auVar93._0_4_ = fVar323 * (float)local_820._0_4_;
          auVar93._8_4_ = fVar261 * fStack_818;
          auVar93._12_4_ = fVar173 * fStack_814;
          auVar93._16_4_ = fVar262 * fStack_810;
          auVar93._20_4_ = fVar281 * fStack_80c;
          auVar93._24_4_ = fVar282 * fStack_808;
          auVar93._28_4_ = fStack_804;
          _local_8c0 = vsubps_avx(auVar93,auVar334);
          auVar335._0_4_ = fVar127 + fVar260 * fVar284;
          auVar335._4_4_ = fVar157 + fVar263 * fVar286;
          auVar335._8_4_ = fVar160 + fVar288 * fVar310;
          auVar335._12_4_ = fVar163 + fVar318 * fVar312;
          auVar335._16_4_ = fVar165 + fVar321 * fVar314;
          auVar335._20_4_ = fVar167 + fVar347 * fVar316;
          auVar335._24_4_ = fVar169 + fVar41 * fVar313;
          auVar335._28_4_ = fVar171 + local_8c0._28_4_;
          auVar94._4_4_ = (float)local_840._4_4_ * fVar129;
          auVar94._0_4_ = (float)local_840._0_4_ * fVar323;
          auVar94._8_4_ = fStack_838 * fVar261;
          auVar94._12_4_ = fStack_834 * fVar173;
          auVar94._16_4_ = fStack_830 * fVar262;
          auVar94._20_4_ = fStack_82c * fVar281;
          auVar94._24_4_ = fStack_828 * fVar282;
          auVar94._28_4_ = fStack_804;
          _local_8e0 = vsubps_avx(auVar94,auVar335);
          auVar305._0_4_ = local_540._0_4_ + fVar128 * fVar284;
          auVar305._4_4_ = local_540._4_4_ + fVar264 * fVar286;
          auVar305._8_4_ = local_540._8_4_ + fVar290 * fVar310;
          auVar305._12_4_ = local_540._12_4_ + fVar320 * fVar312;
          auVar305._16_4_ = local_540._16_4_ + fVar324 * fVar314;
          auVar305._20_4_ = local_540._20_4_ + fVar416 * fVar316;
          auVar305._24_4_ = local_540._24_4_ + fVar42 * fVar313;
          auVar305._28_4_ = local_540._28_4_ + local_b20._28_4_ + fVar406;
          auVar95._4_4_ = (float)local_8a0._4_4_ * fVar129;
          auVar95._0_4_ = (float)local_8a0._0_4_ * fVar323;
          auVar95._8_4_ = fStack_898 * fVar261;
          auVar95._12_4_ = fStack_894 * fVar173;
          auVar95._16_4_ = fStack_890 * fVar262;
          auVar95._20_4_ = fStack_88c * fVar281;
          auVar95._24_4_ = fStack_888 * fVar282;
          auVar95._28_4_ = local_8e0._28_4_;
          _local_900 = vsubps_avx(auVar95,auVar305);
          auVar37 = vcmpps_avx(auVar36,_DAT_02020f00,5);
          auVar306._8_4_ = 0x7f800000;
          auVar306._0_8_ = 0x7f8000007f800000;
          auVar306._12_4_ = 0x7f800000;
          auVar306._16_4_ = 0x7f800000;
          auVar306._20_4_ = 0x7f800000;
          auVar306._24_4_ = 0x7f800000;
          auVar306._28_4_ = 0x7f800000;
          auVar196 = vblendvps_avx(auVar306,auVar88,auVar37);
          auVar359._8_4_ = 0x7fffffff;
          auVar359._0_8_ = 0x7fffffff7fffffff;
          auVar359._12_4_ = 0x7fffffff;
          auVar359._16_4_ = 0x7fffffff;
          auVar359._20_4_ = 0x7fffffff;
          auVar359._24_4_ = 0x7fffffff;
          auVar359._28_4_ = 0x7fffffff;
          auVar36 = vandps_avx(auVar359,local_440);
          auVar36 = vmaxps_avx(local_4e0,auVar36);
          auVar96._4_4_ = auVar36._4_4_ * 1.9073486e-06;
          auVar96._0_4_ = auVar36._0_4_ * 1.9073486e-06;
          auVar96._8_4_ = auVar36._8_4_ * 1.9073486e-06;
          auVar96._12_4_ = auVar36._12_4_ * 1.9073486e-06;
          auVar96._16_4_ = auVar36._16_4_ * 1.9073486e-06;
          auVar96._20_4_ = auVar36._20_4_ * 1.9073486e-06;
          auVar96._24_4_ = auVar36._24_4_ * 1.9073486e-06;
          auVar96._28_4_ = auVar36._28_4_;
          auVar36 = vandps_avx(auVar359,local_680);
          auVar36 = vcmpps_avx(auVar36,auVar96,1);
          auVar307._8_4_ = 0xff800000;
          auVar307._0_8_ = 0xff800000ff800000;
          auVar307._12_4_ = 0xff800000;
          auVar307._16_4_ = 0xff800000;
          auVar307._20_4_ = 0xff800000;
          auVar307._24_4_ = 0xff800000;
          auVar307._28_4_ = 0xff800000;
          auVar303 = vblendvps_avx(auVar307,auVar89,auVar37);
          auVar38 = auVar37 & auVar36;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0x7f,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0xbf,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar38[0x1f] < '\0') {
            auVar149 = vandps_avx(auVar36,auVar37);
            auVar177 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
            auVar438 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar38 = vcmpps_avx(local_ae0,auVar438,2);
            auVar456._8_4_ = 0xff800000;
            auVar456._0_8_ = 0xff800000ff800000;
            auVar456._12_4_ = 0xff800000;
            auVar456._16_4_ = 0xff800000;
            auVar456._20_4_ = 0xff800000;
            auVar456._24_4_ = 0xff800000;
            auVar456._28_4_ = 0xff800000;
            auVar458._8_4_ = 0x7f800000;
            auVar458._0_8_ = 0x7f8000007f800000;
            auVar458._12_4_ = 0x7f800000;
            auVar458._16_4_ = 0x7f800000;
            auVar458._20_4_ = 0x7f800000;
            auVar458._24_4_ = 0x7f800000;
            auVar458._28_4_ = 0x7f800000;
            auVar36 = vblendvps_avx(auVar458,auVar456,auVar38);
            auVar245 = vpmovsxwd_avx(auVar177);
            auVar177 = vpunpckhwd_avx(auVar177,auVar177);
            auVar360._16_16_ = auVar177;
            auVar360._0_16_ = auVar245;
            auVar196 = vblendvps_avx(auVar196,auVar36,auVar360);
            auVar35 = vblendvps_avx(auVar456,auVar458,auVar38);
            auVar303 = vblendvps_avx(auVar303,auVar35,auVar360);
            auVar36 = vcmpps_avx(auVar438,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar236._0_4_ = auVar149._0_4_ ^ auVar36._0_4_;
            auVar236._4_4_ = auVar149._4_4_ ^ auVar36._4_4_;
            auVar236._8_4_ = auVar149._8_4_ ^ auVar36._8_4_;
            auVar236._12_4_ = auVar149._12_4_ ^ auVar36._12_4_;
            auVar236._16_4_ = auVar149._16_4_ ^ auVar36._16_4_;
            auVar236._20_4_ = auVar149._20_4_ ^ auVar36._20_4_;
            auVar236._24_4_ = auVar149._24_4_ ^ auVar36._24_4_;
            auVar236._28_4_ = auVar149._28_4_ ^ auVar36._28_4_;
            auVar149 = vorps_avx(auVar38,auVar236);
            auVar149 = vandps_avx(auVar37,auVar149);
          }
          auVar415 = ZEXT3264(auVar35);
          auVar249 = local_a40._0_28_;
          auVar276 = local_a00._0_28_;
          auVar383 = local_b20._0_28_;
        }
        auVar336 = ZEXT3264(local_660);
        _local_4c0 = local_660;
        local_4a0 = vminps_avx(local_460,auVar196);
        _local_480 = vmaxps_avx(local_660,auVar303);
        auVar36 = vcmpps_avx(local_660,local_4a0,2);
        _local_640 = vandps_avx(auVar141,auVar36);
        local_5e0 = _local_640;
        auVar36 = vcmpps_avx(_local_480,local_460,2);
        local_600 = vandps_avx(auVar141,auVar36);
        auVar141 = vorps_avx(local_600,_local_640);
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar141 >> 0x7f,0) != '\0') ||
              (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar141 >> 0xbf,0) != '\0') ||
            (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar141[0x1f] < '\0') {
          local_580 = local_600;
          _local_560 = _local_480;
          local_880 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5c0._0_4_ = auVar149._0_4_ ^ local_880._0_4_;
          local_5c0._4_4_ = auVar149._4_4_ ^ local_880._4_4_;
          local_5c0._8_4_ = (float)(auVar149._8_4_ ^ local_880._8_4_);
          local_5c0._12_4_ = (float)(auVar149._12_4_ ^ local_880._12_4_);
          local_5c0._16_4_ = (float)(auVar149._16_4_ ^ local_880._16_4_);
          local_5c0._20_4_ = (float)(auVar149._20_4_ ^ local_880._20_4_);
          local_5c0._24_4_ = (float)(auVar149._24_4_ ^ local_880._24_4_);
          local_5c0._28_4_ = (float)((uint)auVar149._28_4_ ^ (uint)local_880._28_4_);
          auVar150._0_4_ =
               auVar249._0_4_ * (float)local_820._0_4_ +
               auVar276._0_4_ * (float)local_840._0_4_ + auVar383._0_4_ * (float)local_8a0._0_4_;
          auVar150._4_4_ =
               auVar249._4_4_ * (float)local_820._4_4_ +
               auVar276._4_4_ * (float)local_840._4_4_ + auVar383._4_4_ * (float)local_8a0._4_4_;
          auVar150._8_4_ =
               auVar249._8_4_ * fStack_818 +
               auVar276._8_4_ * fStack_838 + auVar383._8_4_ * fStack_898;
          auVar150._12_4_ =
               auVar249._12_4_ * fStack_814 +
               auVar276._12_4_ * fStack_834 + auVar383._12_4_ * fStack_894;
          auVar150._16_4_ =
               auVar249._16_4_ * fStack_810 +
               auVar276._16_4_ * fStack_830 + auVar383._16_4_ * fStack_890;
          auVar150._20_4_ =
               auVar249._20_4_ * fStack_80c +
               auVar276._20_4_ * fStack_82c + auVar383._20_4_ * fStack_88c;
          auVar150._24_4_ =
               auVar249._24_4_ * fStack_808 +
               auVar276._24_4_ * fStack_828 + auVar383._24_4_ * fStack_888;
          auVar150._28_4_ = local_880._28_4_ + local_600._28_4_ + auVar149._28_4_;
          auVar199._8_4_ = 0x7fffffff;
          auVar199._0_8_ = 0x7fffffff7fffffff;
          auVar199._12_4_ = 0x7fffffff;
          auVar199._16_4_ = 0x7fffffff;
          auVar199._20_4_ = 0x7fffffff;
          auVar199._24_4_ = 0x7fffffff;
          auVar199._28_4_ = 0x7fffffff;
          auVar141 = vandps_avx(auVar150,auVar199);
          auVar200._8_4_ = 0x3e99999a;
          auVar200._0_8_ = 0x3e99999a3e99999a;
          auVar200._12_4_ = 0x3e99999a;
          auVar200._16_4_ = 0x3e99999a;
          auVar200._20_4_ = 0x3e99999a;
          auVar200._24_4_ = 0x3e99999a;
          auVar200._28_4_ = 0x3e99999a;
          auVar141 = vcmpps_avx(auVar141,auVar200,1);
          auVar141 = vorps_avx(auVar141,local_5c0);
          auVar201._8_4_ = 3;
          auVar201._0_8_ = 0x300000003;
          auVar201._12_4_ = 3;
          auVar201._16_4_ = 3;
          auVar201._20_4_ = 3;
          auVar201._24_4_ = 3;
          auVar201._28_4_ = 3;
          auVar231._8_4_ = 2;
          auVar231._0_8_ = 0x200000002;
          auVar231._12_4_ = 2;
          auVar231._16_4_ = 2;
          auVar231._20_4_ = 2;
          auVar231._24_4_ = 2;
          auVar231._28_4_ = 2;
          auVar141 = vblendvps_avx(auVar231,auVar201,auVar141);
          local_5a0 = ZEXT432((uint)uVar122);
          auVar245 = vpshufd_avx(ZEXT416((uint)uVar122),0);
          auVar177 = vpcmpgtd_avx(auVar141._16_16_,auVar245);
          local_680._0_16_ = auVar245;
          auVar245 = vpcmpgtd_avx(auVar141._0_16_,auVar245);
          auVar202._16_16_ = auVar177;
          auVar202._0_16_ = auVar245;
          local_540 = vblendps_avx(ZEXT1632(auVar245),auVar202,0xf0);
          local_5e0 = vandnps_avx(local_540,_local_640);
          auVar141 = _local_640 & ~local_540;
          auVar361 = ZEXT464(0) << 0x20;
          auVar259 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_620._0_8_ = uVar122;
          if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar141 >> 0x7f,0) != '\0') ||
                (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar141 >> 0xbf,0) != '\0') ||
              (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar141[0x1f] < '\0') {
            local_860._4_4_ = local_660._4_4_ + (float)local_7e0._4_4_;
            local_860._0_4_ = local_660._0_4_ + (float)local_7e0._0_4_;
            fStack_858 = local_660._8_4_ + fStack_7d8;
            fStack_854 = local_660._12_4_ + fStack_7d4;
            fStack_850 = local_660._16_4_ + fStack_7d0;
            fStack_84c = local_660._20_4_ + fStack_7cc;
            fStack_848 = local_660._24_4_ + fStack_7c8;
            fStack_844 = local_660._28_4_ + fStack_7c4;
            do {
              auVar268 = auVar259._0_16_;
              auVar203._8_4_ = 0x7f800000;
              auVar203._0_8_ = 0x7f8000007f800000;
              auVar203._12_4_ = 0x7f800000;
              auVar203._16_4_ = 0x7f800000;
              auVar203._20_4_ = 0x7f800000;
              auVar203._24_4_ = 0x7f800000;
              auVar203._28_4_ = 0x7f800000;
              auVar141 = vblendvps_avx(auVar203,auVar336._0_32_,local_5e0);
              auVar149 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar149 = vminps_avx(auVar141,auVar149);
              auVar36 = vshufpd_avx(auVar149,auVar149,5);
              auVar149 = vminps_avx(auVar149,auVar36);
              auVar36 = vperm2f128_avx(auVar149,auVar149,1);
              auVar149 = vminps_avx(auVar149,auVar36);
              auVar149 = vcmpps_avx(auVar141,auVar149,0);
              auVar36 = local_5e0 & auVar149;
              auVar141 = local_5e0;
              if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar36 >> 0x7f,0) != '\0') ||
                    (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0xbf,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar36[0x1f] < '\0') {
                auVar141 = vandps_avx(auVar149,local_5e0);
              }
              uVar118 = vmovmskps_avx(auVar141);
              uVar34 = 0;
              if (uVar118 != 0) {
                for (; (uVar118 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar122 = (ulong)uVar34;
              *(undefined4 *)(local_5e0 + uVar122 * 4) = 0;
              fVar323 = local_500[uVar122];
              uVar34 = *(uint *)(local_4c0 + uVar122 * 4);
              fVar260 = local_b24;
              if ((float)local_980._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_980._0_4_);
                auVar268._8_4_ = 0x7fffffff;
                auVar268._0_8_ = 0x7fffffff7fffffff;
                auVar268._12_4_ = 0x7fffffff;
                auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar336 = ZEXT464(uVar34);
              auVar245 = vminps_avx(_local_a80,_local_aa0);
              auVar177 = vmaxps_avx(_local_a80,_local_aa0);
              auVar133 = vminps_avx(_local_a90,_local_ab0);
              auVar220 = vminps_avx(auVar245,auVar133);
              auVar245 = vmaxps_avx(_local_a90,_local_ab0);
              auVar133 = vmaxps_avx(auVar177,auVar245);
              auVar177 = vandps_avx(auVar220,auVar268);
              auVar245 = vandps_avx(auVar133,auVar268);
              auVar177 = vmaxps_avx(auVar177,auVar245);
              auVar245 = vmovshdup_avx(auVar177);
              auVar245 = vmaxss_avx(auVar245,auVar177);
              auVar177 = vshufpd_avx(auVar177,auVar177,1);
              auVar177 = vmaxss_avx(auVar177,auVar245);
              local_a40._0_4_ = auVar177._0_4_ * 1.9073486e-06;
              local_760._0_4_ = fVar260 * 1.9073486e-06;
              local_800._0_16_ = vshufps_avx(auVar133,auVar133,0xff);
              lVar121 = 4;
              do {
                local_b20._0_4_ = 1.0 - fVar323;
                auVar177 = vshufps_avx(ZEXT416((uint)fVar323),ZEXT416((uint)fVar323),0);
                fVar260 = auVar177._0_4_;
                fVar128 = auVar177._4_4_;
                fVar237 = auVar177._8_4_;
                fVar129 = auVar177._12_4_;
                auVar177 = vshufps_avx(ZEXT416((uint)local_b20._0_4_),ZEXT416((uint)local_b20._0_4_)
                                       ,0);
                fVar261 = auVar177._0_4_;
                fVar173 = auVar177._4_4_;
                fVar262 = auVar177._8_4_;
                fVar263 = auVar177._12_4_;
                fVar264 = (float)local_a90._0_4_ * fVar260 + (float)local_aa0._0_4_ * fVar261;
                fVar265 = (float)local_a90._4_4_ * fVar128 + (float)local_aa0._4_4_ * fVar173;
                fVar281 = fStack_a88 * fVar237 + fStack_a98 * fVar262;
                fVar282 = fStack_a84 * fVar129 + fStack_a94 * fVar263;
                auVar295._0_4_ =
                     fVar261 * ((float)local_aa0._0_4_ * fVar260 + fVar261 * (float)local_a80._0_4_)
                     + fVar260 * fVar264;
                auVar295._4_4_ =
                     fVar173 * ((float)local_aa0._4_4_ * fVar128 + fVar173 * (float)local_a80._4_4_)
                     + fVar128 * fVar265;
                auVar295._8_4_ =
                     fVar262 * (fStack_a98 * fVar237 + fVar262 * fStack_a78) + fVar237 * fVar281;
                auVar295._12_4_ =
                     fVar263 * (fStack_a94 * fVar129 + fVar263 * fStack_a74) + fVar129 * fVar282;
                auVar241._0_4_ =
                     fVar261 * fVar264 +
                     fVar260 * (fVar260 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar261)
                ;
                auVar241._4_4_ =
                     fVar173 * fVar265 +
                     fVar128 * (fVar128 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar173)
                ;
                auVar241._8_4_ =
                     fVar262 * fVar281 + fVar237 * (fVar237 * fStack_aa8 + fStack_a88 * fVar262);
                auVar241._12_4_ =
                     fVar263 * fVar282 + fVar129 * (fVar129 * fStack_aa4 + fStack_a84 * fVar263);
                auVar177 = vshufps_avx(auVar336._0_16_,auVar336._0_16_,0);
                auVar178._0_4_ = auVar177._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar178._4_4_ = auVar177._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar178._8_4_ = auVar177._8_4_ * fStack_968 + 0.0;
                auVar178._12_4_ = auVar177._12_4_ * fStack_964 + 0.0;
                auVar132._0_4_ = fVar261 * auVar295._0_4_ + fVar260 * auVar241._0_4_;
                auVar132._4_4_ = fVar173 * auVar295._4_4_ + fVar128 * auVar241._4_4_;
                auVar132._8_4_ = fVar262 * auVar295._8_4_ + fVar237 * auVar241._8_4_;
                auVar132._12_4_ = fVar263 * auVar295._12_4_ + fVar129 * auVar241._12_4_;
                local_960._0_16_ = auVar132;
                auVar177 = vsubps_avx(auVar178,auVar132);
                _local_a00 = auVar177;
                auVar177 = vdpps_avx(auVar177,auVar177,0x7f);
                fVar260 = auVar177._0_4_;
                local_be0 = auVar336._0_4_;
                if (fVar260 < 0.0) {
                  local_b20._0_16_ = ZEXT416((uint)local_b20._0_4_);
                  local_ae0._0_16_ = auVar295;
                  local_b00._0_16_ = auVar241;
                  fVar128 = sqrtf(fVar260);
                  auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar241 = local_b00._0_16_;
                  auVar295 = local_ae0._0_16_;
                }
                else {
                  auVar245 = vsqrtss_avx(auVar177,auVar177);
                  fVar128 = auVar245._0_4_;
                }
                auVar245 = vsubps_avx(auVar241,auVar295);
                auVar327._0_4_ = auVar245._0_4_ * 3.0;
                auVar327._4_4_ = auVar245._4_4_ * 3.0;
                auVar327._8_4_ = auVar245._8_4_ * 3.0;
                auVar327._12_4_ = auVar245._12_4_ * 3.0;
                auVar245 = vshufps_avx(ZEXT416((uint)(fVar323 * 6.0)),ZEXT416((uint)(fVar323 * 6.0))
                                       ,0);
                auVar133 = ZEXT416((uint)(((float)local_b20._0_4_ - (fVar323 + fVar323)) * 6.0));
                auVar220 = vshufps_avx(auVar133,auVar133,0);
                auVar133 = ZEXT416((uint)((fVar323 -
                                          ((float)local_b20._0_4_ + (float)local_b20._0_4_)) * 6.0))
                ;
                auVar242 = vshufps_avx(auVar133,auVar133,0);
                auVar10 = vshufps_avx(ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),
                                      ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),0);
                auVar133 = vdpps_avx(auVar327,auVar327,0x7f);
                auVar179._0_4_ =
                     auVar10._0_4_ * (float)local_a80._0_4_ +
                     auVar242._0_4_ * (float)local_aa0._0_4_ +
                     auVar245._0_4_ * (float)local_ab0._0_4_ +
                     auVar220._0_4_ * (float)local_a90._0_4_;
                auVar179._4_4_ =
                     auVar10._4_4_ * (float)local_a80._4_4_ +
                     auVar242._4_4_ * (float)local_aa0._4_4_ +
                     auVar245._4_4_ * (float)local_ab0._4_4_ +
                     auVar220._4_4_ * (float)local_a90._4_4_;
                auVar179._8_4_ =
                     auVar10._8_4_ * fStack_a78 +
                     auVar242._8_4_ * fStack_a98 +
                     auVar245._8_4_ * fStack_aa8 + auVar220._8_4_ * fStack_a88;
                auVar179._12_4_ =
                     auVar10._12_4_ * fStack_a74 +
                     auVar242._12_4_ * fStack_a94 +
                     auVar245._12_4_ * fStack_aa4 + auVar220._12_4_ * fStack_a84;
                auVar245 = vblendps_avx(auVar133,_DAT_01feba10,0xe);
                auVar220 = vrsqrtss_avx(auVar245,auVar245);
                fVar129 = auVar220._0_4_;
                fVar237 = auVar133._0_4_;
                auVar220 = vdpps_avx(auVar327,auVar179,0x7f);
                auVar242 = vshufps_avx(auVar133,auVar133,0);
                auVar180._0_4_ = auVar179._0_4_ * auVar242._0_4_;
                auVar180._4_4_ = auVar179._4_4_ * auVar242._4_4_;
                auVar180._8_4_ = auVar179._8_4_ * auVar242._8_4_;
                auVar180._12_4_ = auVar179._12_4_ * auVar242._12_4_;
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                auVar269._0_4_ = auVar327._0_4_ * auVar220._0_4_;
                auVar269._4_4_ = auVar327._4_4_ * auVar220._4_4_;
                auVar269._8_4_ = auVar327._8_4_ * auVar220._8_4_;
                auVar269._12_4_ = auVar327._12_4_ * auVar220._12_4_;
                auVar10 = vsubps_avx(auVar180,auVar269);
                auVar220 = vrcpss_avx(auVar245,auVar245);
                auVar245 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(local_be0 * (float)local_760._0_4_)));
                auVar220 = ZEXT416((uint)(auVar220._0_4_ * (2.0 - fVar237 * auVar220._0_4_)));
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                uVar122 = CONCAT44(auVar327._4_4_,auVar327._0_4_);
                auVar296._0_8_ = uVar122 ^ 0x8000000080000000;
                auVar296._8_4_ = -auVar327._8_4_;
                auVar296._12_4_ = -auVar327._12_4_;
                auVar242 = ZEXT416((uint)(fVar129 * 1.5 +
                                         fVar237 * -0.5 * fVar129 * fVar129 * fVar129));
                auVar242 = vshufps_avx(auVar242,auVar242,0);
                auVar243._0_4_ = auVar242._0_4_ * auVar10._0_4_ * auVar220._0_4_;
                auVar243._4_4_ = auVar242._4_4_ * auVar10._4_4_ * auVar220._4_4_;
                auVar243._8_4_ = auVar242._8_4_ * auVar10._8_4_ * auVar220._8_4_;
                auVar243._12_4_ = auVar242._12_4_ * auVar10._12_4_ * auVar220._12_4_;
                auVar373._0_4_ = auVar327._0_4_ * auVar242._0_4_;
                auVar373._4_4_ = auVar327._4_4_ * auVar242._4_4_;
                auVar373._8_4_ = auVar327._8_4_ * auVar242._8_4_;
                auVar373._12_4_ = auVar327._12_4_ * auVar242._12_4_;
                local_b20._0_16_ = auVar327;
                local_ae0._0_4_ = auVar245._0_4_;
                if (fVar237 < 0.0) {
                  local_b00._0_4_ = fVar128;
                  local_9a0._0_16_ = auVar296;
                  local_9c0._0_16_ = auVar373;
                  local_9e0._0_16_ = auVar243;
                  fVar129 = sqrtf(fVar237);
                  auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar243 = local_9e0._0_16_;
                  auVar296 = local_9a0._0_16_;
                  auVar373 = local_9c0._0_16_;
                  fVar237 = (float)local_ae0._0_4_;
                  fVar128 = (float)local_b00._0_4_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar133,auVar133);
                  fVar129 = auVar133._0_4_;
                  fVar237 = auVar245._0_4_;
                }
                auVar245 = vdpps_avx(_local_a00,auVar373,0x7f);
                fVar128 = ((float)local_a40._0_4_ / fVar129) * (fVar128 + 1.0) +
                          fVar237 + fVar128 * (float)local_a40._0_4_;
                auVar133 = vdpps_avx(auVar296,auVar373,0x7f);
                auVar220 = vdpps_avx(_local_a00,auVar243,0x7f);
                auVar242 = vdpps_avx(_local_970,auVar373,0x7f);
                auVar10 = vdpps_avx(_local_a00,auVar296,0x7f);
                fVar129 = auVar133._0_4_ + auVar220._0_4_;
                fVar261 = auVar245._0_4_;
                auVar134._0_4_ = fVar261 * fVar261;
                auVar134._4_4_ = auVar245._4_4_ * auVar245._4_4_;
                auVar134._8_4_ = auVar245._8_4_ * auVar245._8_4_;
                auVar134._12_4_ = auVar245._12_4_ * auVar245._12_4_;
                auVar220 = vsubps_avx(auVar177,auVar134);
                auVar133 = vdpps_avx(_local_a00,_local_970,0x7f);
                fVar173 = auVar10._0_4_ - fVar261 * fVar129;
                fVar262 = auVar133._0_4_ - fVar261 * auVar242._0_4_;
                auVar133 = vrsqrtss_avx(auVar220,auVar220);
                fVar263 = auVar220._0_4_;
                fVar261 = auVar133._0_4_;
                fVar261 = fVar261 * 1.5 + fVar263 * -0.5 * fVar261 * fVar261 * fVar261;
                if (fVar263 < 0.0) {
                  local_b00._0_16_ = auVar245;
                  local_9a0._0_4_ = fVar128;
                  local_9c0._0_16_ = ZEXT416((uint)fVar129);
                  local_9e0._0_16_ = auVar242;
                  local_780._0_4_ = fVar173;
                  local_7a0._0_4_ = fVar262;
                  local_7c0._0_4_ = fVar261;
                  fVar263 = sqrtf(fVar263);
                  auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar128 = (float)local_9a0._0_4_;
                  fVar261 = (float)local_7c0._0_4_;
                  fVar173 = (float)local_780._0_4_;
                  fVar262 = (float)local_7a0._0_4_;
                  auVar242 = local_9e0._0_16_;
                  auVar245 = local_b00._0_16_;
                  auVar133 = local_9c0._0_16_;
                  fVar237 = (float)local_ae0._0_4_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar220,auVar220);
                  fVar263 = auVar133._0_4_;
                  auVar133 = ZEXT416((uint)fVar129);
                }
                auVar415 = ZEXT1664(local_b20._0_16_);
                auVar181 = vpermilps_avx(local_960._0_16_,0xff);
                auVar11 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xff);
                fVar129 = fVar173 * fVar261 - auVar11._0_4_;
                auVar270._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
                auVar270._8_4_ = auVar242._8_4_ ^ 0x80000000;
                auVar270._12_4_ = auVar242._12_4_ ^ 0x80000000;
                auVar297._0_4_ = -fVar129;
                auVar297._4_4_ = 0x80000000;
                auVar297._8_4_ = 0x80000000;
                auVar297._12_4_ = 0x80000000;
                auVar220 = vinsertps_avx(ZEXT416((uint)(fVar262 * fVar261)),auVar270,0x10);
                auVar10 = vmovsldup_avx(ZEXT416((uint)(auVar133._0_4_ * fVar262 * fVar261 -
                                                      auVar242._0_4_ * fVar129)));
                auVar220 = vdivps_avx(auVar220,auVar10);
                auVar181 = ZEXT416((uint)(fVar263 - auVar181._0_4_));
                auVar242 = vinsertps_avx(auVar245,auVar181,0x10);
                auVar244._0_4_ = auVar242._0_4_ * auVar220._0_4_;
                auVar244._4_4_ = auVar242._4_4_ * auVar220._4_4_;
                auVar244._8_4_ = auVar242._8_4_ * auVar220._8_4_;
                auVar244._12_4_ = auVar242._12_4_ * auVar220._12_4_;
                auVar133 = vinsertps_avx(auVar297,auVar133,0x1c);
                auVar133 = vdivps_avx(auVar133,auVar10);
                auVar221._0_4_ = auVar242._0_4_ * auVar133._0_4_;
                auVar221._4_4_ = auVar242._4_4_ * auVar133._4_4_;
                auVar221._8_4_ = auVar242._8_4_ * auVar133._8_4_;
                auVar221._12_4_ = auVar242._12_4_ * auVar133._12_4_;
                auVar133 = vhaddps_avx(auVar244,auVar244);
                auVar220 = vhaddps_avx(auVar221,auVar221);
                fVar323 = fVar323 - auVar133._0_4_;
                local_be0 = local_be0 - auVar220._0_4_;
                auVar336 = ZEXT464((uint)local_be0);
                auVar271._8_4_ = 0x7fffffff;
                auVar271._0_8_ = 0x7fffffff7fffffff;
                auVar271._12_4_ = 0x7fffffff;
                auVar259 = ZEXT1664(auVar271);
                auVar245 = vandps_avx(auVar245,auVar271);
                if (fVar128 <= auVar245._0_4_) {
LAB_011e8515:
                  bVar97 = false;
                }
                else {
                  auVar245 = vandps_avx(auVar181,auVar271);
                  if ((float)local_800._0_4_ * 1.9073486e-06 + fVar237 + fVar128 <= auVar245._0_4_)
                  goto LAB_011e8515;
                  local_be0 = local_be0 + (float)local_920._0_4_;
                  auVar336 = ZEXT464((uint)local_be0);
                  bVar97 = true;
                  if ((((fVar238 <= local_be0) &&
                       (fVar128 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar128)) &&
                      (0.0 <= fVar323)) && (fVar323 <= 1.0)) {
                    auVar177 = vrsqrtss_avx(auVar177,auVar177);
                    fVar237 = auVar177._0_4_;
                    pGVar29 = (context->scene->geometries).items[uVar116].ptr;
                    if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar177 = ZEXT416((uint)(fVar237 * 1.5 +
                                               fVar260 * -0.5 * fVar237 * fVar237 * fVar237));
                      auVar177 = vshufps_avx(auVar177,auVar177,0);
                      auVar182._0_4_ = auVar177._0_4_ * (float)local_a00._0_4_;
                      auVar182._4_4_ = auVar177._4_4_ * (float)local_a00._4_4_;
                      auVar182._8_4_ = auVar177._8_4_ * fStack_9f8;
                      auVar182._12_4_ = auVar177._12_4_ * fStack_9f4;
                      auVar135._0_4_ = local_b20._0_4_ + auVar11._0_4_ * auVar182._0_4_;
                      auVar135._4_4_ = local_b20._4_4_ + auVar11._4_4_ * auVar182._4_4_;
                      auVar135._8_4_ = local_b20._8_4_ + auVar11._8_4_ * auVar182._8_4_;
                      auVar135._12_4_ = local_b20._12_4_ + auVar11._12_4_ * auVar182._12_4_;
                      auVar177 = vshufps_avx(auVar182,auVar182,0xc9);
                      auVar245 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xc9);
                      auVar183._0_4_ = auVar245._0_4_ * auVar182._0_4_;
                      auVar183._4_4_ = auVar245._4_4_ * auVar182._4_4_;
                      auVar183._8_4_ = auVar245._8_4_ * auVar182._8_4_;
                      auVar183._12_4_ = auVar245._12_4_ * auVar182._12_4_;
                      auVar222._0_4_ = local_b20._0_4_ * auVar177._0_4_;
                      auVar222._4_4_ = local_b20._4_4_ * auVar177._4_4_;
                      auVar222._8_4_ = local_b20._8_4_ * auVar177._8_4_;
                      auVar222._12_4_ = local_b20._12_4_ * auVar177._12_4_;
                      auVar133 = vsubps_avx(auVar222,auVar183);
                      auVar177 = vshufps_avx(auVar133,auVar133,0xc9);
                      auVar245 = vshufps_avx(auVar135,auVar135,0xc9);
                      auVar223._0_4_ = auVar245._0_4_ * auVar177._0_4_;
                      auVar223._4_4_ = auVar245._4_4_ * auVar177._4_4_;
                      auVar223._8_4_ = auVar245._8_4_ * auVar177._8_4_;
                      auVar223._12_4_ = auVar245._12_4_ * auVar177._12_4_;
                      auVar177 = vshufps_avx(auVar133,auVar133,0xd2);
                      auVar136._0_4_ = auVar135._0_4_ * auVar177._0_4_;
                      auVar136._4_4_ = auVar135._4_4_ * auVar177._4_4_;
                      auVar136._8_4_ = auVar135._8_4_ * auVar177._8_4_;
                      auVar136._12_4_ = auVar135._12_4_ * auVar177._12_4_;
                      auVar177 = vsubps_avx(auVar223,auVar136);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar8 = vextractps_avx(auVar177,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar177,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar177._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar323;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_a08;
                        *(uint *)(ray + k * 4 + 0x120) = uVar116;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar245 = vshufps_avx(ZEXT416((uint)fVar323),ZEXT416((uint)fVar323),0);
                        local_720 = (RTCHitN  [16])vshufps_avx(auVar177,auVar177,0x55);
                        auVar133 = vshufps_avx(auVar177,auVar177,0xaa);
                        local_700 = vshufps_avx(auVar177,auVar177,0);
                        auStack_710 = auVar133;
                        local_6f0 = auVar245;
                        local_6e0 = ZEXT816(0) << 0x20;
                        local_6d0 = local_740._0_8_;
                        uStack_6c8 = local_740._8_8_;
                        local_6c0 = local_730._0_8_;
                        uStack_6b8 = local_730._8_8_;
                        uVar34 = context->user->instID[0];
                        _local_6b0 = CONCAT44(uVar34,uVar34);
                        _uStack_6a8 = CONCAT44(uVar34,uVar34);
                        uVar34 = context->user->instPrimID[0];
                        _uStack_6a0 = CONCAT44(uVar34,uVar34);
                        _uStack_698 = CONCAT44(uVar34,uVar34);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b40 = *local_a10;
                        uStack_b38 = local_a10[1];
                        local_a70.valid = (int *)&local_b40;
                        local_a70.geometryUserPtr = pGVar29->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_720;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar29->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar415 = ZEXT1664(local_b20._0_16_);
                          (*pGVar29->intersectionFilterN)(&local_a70);
                          auVar361._8_56_ = extraout_var;
                          auVar361._0_8_ = extraout_XMM1_Qa;
                          auVar245 = auVar361._0_16_;
                        }
                        auVar108._8_8_ = uStack_b38;
                        auVar108._0_8_ = local_b40;
                        if (auVar108 == (undefined1  [16])0x0) {
                          auVar177 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar245 = vpcmpeqd_avx(auVar245,auVar245);
                          auVar177 = auVar177 ^ auVar245;
                          auVar361 = ZEXT864(0);
                          auVar259 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var33 = context->args->filter;
                          auVar361 = ZEXT1664(ZEXT816(0));
                          auVar259 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar245 = vpcmpeqd_avx(auVar133,auVar133);
                          if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar415 = ZEXT1664(auVar415._0_16_);
                            (*p_Var33)(&local_a70);
                            auVar245 = vpcmpeqd_avx(auVar245,auVar245);
                            auVar259 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar109._8_8_ = uStack_b38;
                          auVar109._0_8_ = local_b40;
                          auVar133 = vpcmpeqd_avx(auVar109,_DAT_01feba10);
                          auVar177 = auVar133 ^ auVar245;
                          if (auVar109 != (undefined1  [16])0x0) {
                            auVar133 = auVar133 ^ auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar245;
                          }
                        }
                        auVar336 = ZEXT464((uint)local_be0);
                        auVar184._8_8_ = 0x100000001;
                        auVar184._0_8_ = 0x100000001;
                        if ((auVar184 & auVar177) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar128;
                        }
                      }
                    }
                  }
                }
                auVar141 = local_5e0;
                bVar124 = lVar121 != 0;
                lVar121 = lVar121 + -1;
              } while ((!bVar97) && (bVar124));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar151._4_4_ = uVar8;
              auVar151._0_4_ = uVar8;
              auVar151._8_4_ = uVar8;
              auVar151._12_4_ = uVar8;
              auVar151._16_4_ = uVar8;
              auVar151._20_4_ = uVar8;
              auVar151._24_4_ = uVar8;
              auVar151._28_4_ = uVar8;
              auVar149 = vcmpps_avx(_local_860,auVar151,2);
              local_5e0 = vandps_avx(auVar149,local_5e0);
              auVar141 = auVar141 & auVar149;
              auVar336 = ZEXT3264(local_660);
              uVar122 = local_620._0_8_;
            } while ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar141 >> 0x7f,0) != '\0') ||
                       (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar141 >> 0xbf,0) != '\0') ||
                     (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar141[0x1f] < '\0');
          }
          auVar152._0_4_ =
               (float)local_8c0._0_4_ * (float)local_820._0_4_ +
               (float)local_8e0._0_4_ * (float)local_840._0_4_ +
               (float)local_900._0_4_ * (float)local_8a0._0_4_;
          auVar152._4_4_ =
               (float)local_8c0._4_4_ * (float)local_820._4_4_ +
               (float)local_8e0._4_4_ * (float)local_840._4_4_ +
               (float)local_900._4_4_ * (float)local_8a0._4_4_;
          auVar152._8_4_ =
               fStack_8b8 * fStack_818 + fStack_8d8 * fStack_838 + fStack_8f8 * fStack_898;
          auVar152._12_4_ =
               fStack_8b4 * fStack_814 + fStack_8d4 * fStack_834 + fStack_8f4 * fStack_894;
          auVar152._16_4_ =
               fStack_8b0 * fStack_810 + fStack_8d0 * fStack_830 + fStack_8f0 * fStack_890;
          auVar152._20_4_ =
               fStack_8ac * fStack_80c + fStack_8cc * fStack_82c + fStack_8ec * fStack_88c;
          auVar152._24_4_ =
               fStack_8a8 * fStack_808 + fStack_8c8 * fStack_828 + fStack_8e8 * fStack_888;
          auVar152._28_4_ = fStack_8a4 + fStack_8c4 + fStack_8e4;
          auVar204._8_4_ = 0x7fffffff;
          auVar204._0_8_ = 0x7fffffff7fffffff;
          auVar204._12_4_ = 0x7fffffff;
          auVar204._16_4_ = 0x7fffffff;
          auVar204._20_4_ = 0x7fffffff;
          auVar204._24_4_ = 0x7fffffff;
          auVar204._28_4_ = 0x7fffffff;
          auVar141 = vandps_avx(auVar152,auVar204);
          auVar205._8_4_ = 0x3e99999a;
          auVar205._0_8_ = 0x3e99999a3e99999a;
          auVar205._12_4_ = 0x3e99999a;
          auVar205._16_4_ = 0x3e99999a;
          auVar205._20_4_ = 0x3e99999a;
          auVar205._24_4_ = 0x3e99999a;
          auVar205._28_4_ = 0x3e99999a;
          auVar141 = vcmpps_avx(auVar141,auVar205,1);
          auVar149 = vorps_avx(auVar141,local_5c0);
          auVar206._0_4_ = (float)local_560._0_4_ + (float)local_7e0._0_4_;
          auVar206._4_4_ = (float)local_560._4_4_ + (float)local_7e0._4_4_;
          auVar206._8_4_ = fStack_558 + fStack_7d8;
          auVar206._12_4_ = fStack_554 + fStack_7d4;
          auVar206._16_4_ = fStack_550 + fStack_7d0;
          auVar206._20_4_ = fStack_54c + fStack_7cc;
          auVar206._24_4_ = fStack_548 + fStack_7c8;
          auVar206._28_4_ = fStack_544 + fStack_7c4;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar232._4_4_ = uVar8;
          auVar232._0_4_ = uVar8;
          auVar232._8_4_ = uVar8;
          auVar232._12_4_ = uVar8;
          auVar232._16_4_ = uVar8;
          auVar232._20_4_ = uVar8;
          auVar232._24_4_ = uVar8;
          auVar232._28_4_ = uVar8;
          auVar141 = vcmpps_avx(auVar206,auVar232,2);
          _local_8e0 = vandps_avx(auVar141,local_580);
          auVar207._8_4_ = 3;
          auVar207._0_8_ = 0x300000003;
          auVar207._12_4_ = 3;
          auVar207._16_4_ = 3;
          auVar207._20_4_ = 3;
          auVar207._24_4_ = 3;
          auVar207._28_4_ = 3;
          auVar233._8_4_ = 2;
          auVar233._0_8_ = 0x200000002;
          auVar233._12_4_ = 2;
          auVar233._16_4_ = 2;
          auVar233._20_4_ = 2;
          auVar233._24_4_ = 2;
          auVar233._28_4_ = 2;
          auVar141 = vblendvps_avx(auVar233,auVar207,auVar149);
          auVar177 = vpcmpgtd_avx(auVar141._16_16_,local_680._0_16_);
          auVar245 = vpshufd_avx(local_5a0._0_16_,0);
          auVar245 = vpcmpgtd_avx(auVar141._0_16_,auVar245);
          auVar208._16_16_ = auVar177;
          auVar208._0_16_ = auVar245;
          _local_900 = vblendps_avx(ZEXT1632(auVar245),auVar208,0xf0);
          local_600 = vandnps_avx(_local_900,_local_8e0);
          auVar141 = _local_8e0 & ~_local_900;
          if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar141 >> 0x7f,0) != '\0') ||
                (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar141 >> 0xbf,0) != '\0') ||
              (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar141[0x1f] < '\0') {
            _local_860 = _local_480;
            local_8c0._4_4_ = (float)local_480._4_4_ + (float)local_7e0._4_4_;
            local_8c0._0_4_ = (float)local_480._0_4_ + (float)local_7e0._0_4_;
            fStack_8b8 = fStack_478 + fStack_7d8;
            fStack_8b4 = fStack_474 + fStack_7d4;
            fStack_8b0 = fStack_470 + fStack_7d0;
            fStack_8ac = fStack_46c + fStack_7cc;
            fStack_8a8 = fStack_468 + fStack_7c8;
            fStack_8a4 = fStack_464 + fStack_7c4;
            do {
              auVar272 = auVar259._0_16_;
              auVar209._8_4_ = 0x7f800000;
              auVar209._0_8_ = 0x7f8000007f800000;
              auVar209._12_4_ = 0x7f800000;
              auVar209._16_4_ = 0x7f800000;
              auVar209._20_4_ = 0x7f800000;
              auVar209._24_4_ = 0x7f800000;
              auVar209._28_4_ = 0x7f800000;
              auVar141 = vblendvps_avx(auVar209,_local_860,local_600);
              auVar149 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar149 = vminps_avx(auVar141,auVar149);
              auVar36 = vshufpd_avx(auVar149,auVar149,5);
              auVar149 = vminps_avx(auVar149,auVar36);
              auVar36 = vperm2f128_avx(auVar149,auVar149,1);
              auVar149 = vminps_avx(auVar149,auVar36);
              auVar149 = vcmpps_avx(auVar141,auVar149,0);
              auVar36 = local_600 & auVar149;
              auVar141 = local_600;
              if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar36 >> 0x7f,0) != '\0') ||
                    (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0xbf,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar36[0x1f] < '\0') {
                auVar141 = vandps_avx(auVar149,local_600);
              }
              uVar118 = vmovmskps_avx(auVar141);
              uVar34 = 0;
              if (uVar118 != 0) {
                for (; (uVar118 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar122 = (ulong)uVar34;
              *(undefined4 *)(local_600 + uVar122 * 4) = 0;
              fVar323 = local_520[uVar122];
              uVar34 = *(uint *)(local_460 + uVar122 * 4);
              fVar260 = local_b28;
              if ((float)local_980._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_980._0_4_);
                auVar272._8_4_ = 0x7fffffff;
                auVar272._0_8_ = 0x7fffffff7fffffff;
                auVar272._12_4_ = 0x7fffffff;
                auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar390 = ZEXT464(uVar34);
              auVar245 = vminps_avx(_local_a80,_local_aa0);
              auVar177 = vmaxps_avx(_local_a80,_local_aa0);
              auVar133 = vminps_avx(_local_a90,_local_ab0);
              auVar220 = vminps_avx(auVar245,auVar133);
              auVar245 = vmaxps_avx(_local_a90,_local_ab0);
              auVar133 = vmaxps_avx(auVar177,auVar245);
              auVar177 = vandps_avx(auVar220,auVar272);
              auVar245 = vandps_avx(auVar133,auVar272);
              auVar177 = vmaxps_avx(auVar177,auVar245);
              auVar245 = vmovshdup_avx(auVar177);
              auVar245 = vmaxss_avx(auVar245,auVar177);
              auVar177 = vshufpd_avx(auVar177,auVar177,1);
              auVar177 = vmaxss_avx(auVar177,auVar245);
              local_a40._0_4_ = auVar177._0_4_ * 1.9073486e-06;
              local_760._0_4_ = fVar260 * 1.9073486e-06;
              local_800._0_16_ = vshufps_avx(auVar133,auVar133,0xff);
              lVar121 = 4;
              do {
                local_b20._0_4_ = 1.0 - fVar323;
                auVar177 = vshufps_avx(ZEXT416((uint)fVar323),ZEXT416((uint)fVar323),0);
                fVar260 = auVar177._0_4_;
                fVar128 = auVar177._4_4_;
                fVar237 = auVar177._8_4_;
                fVar129 = auVar177._12_4_;
                auVar177 = vshufps_avx(ZEXT416((uint)local_b20._0_4_),ZEXT416((uint)local_b20._0_4_)
                                       ,0);
                fVar261 = auVar177._0_4_;
                fVar173 = auVar177._4_4_;
                fVar262 = auVar177._8_4_;
                fVar263 = auVar177._12_4_;
                fVar264 = (float)local_a90._0_4_ * fVar260 + (float)local_aa0._0_4_ * fVar261;
                fVar265 = (float)local_a90._4_4_ * fVar128 + (float)local_aa0._4_4_ * fVar173;
                fVar281 = fStack_a88 * fVar237 + fStack_a98 * fVar262;
                fVar282 = fStack_a84 * fVar129 + fStack_a94 * fVar263;
                auVar298._0_4_ =
                     fVar261 * ((float)local_aa0._0_4_ * fVar260 + fVar261 * (float)local_a80._0_4_)
                     + fVar260 * fVar264;
                auVar298._4_4_ =
                     fVar173 * ((float)local_aa0._4_4_ * fVar128 + fVar173 * (float)local_a80._4_4_)
                     + fVar128 * fVar265;
                auVar298._8_4_ =
                     fVar262 * (fStack_a98 * fVar237 + fVar262 * fStack_a78) + fVar237 * fVar281;
                auVar298._12_4_ =
                     fVar263 * (fStack_a94 * fVar129 + fVar263 * fStack_a74) + fVar129 * fVar282;
                auVar246._0_4_ =
                     fVar261 * fVar264 +
                     fVar260 * (fVar260 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar261)
                ;
                auVar246._4_4_ =
                     fVar173 * fVar265 +
                     fVar128 * (fVar128 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar173)
                ;
                auVar246._8_4_ =
                     fVar262 * fVar281 + fVar237 * (fVar237 * fStack_aa8 + fStack_a88 * fVar262);
                auVar246._12_4_ =
                     fVar263 * fVar282 + fVar129 * (fVar129 * fStack_aa4 + fStack_a84 * fVar263);
                auVar177 = vshufps_avx(auVar390._0_16_,auVar390._0_16_,0);
                auVar185._0_4_ = auVar177._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar185._4_4_ = auVar177._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar185._8_4_ = auVar177._8_4_ * fStack_968 + 0.0;
                auVar185._12_4_ = auVar177._12_4_ * fStack_964 + 0.0;
                auVar137._0_4_ = fVar261 * auVar298._0_4_ + fVar260 * auVar246._0_4_;
                auVar137._4_4_ = fVar173 * auVar298._4_4_ + fVar128 * auVar246._4_4_;
                auVar137._8_4_ = fVar262 * auVar298._8_4_ + fVar237 * auVar246._8_4_;
                auVar137._12_4_ = fVar263 * auVar298._12_4_ + fVar129 * auVar246._12_4_;
                local_960._0_16_ = auVar137;
                auVar177 = vsubps_avx(auVar185,auVar137);
                _local_a00 = auVar177;
                auVar177 = vdpps_avx(auVar177,auVar177,0x7f);
                fVar260 = auVar177._0_4_;
                local_be0 = auVar390._0_4_;
                if (fVar260 < 0.0) {
                  local_b20._0_16_ = ZEXT416((uint)local_b20._0_4_);
                  local_ae0._0_16_ = auVar298;
                  local_b00._0_16_ = auVar246;
                  fVar128 = sqrtf(fVar260);
                  auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar246 = local_b00._0_16_;
                  auVar298 = local_ae0._0_16_;
                }
                else {
                  auVar245 = vsqrtss_avx(auVar177,auVar177);
                  fVar128 = auVar245._0_4_;
                }
                auVar245 = vsubps_avx(auVar246,auVar298);
                auVar328._0_4_ = auVar245._0_4_ * 3.0;
                auVar328._4_4_ = auVar245._4_4_ * 3.0;
                auVar328._8_4_ = auVar245._8_4_ * 3.0;
                auVar328._12_4_ = auVar245._12_4_ * 3.0;
                auVar245 = vshufps_avx(ZEXT416((uint)(fVar323 * 6.0)),ZEXT416((uint)(fVar323 * 6.0))
                                       ,0);
                auVar133 = ZEXT416((uint)(((float)local_b20._0_4_ - (fVar323 + fVar323)) * 6.0));
                auVar220 = vshufps_avx(auVar133,auVar133,0);
                auVar133 = ZEXT416((uint)((fVar323 -
                                          ((float)local_b20._0_4_ + (float)local_b20._0_4_)) * 6.0))
                ;
                auVar242 = vshufps_avx(auVar133,auVar133,0);
                auVar10 = vshufps_avx(ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),
                                      ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),0);
                auVar133 = vdpps_avx(auVar328,auVar328,0x7f);
                auVar186._0_4_ =
                     auVar10._0_4_ * (float)local_a80._0_4_ +
                     auVar242._0_4_ * (float)local_aa0._0_4_ +
                     auVar245._0_4_ * (float)local_ab0._0_4_ +
                     auVar220._0_4_ * (float)local_a90._0_4_;
                auVar186._4_4_ =
                     auVar10._4_4_ * (float)local_a80._4_4_ +
                     auVar242._4_4_ * (float)local_aa0._4_4_ +
                     auVar245._4_4_ * (float)local_ab0._4_4_ +
                     auVar220._4_4_ * (float)local_a90._4_4_;
                auVar186._8_4_ =
                     auVar10._8_4_ * fStack_a78 +
                     auVar242._8_4_ * fStack_a98 +
                     auVar245._8_4_ * fStack_aa8 + auVar220._8_4_ * fStack_a88;
                auVar186._12_4_ =
                     auVar10._12_4_ * fStack_a74 +
                     auVar242._12_4_ * fStack_a94 +
                     auVar245._12_4_ * fStack_aa4 + auVar220._12_4_ * fStack_a84;
                auVar245 = vblendps_avx(auVar133,_DAT_01feba10,0xe);
                auVar220 = vrsqrtss_avx(auVar245,auVar245);
                fVar129 = auVar220._0_4_;
                fVar237 = auVar133._0_4_;
                auVar220 = vdpps_avx(auVar328,auVar186,0x7f);
                auVar242 = vshufps_avx(auVar133,auVar133,0);
                auVar187._0_4_ = auVar186._0_4_ * auVar242._0_4_;
                auVar187._4_4_ = auVar186._4_4_ * auVar242._4_4_;
                auVar187._8_4_ = auVar186._8_4_ * auVar242._8_4_;
                auVar187._12_4_ = auVar186._12_4_ * auVar242._12_4_;
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                auVar273._0_4_ = auVar328._0_4_ * auVar220._0_4_;
                auVar273._4_4_ = auVar328._4_4_ * auVar220._4_4_;
                auVar273._8_4_ = auVar328._8_4_ * auVar220._8_4_;
                auVar273._12_4_ = auVar328._12_4_ * auVar220._12_4_;
                auVar10 = vsubps_avx(auVar187,auVar273);
                auVar220 = vrcpss_avx(auVar245,auVar245);
                auVar245 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(local_be0 * (float)local_760._0_4_)));
                auVar220 = ZEXT416((uint)(auVar220._0_4_ * (2.0 - fVar237 * auVar220._0_4_)));
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                uVar122 = CONCAT44(auVar328._4_4_,auVar328._0_4_);
                auVar299._0_8_ = uVar122 ^ 0x8000000080000000;
                auVar299._8_4_ = -auVar328._8_4_;
                auVar299._12_4_ = -auVar328._12_4_;
                auVar242 = ZEXT416((uint)(fVar129 * 1.5 +
                                         fVar237 * -0.5 * fVar129 * fVar129 * fVar129));
                auVar242 = vshufps_avx(auVar242,auVar242,0);
                auVar247._0_4_ = auVar242._0_4_ * auVar10._0_4_ * auVar220._0_4_;
                auVar247._4_4_ = auVar242._4_4_ * auVar10._4_4_ * auVar220._4_4_;
                auVar247._8_4_ = auVar242._8_4_ * auVar10._8_4_ * auVar220._8_4_;
                auVar247._12_4_ = auVar242._12_4_ * auVar10._12_4_ * auVar220._12_4_;
                auVar374._0_4_ = auVar328._0_4_ * auVar242._0_4_;
                auVar374._4_4_ = auVar328._4_4_ * auVar242._4_4_;
                auVar374._8_4_ = auVar328._8_4_ * auVar242._8_4_;
                auVar374._12_4_ = auVar328._12_4_ * auVar242._12_4_;
                local_b20._0_16_ = auVar328;
                local_ae0._0_4_ = auVar245._0_4_;
                if (fVar237 < 0.0) {
                  local_b00._0_4_ = fVar128;
                  local_9a0._0_16_ = auVar299;
                  local_9c0._0_16_ = auVar374;
                  local_9e0._0_16_ = auVar247;
                  fVar129 = sqrtf(fVar237);
                  auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar247 = local_9e0._0_16_;
                  auVar299 = local_9a0._0_16_;
                  auVar374 = local_9c0._0_16_;
                  fVar237 = (float)local_ae0._0_4_;
                  fVar128 = (float)local_b00._0_4_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar133,auVar133);
                  fVar129 = auVar133._0_4_;
                  fVar237 = auVar245._0_4_;
                }
                auVar245 = vdpps_avx(_local_a00,auVar374,0x7f);
                fVar128 = ((float)local_a40._0_4_ / fVar129) * (fVar128 + 1.0) +
                          fVar237 + fVar128 * (float)local_a40._0_4_;
                auVar133 = vdpps_avx(auVar299,auVar374,0x7f);
                auVar220 = vdpps_avx(_local_a00,auVar247,0x7f);
                auVar242 = vdpps_avx(_local_970,auVar374,0x7f);
                auVar10 = vdpps_avx(_local_a00,auVar299,0x7f);
                fVar129 = auVar133._0_4_ + auVar220._0_4_;
                fVar261 = auVar245._0_4_;
                auVar138._0_4_ = fVar261 * fVar261;
                auVar138._4_4_ = auVar245._4_4_ * auVar245._4_4_;
                auVar138._8_4_ = auVar245._8_4_ * auVar245._8_4_;
                auVar138._12_4_ = auVar245._12_4_ * auVar245._12_4_;
                auVar220 = vsubps_avx(auVar177,auVar138);
                auVar133 = vdpps_avx(_local_a00,_local_970,0x7f);
                fVar173 = auVar10._0_4_ - fVar261 * fVar129;
                fVar262 = auVar133._0_4_ - fVar261 * auVar242._0_4_;
                auVar133 = vrsqrtss_avx(auVar220,auVar220);
                fVar263 = auVar220._0_4_;
                fVar261 = auVar133._0_4_;
                fVar261 = fVar261 * 1.5 + fVar263 * -0.5 * fVar261 * fVar261 * fVar261;
                if (fVar263 < 0.0) {
                  local_b00._0_16_ = auVar245;
                  local_9a0._0_4_ = fVar128;
                  local_9c0._0_16_ = ZEXT416((uint)fVar129);
                  local_9e0._0_16_ = auVar242;
                  local_780._0_4_ = fVar173;
                  local_7a0._0_4_ = fVar262;
                  local_7c0._0_4_ = fVar261;
                  fVar263 = sqrtf(fVar263);
                  auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar128 = (float)local_9a0._0_4_;
                  fVar261 = (float)local_7c0._0_4_;
                  fVar173 = (float)local_780._0_4_;
                  fVar262 = (float)local_7a0._0_4_;
                  auVar242 = local_9e0._0_16_;
                  auVar245 = local_b00._0_16_;
                  auVar133 = local_9c0._0_16_;
                  fVar237 = (float)local_ae0._0_4_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar220,auVar220);
                  fVar263 = auVar133._0_4_;
                  auVar133 = ZEXT416((uint)fVar129);
                }
                auVar415 = ZEXT1664(local_b20._0_16_);
                auVar181 = vpermilps_avx(local_960._0_16_,0xff);
                auVar11 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xff);
                fVar173 = fVar173 * fVar261 - auVar11._0_4_;
                auVar274._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
                auVar274._8_4_ = auVar242._8_4_ ^ 0x80000000;
                auVar274._12_4_ = auVar242._12_4_ ^ 0x80000000;
                auVar300._0_4_ = -fVar173;
                auVar300._4_4_ = 0x80000000;
                auVar300._8_4_ = 0x80000000;
                auVar300._12_4_ = 0x80000000;
                fVar129 = auVar133._0_4_ * fVar262 * fVar261;
                auVar336 = ZEXT464((uint)fVar129);
                auVar220 = vinsertps_avx(ZEXT416((uint)(fVar262 * fVar261)),auVar274,0x10);
                auVar10 = vmovsldup_avx(ZEXT416((uint)(fVar129 - auVar242._0_4_ * fVar173)));
                auVar220 = vdivps_avx(auVar220,auVar10);
                auVar181 = ZEXT416((uint)(fVar263 - auVar181._0_4_));
                auVar242 = vinsertps_avx(auVar245,auVar181,0x10);
                auVar248._0_4_ = auVar242._0_4_ * auVar220._0_4_;
                auVar248._4_4_ = auVar242._4_4_ * auVar220._4_4_;
                auVar248._8_4_ = auVar242._8_4_ * auVar220._8_4_;
                auVar248._12_4_ = auVar242._12_4_ * auVar220._12_4_;
                auVar133 = vinsertps_avx(auVar300,auVar133,0x1c);
                auVar133 = vdivps_avx(auVar133,auVar10);
                auVar224._0_4_ = auVar242._0_4_ * auVar133._0_4_;
                auVar224._4_4_ = auVar242._4_4_ * auVar133._4_4_;
                auVar224._8_4_ = auVar242._8_4_ * auVar133._8_4_;
                auVar224._12_4_ = auVar242._12_4_ * auVar133._12_4_;
                auVar133 = vhaddps_avx(auVar248,auVar248);
                auVar220 = vhaddps_avx(auVar224,auVar224);
                fVar323 = fVar323 - auVar133._0_4_;
                local_be0 = local_be0 - auVar220._0_4_;
                auVar390 = ZEXT464((uint)local_be0);
                auVar275._8_4_ = 0x7fffffff;
                auVar275._0_8_ = 0x7fffffff7fffffff;
                auVar275._12_4_ = 0x7fffffff;
                auVar259 = ZEXT1664(auVar275);
                auVar245 = vandps_avx(auVar245,auVar275);
                if (fVar128 <= auVar245._0_4_) {
LAB_011e9122:
                  bVar97 = false;
                }
                else {
                  auVar245 = vandps_avx(auVar181,auVar275);
                  if ((float)local_800._0_4_ * 1.9073486e-06 + fVar237 + fVar128 <= auVar245._0_4_)
                  goto LAB_011e9122;
                  local_be0 = local_be0 + (float)local_920._0_4_;
                  auVar390 = ZEXT464((uint)local_be0);
                  bVar97 = true;
                  if ((((fVar238 <= local_be0) &&
                       (fVar128 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar128)) &&
                      (0.0 <= fVar323)) && (fVar323 <= 1.0)) {
                    auVar177 = vrsqrtss_avx(auVar177,auVar177);
                    fVar237 = auVar177._0_4_;
                    pGVar29 = (context->scene->geometries).items[uVar116].ptr;
                    if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar177 = ZEXT416((uint)(fVar237 * 1.5 +
                                               fVar260 * -0.5 * fVar237 * fVar237 * fVar237));
                      auVar177 = vshufps_avx(auVar177,auVar177,0);
                      auVar188._0_4_ = auVar177._0_4_ * (float)local_a00._0_4_;
                      auVar188._4_4_ = auVar177._4_4_ * (float)local_a00._4_4_;
                      auVar188._8_4_ = auVar177._8_4_ * fStack_9f8;
                      auVar188._12_4_ = auVar177._12_4_ * fStack_9f4;
                      auVar139._0_4_ = local_b20._0_4_ + auVar11._0_4_ * auVar188._0_4_;
                      auVar139._4_4_ = local_b20._4_4_ + auVar11._4_4_ * auVar188._4_4_;
                      auVar139._8_4_ = local_b20._8_4_ + auVar11._8_4_ * auVar188._8_4_;
                      auVar139._12_4_ = local_b20._12_4_ + auVar11._12_4_ * auVar188._12_4_;
                      auVar177 = vshufps_avx(auVar188,auVar188,0xc9);
                      auVar245 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xc9);
                      auVar189._0_4_ = auVar245._0_4_ * auVar188._0_4_;
                      auVar189._4_4_ = auVar245._4_4_ * auVar188._4_4_;
                      auVar189._8_4_ = auVar245._8_4_ * auVar188._8_4_;
                      auVar189._12_4_ = auVar245._12_4_ * auVar188._12_4_;
                      auVar225._0_4_ = local_b20._0_4_ * auVar177._0_4_;
                      auVar225._4_4_ = local_b20._4_4_ * auVar177._4_4_;
                      auVar225._8_4_ = local_b20._8_4_ * auVar177._8_4_;
                      auVar225._12_4_ = local_b20._12_4_ * auVar177._12_4_;
                      auVar133 = vsubps_avx(auVar225,auVar189);
                      auVar177 = vshufps_avx(auVar133,auVar133,0xc9);
                      auVar245 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar226._0_4_ = auVar245._0_4_ * auVar177._0_4_;
                      auVar226._4_4_ = auVar245._4_4_ * auVar177._4_4_;
                      auVar226._8_4_ = auVar245._8_4_ * auVar177._8_4_;
                      auVar226._12_4_ = auVar245._12_4_ * auVar177._12_4_;
                      auVar177 = vshufps_avx(auVar133,auVar133,0xd2);
                      auVar140._0_4_ = auVar139._0_4_ * auVar177._0_4_;
                      auVar140._4_4_ = auVar139._4_4_ * auVar177._4_4_;
                      auVar140._8_4_ = auVar139._8_4_ * auVar177._8_4_;
                      auVar140._12_4_ = auVar139._12_4_ * auVar177._12_4_;
                      auVar177 = vsubps_avx(auVar226,auVar140);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar8 = vextractps_avx(auVar177,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar177,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar177._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar323;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_a08;
                        *(uint *)(ray + k * 4 + 0x120) = uVar116;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar245 = vshufps_avx(ZEXT416((uint)fVar323),ZEXT416((uint)fVar323),0);
                        local_720 = (RTCHitN  [16])vshufps_avx(auVar177,auVar177,0x55);
                        auVar133 = vshufps_avx(auVar177,auVar177,0xaa);
                        local_700 = vshufps_avx(auVar177,auVar177,0);
                        auStack_710 = auVar133;
                        local_6f0 = auVar245;
                        local_6e0 = ZEXT816(0) << 0x20;
                        local_6d0 = local_740._0_8_;
                        uStack_6c8 = local_740._8_8_;
                        local_6c0 = local_730._0_8_;
                        uStack_6b8 = local_730._8_8_;
                        uVar34 = context->user->instID[0];
                        _local_6b0 = CONCAT44(uVar34,uVar34);
                        _uStack_6a8 = CONCAT44(uVar34,uVar34);
                        uVar34 = context->user->instPrimID[0];
                        _uStack_6a0 = CONCAT44(uVar34,uVar34);
                        _uStack_698 = CONCAT44(uVar34,uVar34);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b40 = *local_a10;
                        uStack_b38 = local_a10[1];
                        local_a70.valid = (int *)&local_b40;
                        local_a70.geometryUserPtr = pGVar29->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_720;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar29->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar336 = ZEXT464((uint)fVar129);
                          auVar415 = ZEXT1664(local_b20._0_16_);
                          (*pGVar29->intersectionFilterN)(&local_a70);
                          auVar259._8_56_ = extraout_var_00;
                          auVar259._0_8_ = extraout_XMM1_Qa_00;
                          auVar245 = auVar259._0_16_;
                        }
                        auVar110._8_8_ = uStack_b38;
                        auVar110._0_8_ = local_b40;
                        if (auVar110 == (undefined1  [16])0x0) {
                          auVar177 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar245 = vpcmpeqd_avx(auVar245,auVar245);
                          auVar177 = auVar177 ^ auVar245;
                          auVar361 = ZEXT864(0);
                          auVar259 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var33 = context->args->filter;
                          auVar361 = ZEXT1664(ZEXT816(0));
                          auVar259 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar245 = vpcmpeqd_avx(auVar133,auVar133);
                          if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar336 = ZEXT1664(auVar336._0_16_);
                            auVar415 = ZEXT1664(auVar415._0_16_);
                            (*p_Var33)(&local_a70);
                            auVar245 = vpcmpeqd_avx(auVar245,auVar245);
                            auVar259 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar111._8_8_ = uStack_b38;
                          auVar111._0_8_ = local_b40;
                          auVar133 = vpcmpeqd_avx(auVar111,_DAT_01feba10);
                          auVar177 = auVar133 ^ auVar245;
                          if (auVar111 != (undefined1  [16])0x0) {
                            auVar133 = auVar133 ^ auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar245;
                            auVar245 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar245;
                          }
                        }
                        auVar390 = ZEXT464((uint)local_be0);
                        auVar190._8_8_ = 0x100000001;
                        auVar190._0_8_ = 0x100000001;
                        if ((auVar190 & auVar177) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar128;
                        }
                      }
                    }
                  }
                }
                auVar141 = local_600;
                bVar124 = lVar121 != 0;
                lVar121 = lVar121 + -1;
              } while ((!bVar97) && (bVar124));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar153._4_4_ = uVar8;
              auVar153._0_4_ = uVar8;
              auVar153._8_4_ = uVar8;
              auVar153._12_4_ = uVar8;
              auVar153._16_4_ = uVar8;
              auVar153._20_4_ = uVar8;
              auVar153._24_4_ = uVar8;
              auVar153._28_4_ = uVar8;
              auVar149 = vcmpps_avx(_local_8c0,auVar153,2);
              local_600 = vandps_avx(auVar149,local_600);
              auVar141 = auVar141 & auVar149;
              uVar122 = local_620._0_8_;
            } while ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar141 >> 0x7f,0) != '\0') ||
                       (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar141 >> 0xbf,0) != '\0') ||
                     (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar141[0x1f] < '\0');
          }
          auVar141 = vandps_avx(local_540,_local_640);
          auVar149 = vandps_avx(_local_900,_local_8e0);
          auVar234._0_4_ = (float)local_7e0._0_4_ + local_4c0._0_4_;
          auVar234._4_4_ = (float)local_7e0._4_4_ + local_4c0._4_4_;
          auVar234._8_4_ = fStack_7d8 + local_4c0._8_4_;
          auVar234._12_4_ = fStack_7d4 + local_4c0._12_4_;
          auVar234._16_4_ = fStack_7d0 + local_4c0._16_4_;
          auVar234._20_4_ = fStack_7cc + local_4c0._20_4_;
          auVar234._24_4_ = fStack_7c8 + local_4c0._24_4_;
          auVar234._28_4_ = fStack_7c4 + local_4c0._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar280._4_4_ = uVar8;
          auVar280._0_4_ = uVar8;
          auVar280._8_4_ = uVar8;
          auVar280._12_4_ = uVar8;
          auVar280._16_4_ = uVar8;
          auVar280._20_4_ = uVar8;
          auVar280._24_4_ = uVar8;
          auVar280._28_4_ = uVar8;
          auVar36 = vcmpps_avx(auVar234,auVar280,2);
          auVar141 = vandps_avx(auVar36,auVar141);
          auVar308._0_4_ = (float)local_7e0._0_4_ + local_480._0_4_;
          auVar308._4_4_ = (float)local_7e0._4_4_ + local_480._4_4_;
          auVar308._8_4_ = fStack_7d8 + local_480._8_4_;
          auVar308._12_4_ = fStack_7d4 + local_480._12_4_;
          auVar308._16_4_ = fStack_7d0 + local_480._16_4_;
          auVar308._20_4_ = fStack_7cc + local_480._20_4_;
          auVar308._24_4_ = fStack_7c8 + local_480._24_4_;
          auVar308._28_4_ = fStack_7c4 + local_480._28_4_;
          auVar36 = vcmpps_avx(auVar308,auVar280,2);
          auVar149 = vandps_avx(auVar36,auVar149);
          auVar149 = vorps_avx(auVar141,auVar149);
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar149 >> 0x7f,0) != '\0') ||
                (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar149 >> 0xbf,0) != '\0') ||
              (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar149[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar117 * 0x60) = auVar149;
            auVar141 = vblendvps_avx(_local_480,_local_4c0,auVar141);
            *(undefined1 (*) [32])(auStack_160 + uVar117 * 0x60) = auVar141;
            auVar113._8_8_ = uStack_928;
            auVar113._0_8_ = local_930;
            uVar9 = vmovlps_avx(auVar113);
            *(undefined8 *)(afStack_140 + uVar117 * 0x18) = uVar9;
            auStack_138[uVar117 * 0x18] = (int)uVar122 + 1;
            uVar117 = (ulong)((int)uVar117 + 1);
          }
          auVar277._8_4_ = 0x3f800000;
          auVar277._0_8_ = &DAT_3f8000003f800000;
          auVar277._12_4_ = 0x3f800000;
          auVar277._16_4_ = 0x3f800000;
          auVar277._20_4_ = 0x3f800000;
          auVar277._24_4_ = 0x3f800000;
          auVar277._28_4_ = 0x3f800000;
          goto LAB_011e7b2e;
        }
        auVar277._8_4_ = 0x3f800000;
        auVar277._0_8_ = &DAT_3f8000003f800000;
        auVar277._12_4_ = 0x3f800000;
        auVar277._16_4_ = 0x3f800000;
        auVar277._20_4_ = 0x3f800000;
        auVar277._24_4_ = 0x3f800000;
        auVar277._28_4_ = 0x3f800000;
      }
      auVar361 = ZEXT1664(ZEXT816(0) << 0x40);
    }
LAB_011e7b2e:
    do {
      if ((int)uVar117 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar154._4_4_ = uVar8;
        auVar154._0_4_ = uVar8;
        auVar154._8_4_ = uVar8;
        auVar154._12_4_ = uVar8;
        auVar154._16_4_ = uVar8;
        auVar154._20_4_ = uVar8;
        auVar154._24_4_ = uVar8;
        auVar154._28_4_ = uVar8;
        auVar141 = vcmpps_avx(local_400,auVar154,2);
        uVar116 = vmovmskps_avx(auVar141);
        uVar116 = (uint)local_908 - 1 & (uint)local_908 & uVar116;
        if (uVar116 == 0) {
          return;
        }
        goto LAB_011e69c5;
      }
      uVar123 = (ulong)((int)uVar117 - 1);
      lVar121 = uVar123 * 0x60;
      auVar141 = *(undefined1 (*) [32])(auStack_160 + lVar121);
      auVar148._0_4_ = auVar141._0_4_ + (float)local_7e0._0_4_;
      auVar148._4_4_ = auVar141._4_4_ + (float)local_7e0._4_4_;
      auVar148._8_4_ = auVar141._8_4_ + fStack_7d8;
      auVar148._12_4_ = auVar141._12_4_ + fStack_7d4;
      auVar148._16_4_ = auVar141._16_4_ + fStack_7d0;
      auVar148._20_4_ = auVar141._20_4_ + fStack_7cc;
      auVar148._24_4_ = auVar141._24_4_ + fStack_7c8;
      auVar148._28_4_ = auVar141._28_4_ + fStack_7c4;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar258._4_4_ = uVar8;
      auVar258._0_4_ = uVar8;
      auVar258._8_4_ = uVar8;
      auVar258._12_4_ = uVar8;
      auVar258._16_4_ = uVar8;
      auVar258._20_4_ = uVar8;
      auVar258._24_4_ = uVar8;
      auVar258._28_4_ = uVar8;
      auVar36 = vcmpps_avx(auVar148,auVar258,2);
      auVar149 = vandps_avx(auVar36,*(undefined1 (*) [32])(auStack_180 + lVar121));
      _local_720 = auVar149;
      auVar37 = *(undefined1 (*) [32])(auStack_180 + lVar121) & auVar36;
      bVar102 = (auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar103 = (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar101 = (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar100 = SUB321(auVar37 >> 0x7f,0) == '\0';
      bVar99 = (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar98 = SUB321(auVar37 >> 0xbf,0) == '\0';
      bVar124 = (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar97 = -1 < auVar37[0x1f];
      if (((((((!bVar102 || !bVar103) || !bVar101) || !bVar100) || !bVar99) || !bVar98) || !bVar124)
          || !bVar97) {
        auVar230._8_4_ = 0x7f800000;
        auVar230._0_8_ = 0x7f8000007f800000;
        auVar230._12_4_ = 0x7f800000;
        auVar230._16_4_ = 0x7f800000;
        auVar230._20_4_ = 0x7f800000;
        auVar230._24_4_ = 0x7f800000;
        auVar230._28_4_ = 0x7f800000;
        auVar141 = vblendvps_avx(auVar230,auVar141,auVar149);
        auVar36 = vshufps_avx(auVar141,auVar141,0xb1);
        auVar36 = vminps_avx(auVar141,auVar36);
        auVar37 = vshufpd_avx(auVar36,auVar36,5);
        auVar37 = vminps_avx(auVar36,auVar37);
        auVar36 = vperm2f128_avx(auVar37,auVar37,1);
        auVar37 = vminps_avx(auVar37,auVar36);
        auVar141 = vcmpps_avx(auVar141,auVar37,0);
        auVar37 = auVar149 & auVar141;
        if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0x7f,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0xbf,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar37[0x1f] < '\0') {
          auVar149 = vandps_avx(auVar141,auVar149);
        }
        fVar323 = afStack_140[uVar123 * 0x18 + 1];
        uVar122 = (ulong)auStack_138[uVar123 * 0x18];
        uVar118 = vmovmskps_avx(auVar149);
        uVar34 = 0;
        if (uVar118 != 0) {
          for (; (uVar118 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
          }
        }
        fVar260 = afStack_140[uVar123 * 0x18];
        *(undefined4 *)(local_720 + (ulong)uVar34 * 4) = 0;
        if ((((((((_local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_720 >> 0x7f,0) != '\0') ||
              (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_720 >> 0xbf,0) != '\0') ||
            (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_720[0x1f] < '\0') {
          uVar123 = uVar117;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar121) = _local_720;
        auVar177 = vshufps_avx(ZEXT416((uint)(fVar323 - fVar260)),ZEXT416((uint)(fVar323 - fVar260))
                               ,0);
        local_4c0._4_4_ = fVar260 + auVar177._4_4_ * 0.14285715;
        local_4c0._0_4_ = fVar260 + auVar177._0_4_ * 0.0;
        fStack_4b8 = fVar260 + auVar177._8_4_ * 0.2857143;
        fStack_4b4 = fVar260 + auVar177._12_4_ * 0.42857146;
        fStack_4b0 = fVar260 + auVar177._0_4_ * 0.5714286;
        fStack_4ac = fVar260 + auVar177._4_4_ * 0.71428573;
        fStack_4a8 = fVar260 + auVar177._8_4_ * 0.8571429;
        fStack_4a4 = fVar260 + auVar177._12_4_;
        local_930 = *(undefined8 *)(local_4c0 + (ulong)uVar34 * 4);
        uStack_928 = 0;
      }
      uVar117 = uVar123;
      auVar259 = ZEXT3264(auVar36);
    } while (((((((bVar102 && bVar103) && bVar101) && bVar100) && bVar99) && bVar98) && bVar124) &&
             bVar97);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }